

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86_avx512::forward_inplace(UnaryOp_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float afVar290 [16];
  int iVar291;
  ulong uVar292;
  ulong uVar293;
  int iVar294;
  undefined1 (*pauVar295) [64];
  int iVar296;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  ulong uVar297;
  undefined1 auVar318 [32];
  undefined1 auVar322 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar392 [16];
  undefined1 auVar298 [16];
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 in_ZmmResult [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar299 [16];
  float fVar364;
  undefined1 auVar300 [16];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [64];
  undefined1 auVar326 [32];
  undefined1 auVar304 [16];
  undefined1 auVar349 [64];
  undefined1 auVar327 [32];
  undefined1 auVar305 [16];
  undefined1 auVar350 [64];
  undefined1 auVar351 [64];
  undefined1 auVar328 [32];
  undefined1 auVar306 [16];
  undefined1 auVar352 [64];
  undefined1 auVar353 [64];
  undefined1 auVar354 [64];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar355 [64];
  undefined1 auVar356 [64];
  undefined1 auVar334 [32];
  undefined1 auVar313 [16];
  undefined1 auVar357 [64];
  undefined1 auVar335 [32];
  undefined1 auVar314 [16];
  undefined1 auVar358 [64];
  undefined1 auVar359 [64];
  undefined1 auVar360 [64];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar361 [64];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  float fVar368;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 extraout_var [60];
  float fVar385;
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  float fVar404;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar399 [32];
  undefined1 auVar486 [16];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar402;
  float fVar403;
  float fVar405;
  float fVar406;
  float fVar407;
  undefined1 in_ZMM1 [64];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar450 [32];
  undefined1 auVar431 [16];
  undefined1 auVar461 [64];
  undefined1 auVar462 [64];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar468 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar467 [16];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar482 [64];
  undefined1 auVar478 [32];
  undefined1 auVar469 [16];
  undefined1 auVar479 [32];
  undefined1 auVar470 [16];
  undefined1 auVar483 [64];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [32];
  undefined1 auVar484 [16];
  undefined1 auVar491 [32];
  undefined1 auVar485 [16];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [32];
  undefined1 auVar500 [32];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 auVar503 [16];
  undefined1 auVar504 [32];
  undefined1 auVar319 [32];
  
  afVar290 = ::_ps512_1;
  auVar307 = in_ZMM1._0_16_;
  switch((this->super_UnaryOp).op_type) {
  case 0:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    auVar361 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
    auVar397._8_4_ = 0x7fffffff;
    auVar397._0_8_ = 0x7fffffff7fffffff;
    auVar397._12_4_ = 0x7fffffff;
    auVar397._16_4_ = 0x7fffffff;
    auVar397._20_4_ = 0x7fffffff;
    auVar397._24_4_ = 0x7fffffff;
    auVar397._28_4_ = 0x7fffffff;
    auVar408._8_4_ = 0x7fffffff;
    auVar408._0_8_ = 0x7fffffff7fffffff;
    auVar408._12_4_ = 0x7fffffff;
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar352 = vandps_avx512dq(auVar361,*pauVar295);
        *pauVar295 = auVar352;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = vandps_avx(auVar397,*(undefined1 (*) [32])*pauVar295);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar307 = vandps_avx(auVar408,*(undefined1 (*) [16])*pauVar295);
        *(undefined1 (*) [16])*pauVar295 = auVar307;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        auVar307 = vandps_avx(ZEXT416(*(uint *)*pauVar295),auVar408);
        *(int *)*pauVar295 = auVar307._0_4_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 1:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    auVar361 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar352 = vxorps_avx512dq(auVar361,*pauVar295);
        *pauVar295 = auVar352;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = *(undefined1 (*) [32])*pauVar295;
        auVar453._0_8_ = auVar329._0_8_ ^ 0x8000000080000000;
        auVar453._8_4_ = auVar329._8_4_ ^ 0x80000000;
        auVar453._12_4_ = auVar329._12_4_ ^ 0x80000000;
        auVar453._16_4_ = auVar329._16_4_ ^ 0x80000000;
        auVar453._20_4_ = auVar329._20_4_ ^ 0x80000000;
        auVar453._24_4_ = auVar329._24_4_ ^ 0x80000000;
        auVar453._28_4_ = auVar329._28_4_ ^ 0x80000000;
        *(undefined1 (*) [32])*pauVar295 = auVar453;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar307 = *(undefined1 (*) [16])*pauVar295;
        auVar440._0_8_ = auVar307._0_8_ ^ 0x8000000080000000;
        auVar440._8_4_ = auVar307._8_4_ ^ 0x80000000;
        auVar440._12_4_ = auVar307._12_4_ ^ 0x80000000;
        *(undefined1 (*) [16])*pauVar295 = auVar440;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        *(uint *)*pauVar295 = *(uint *)*pauVar295 ^ 0x80000000;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 2:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar361 = vrndscaleps_avx512f(*pauVar295,1);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = vroundps_avx(*(undefined1 (*) [32])*pauVar295,1);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar308 = vroundps_avx(*(undefined1 (*) [16])*pauVar295,1);
        *(undefined1 (*) [16])*pauVar295 = auVar308;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        auVar308 = vroundss_avx(auVar307,ZEXT416(*(uint *)*pauVar295),9);
        *(int *)*pauVar295 = auVar308._0_4_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 3:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar361 = vrndscaleps_avx512f(*pauVar295,2);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = vroundps_avx(*(undefined1 (*) [32])*pauVar295,2);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar308 = vroundps_avx(*(undefined1 (*) [16])*pauVar295,2);
        *(undefined1 (*) [16])*pauVar295 = auVar308;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        auVar308 = vroundss_avx(auVar307,ZEXT416(*(uint *)*pauVar295),10);
        *(int *)*pauVar295 = auVar308._0_4_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 4:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar361 = vmulps_avx512f(*pauVar295,*pauVar295);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar276._4_4_ = *(float *)(*pauVar295 + 4) * *(float *)(*pauVar295 + 4);
        auVar276._0_4_ = *(float *)*pauVar295 * *(float *)*pauVar295;
        auVar276._8_4_ = *(float *)(*pauVar295 + 8) * *(float *)(*pauVar295 + 8);
        auVar276._12_4_ = *(float *)(*pauVar295 + 0xc) * *(float *)(*pauVar295 + 0xc);
        auVar276._16_4_ = *(float *)(*pauVar295 + 0x10) * *(float *)(*pauVar295 + 0x10);
        auVar276._20_4_ = *(float *)(*pauVar295 + 0x14) * *(float *)(*pauVar295 + 0x14);
        auVar276._24_4_ = *(float *)(*pauVar295 + 0x18) * *(float *)(*pauVar295 + 0x18);
        auVar276._28_4_ = *(undefined4 *)(*pauVar295 + 0x1c);
        *(undefined1 (*) [32])*pauVar295 = auVar276;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar372._0_4_ = *(float *)*pauVar295 * *(float *)*pauVar295;
        auVar372._4_4_ = *(float *)(*pauVar295 + 4) * *(float *)(*pauVar295 + 4);
        auVar372._8_4_ = *(float *)(*pauVar295 + 8) * *(float *)(*pauVar295 + 8);
        auVar372._12_4_ = *(float *)(*pauVar295 + 0xc) * *(float *)(*pauVar295 + 0xc);
        *(undefined1 (*) [16])*pauVar295 = auVar372;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        *(float *)*pauVar295 = *(float *)*pauVar295 * *(float *)*pauVar295;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 5:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar361 = vsqrtps_avx512f(*pauVar295);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = vsqrtps_avx(*(undefined1 (*) [32])*pauVar295);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar308 = vsqrtps_avx(*(undefined1 (*) [16])*pauVar295);
        *(undefined1 (*) [16])*pauVar295 = auVar308;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        auVar308 = vsqrtss_avx(auVar307,ZEXT416(*(uint *)*pauVar295));
        *(int *)*pauVar295 = auVar308._0_4_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 6:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar329 = vrsqrtps_avx(*(undefined1 (*) [32])*pauVar295);
        auVar330 = vrsqrtps_avx(*(undefined1 (*) [32])((long)*pauVar295 + 0x20));
        auVar361 = vinsertf64x4_avx512f(ZEXT3264(auVar329),auVar330,1);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = vrsqrtps_avx(*(undefined1 (*) [32])*pauVar295);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])((long)*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar307 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar295);
        *(undefined1 (*) [16])*pauVar295 = auVar307;
        pauVar295 = (undefined1 (*) [64])((long)*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        auVar307 = vsqrtss_avx(in_ZMM3._0_16_,ZEXT416(*(uint *)*pauVar295));
        *(float *)*pauVar295 = 1.0 / auVar307._0_4_;
        pauVar295 = (undefined1 (*) [64])((long)*pauVar295 + 4);
      }
    }
    break;
  case 7:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    auVar361 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar352 = vxorps_avx512dq(auVar361,(undefined1  [64])_ps512_cephes_log_q2);
    auVar361 = vxorps_avx512dq(auVar361,(undefined1  [64])_ps512_cephes_log_q1);
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar353 = vminps_avx512f((undefined1  [64])::_ps512_exp_hi,*pauVar295);
        auVar353 = vmaxps_avx512f(auVar353,(undefined1  [64])::_ps512_exp_lo);
        auVar354 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar353,
                                       (undefined1  [64])::_ps512_cephes_exp_p5);
        auVar355 = vrndscaleps_avx512f(auVar354,1);
        uVar297 = vcmpps_avx512f(auVar354,auVar355,1);
        auVar354 = vsubps_avx512f(auVar355,(undefined1  [64])::_ps512_1);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar351._0_4_ = (uint)bVar1 * auVar354._0_4_ | (uint)!bVar1 * auVar355._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar351._4_4_ = (uint)bVar1 * auVar354._4_4_ | (uint)!bVar1 * auVar355._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar351._8_4_ = (uint)bVar1 * auVar354._8_4_ | (uint)!bVar1 * auVar355._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar351._12_4_ = (uint)bVar1 * auVar354._12_4_ | (uint)!bVar1 * auVar355._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar351._16_4_ = (uint)bVar1 * auVar354._16_4_ | (uint)!bVar1 * auVar355._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar351._20_4_ = (uint)bVar1 * auVar354._20_4_ | (uint)!bVar1 * auVar355._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar351._24_4_ = (uint)bVar1 * auVar354._24_4_ | (uint)!bVar1 * auVar355._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar351._28_4_ = (uint)bVar1 * auVar354._28_4_ | (uint)!bVar1 * auVar355._28_4_;
        bVar1 = (bool)((byte)(uVar297 >> 8) & 1);
        auVar351._32_4_ = (uint)bVar1 * auVar354._32_4_ | (uint)!bVar1 * auVar355._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar351._36_4_ = (uint)bVar1 * auVar354._36_4_ | (uint)!bVar1 * auVar355._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar351._40_4_ = (uint)bVar1 * auVar354._40_4_ | (uint)!bVar1 * auVar355._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar351._44_4_ = (uint)bVar1 * auVar354._44_4_ | (uint)!bVar1 * auVar355._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar351._48_4_ = (uint)bVar1 * auVar354._48_4_ | (uint)!bVar1 * auVar355._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar351._52_4_ = (uint)bVar1 * auVar354._52_4_ | (uint)!bVar1 * auVar355._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar351._56_4_ = (uint)bVar1 * auVar354._56_4_ | (uint)!bVar1 * auVar355._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar351._60_4_ = (uint)bVar1 * auVar354._60_4_ | (uint)!bVar1 * auVar355._60_4_;
        auVar353 = vfmadd231ps_avx512f(auVar353,auVar351,auVar352);
        auVar353 = vfmadd231ps_avx512f(auVar353,auVar351,auVar361);
        auVar354 = vmulps_avx512f(auVar353,auVar353);
        auVar355 = vfmadd132ps_avx512f(auVar353,(undefined1  [64])::_ps512_cephes_exp_p1,
                                       (undefined1  [64])::_ps512_cephes_exp_p0);
        auVar355 = vfmadd213ps_avx512f(auVar355,auVar353,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar355 = vfmadd213ps_avx512f(auVar355,auVar353,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar355 = vfmadd213ps_avx512f(auVar355,auVar353,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar355 = vfmadd213ps_avx512f(auVar355,auVar353,(undefined1  [64])::_ps512_cephes_exp_p5);
        auVar353 = vfmadd213ps_avx512f(auVar355,auVar354,auVar353);
        auVar353 = vaddps_avx512f(auVar353,(undefined1  [64])::_ps512_1);
        auVar354 = vcvttps2dq_avx512f(auVar351);
        auVar354 = vpaddd_avx512f(auVar354,(undefined1  [64])::_pi32_512_0x7f);
        auVar354 = vpslld_avx512f(auVar354,0x17);
        auVar353 = vmulps_avx512f(auVar353,auVar354);
        *pauVar295 = auVar353;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar381._8_4_ = 0x42b0c0a5;
        auVar381._0_8_ = 0x42b0c0a542b0c0a5;
        auVar381._12_4_ = 0x42b0c0a5;
        auVar381._16_4_ = 0x42b0c0a5;
        auVar381._20_4_ = 0x42b0c0a5;
        auVar381._24_4_ = 0x42b0c0a5;
        auVar381._28_4_ = 0x42b0c0a5;
        auVar329 = vminps_avx(auVar381,*(undefined1 (*) [32])*pauVar295);
        auVar230._8_4_ = 0xc2b0c0a5;
        auVar230._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar230._12_4_ = 0xc2b0c0a5;
        auVar230._16_4_ = 0xc2b0c0a5;
        auVar230._20_4_ = 0xc2b0c0a5;
        auVar230._24_4_ = 0xc2b0c0a5;
        auVar230._28_4_ = 0xc2b0c0a5;
        auVar330 = vmaxps_avx512vl(auVar329,auVar230);
        auVar479._8_4_ = 0x3f000000;
        auVar479._0_8_ = 0x3f0000003f000000;
        auVar479._12_4_ = 0x3f000000;
        auVar479._16_4_ = 0x3f000000;
        auVar479._20_4_ = 0x3f000000;
        auVar479._24_4_ = 0x3f000000;
        auVar479._28_4_ = 0x3f000000;
        auVar231._8_4_ = 0x3fb8aa3b;
        auVar231._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar231._12_4_ = 0x3fb8aa3b;
        auVar231._16_4_ = 0x3fb8aa3b;
        auVar231._20_4_ = 0x3fb8aa3b;
        auVar231._24_4_ = 0x3fb8aa3b;
        auVar231._28_4_ = 0x3fb8aa3b;
        auVar399 = vfmadd231ps_avx512vl(auVar479,auVar330,auVar231);
        auVar329 = vroundps_avx(auVar399,1);
        uVar297 = vcmpps_avx512vl(auVar399,auVar329,1);
        auVar232._8_4_ = 0xbf800000;
        auVar232._0_8_ = 0xbf800000bf800000;
        auVar232._12_4_ = 0xbf800000;
        auVar232._16_4_ = 0xbf800000;
        auVar232._20_4_ = 0xbf800000;
        auVar232._24_4_ = 0xbf800000;
        auVar232._28_4_ = 0xbf800000;
        auVar318 = vaddps_avx512vl(auVar329,auVar232);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar328._0_4_ = (float)((uint)bVar1 * auVar318._0_4_ | (uint)!bVar1 * auVar329._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar328._4_4_ = (float)((uint)bVar1 * auVar318._4_4_ | (uint)!bVar1 * auVar329._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar328._8_4_ = (float)((uint)bVar1 * auVar318._8_4_ | (uint)!bVar1 * auVar329._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar328._12_4_ = (float)((uint)bVar1 * auVar318._12_4_ | (uint)!bVar1 * auVar329._12_4_);
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar328._16_4_ = (float)((uint)bVar1 * auVar318._16_4_ | (uint)!bVar1 * auVar329._16_4_);
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar328._20_4_ = (float)((uint)bVar1 * auVar318._20_4_ | (uint)!bVar1 * auVar329._20_4_);
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar328._24_4_ = (float)((uint)bVar1 * auVar318._24_4_ | (uint)!bVar1 * auVar329._24_4_);
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar328._28_4_ = (float)((uint)bVar1 * auVar318._28_4_ | (uint)!bVar1 * auVar329._28_4_);
        auVar233._8_4_ = 0x3f318000;
        auVar233._0_8_ = 0x3f3180003f318000;
        auVar233._12_4_ = 0x3f318000;
        auVar233._16_4_ = 0x3f318000;
        auVar233._20_4_ = 0x3f318000;
        auVar233._24_4_ = 0x3f318000;
        auVar233._28_4_ = 0x3f318000;
        auVar329 = vfmsub231ps_avx512vl(auVar330,auVar328,auVar233);
        auVar234._8_4_ = 0x395e8083;
        auVar234._0_8_ = 0x395e8083395e8083;
        auVar234._12_4_ = 0x395e8083;
        auVar234._16_4_ = 0x395e8083;
        auVar234._20_4_ = 0x395e8083;
        auVar234._24_4_ = 0x395e8083;
        auVar234._28_4_ = 0x395e8083;
        auVar329 = vfmsub231ps_avx512vl(auVar329,auVar328,auVar234);
        auVar281._4_4_ = auVar329._4_4_ * auVar329._4_4_;
        auVar281._0_4_ = auVar329._0_4_ * auVar329._0_4_;
        auVar281._8_4_ = auVar329._8_4_ * auVar329._8_4_;
        auVar281._12_4_ = auVar329._12_4_ * auVar329._12_4_;
        auVar281._16_4_ = auVar329._16_4_ * auVar329._16_4_;
        auVar281._20_4_ = auVar329._20_4_ * auVar329._20_4_;
        auVar281._24_4_ = auVar329._24_4_ * auVar329._24_4_;
        auVar281._28_4_ = auVar399._28_4_;
        auVar452._8_4_ = 0x39506967;
        auVar452._0_8_ = 0x3950696739506967;
        auVar452._12_4_ = 0x39506967;
        auVar452._16_4_ = 0x39506967;
        auVar452._20_4_ = 0x39506967;
        auVar452._24_4_ = 0x39506967;
        auVar452._28_4_ = 0x39506967;
        auVar235._8_4_ = 0x3ab743ce;
        auVar235._0_8_ = 0x3ab743ce3ab743ce;
        auVar235._12_4_ = 0x3ab743ce;
        auVar235._16_4_ = 0x3ab743ce;
        auVar235._20_4_ = 0x3ab743ce;
        auVar235._24_4_ = 0x3ab743ce;
        auVar235._28_4_ = 0x3ab743ce;
        auVar330 = vfmadd213ps_avx512vl(auVar452,auVar329,auVar235);
        auVar236._8_4_ = 0x3c088908;
        auVar236._0_8_ = 0x3c0889083c088908;
        auVar236._12_4_ = 0x3c088908;
        auVar236._16_4_ = 0x3c088908;
        auVar236._20_4_ = 0x3c088908;
        auVar236._24_4_ = 0x3c088908;
        auVar236._28_4_ = 0x3c088908;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar329,auVar236);
        auVar237._8_4_ = 0x3d2aa9c1;
        auVar237._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar237._12_4_ = 0x3d2aa9c1;
        auVar237._16_4_ = 0x3d2aa9c1;
        auVar237._20_4_ = 0x3d2aa9c1;
        auVar237._24_4_ = 0x3d2aa9c1;
        auVar237._28_4_ = 0x3d2aa9c1;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar329,auVar237);
        auVar238._8_4_ = 0x3e2aaaaa;
        auVar238._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar238._12_4_ = 0x3e2aaaaa;
        auVar238._16_4_ = 0x3e2aaaaa;
        auVar238._20_4_ = 0x3e2aaaaa;
        auVar238._24_4_ = 0x3e2aaaaa;
        auVar238._28_4_ = 0x3e2aaaaa;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar329,auVar238);
        auVar307 = vfmadd213ps_fma(auVar330,auVar329,auVar479);
        auVar307 = vfmadd213ps_fma(ZEXT1632(auVar307),auVar281,auVar329);
        auVar382._0_4_ = (int)auVar328._0_4_;
        auVar382._4_4_ = (int)auVar328._4_4_;
        auVar382._8_4_ = (int)auVar328._8_4_;
        auVar382._12_4_ = (int)auVar328._12_4_;
        auVar382._16_4_ = (int)auVar328._16_4_;
        auVar382._20_4_ = (int)auVar328._20_4_;
        auVar382._24_4_ = (int)auVar328._24_4_;
        auVar382._28_4_ = (int)auVar328._28_4_;
        auVar329 = vpslld_avx2(auVar382,0x17);
        auVar239._8_4_ = 0x3f800000;
        auVar239._0_8_ = 0x3f8000003f800000;
        auVar239._12_4_ = 0x3f800000;
        auVar239._16_4_ = 0x3f800000;
        auVar239._20_4_ = 0x3f800000;
        auVar239._24_4_ = 0x3f800000;
        auVar239._28_4_ = 0x3f800000;
        auVar329 = vpaddd_avx512vl(auVar329,auVar239);
        auVar307 = vfmadd213ps_fma(auVar329,ZEXT1632(auVar307),auVar329);
        *(undefined1 (*) [32])*pauVar295 = ZEXT1632(auVar307);
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar373._8_4_ = 0x42b0c0a5;
        auVar373._0_8_ = 0x42b0c0a542b0c0a5;
        auVar373._12_4_ = 0x42b0c0a5;
        auVar307 = vminps_avx(auVar373,*(undefined1 (*) [16])*pauVar295);
        auVar121._8_4_ = 0xc2b0c0a5;
        auVar121._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar121._12_4_ = 0xc2b0c0a5;
        auVar308 = vmaxps_avx512vl(auVar307,auVar121);
        auVar470._8_4_ = 0x3f000000;
        auVar470._0_8_ = 0x3f0000003f000000;
        auVar470._12_4_ = 0x3f000000;
        auVar122._8_4_ = 0x3fb8aa3b;
        auVar122._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar122._12_4_ = 0x3fb8aa3b;
        auVar392 = vfmadd231ps_avx512vl(auVar470,auVar308,auVar122);
        auVar415._0_4_ = (int)auVar392._0_4_;
        auVar415._4_4_ = (int)auVar392._4_4_;
        auVar415._8_4_ = (int)auVar392._8_4_;
        auVar415._12_4_ = (int)auVar392._12_4_;
        auVar307 = vcvtdq2ps_avx(auVar415);
        uVar297 = vcmpps_avx512vl(auVar392,auVar307,1);
        auVar123._8_4_ = 0xbf800000;
        auVar123._0_8_ = 0xbf800000bf800000;
        auVar123._12_4_ = 0xbf800000;
        auVar392 = vaddps_avx512vl(auVar307,auVar123);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar306._0_4_ = (float)((uint)bVar1 * auVar392._0_4_ | (uint)!bVar1 * auVar307._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar306._4_4_ = (float)((uint)bVar1 * auVar392._4_4_ | (uint)!bVar1 * auVar307._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar306._8_4_ = (float)((uint)bVar1 * auVar392._8_4_ | (uint)!bVar1 * auVar307._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar306._12_4_ = (float)((uint)bVar1 * auVar392._12_4_ | (uint)!bVar1 * auVar307._12_4_);
        auVar124._8_4_ = 0x3f318000;
        auVar124._0_8_ = 0x3f3180003f318000;
        auVar124._12_4_ = 0x3f318000;
        auVar307 = vfmsub231ps_avx512vl(auVar308,auVar306,auVar124);
        auVar125._8_4_ = 0x395e8083;
        auVar125._0_8_ = 0x395e8083395e8083;
        auVar125._12_4_ = 0x395e8083;
        auVar308 = vfmsub231ps_avx512vl(auVar307,auVar306,auVar125);
        auVar391._0_4_ = auVar308._0_4_ * auVar308._0_4_;
        auVar391._4_4_ = auVar308._4_4_ * auVar308._4_4_;
        auVar391._8_4_ = auVar308._8_4_ * auVar308._8_4_;
        auVar391._12_4_ = auVar308._12_4_ * auVar308._12_4_;
        auVar439._8_4_ = 0x39506967;
        auVar439._0_8_ = 0x3950696739506967;
        auVar439._12_4_ = 0x39506967;
        auVar126._8_4_ = 0x3ab743ce;
        auVar126._0_8_ = 0x3ab743ce3ab743ce;
        auVar126._12_4_ = 0x3ab743ce;
        auVar307 = vfmadd213ps_avx512vl(auVar439,auVar308,auVar126);
        auVar127._8_4_ = 0x3c088908;
        auVar127._0_8_ = 0x3c0889083c088908;
        auVar127._12_4_ = 0x3c088908;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar308,auVar127);
        auVar128._8_4_ = 0x3d2aa9c1;
        auVar128._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar128._12_4_ = 0x3d2aa9c1;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar308,auVar128);
        auVar129._8_4_ = 0x3e2aaaaa;
        auVar129._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar129._12_4_ = 0x3e2aaaaa;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar308,auVar129);
        auVar307 = vfmadd213ps_fma(auVar307,auVar308,auVar470);
        auVar307 = vfmadd213ps_fma(auVar307,auVar391,auVar308);
        auVar374._0_4_ = (int)auVar306._0_4_;
        auVar374._4_4_ = (int)auVar306._4_4_;
        auVar374._8_4_ = (int)auVar306._8_4_;
        auVar374._12_4_ = (int)auVar306._12_4_;
        auVar308 = vpslld_avx(auVar374,0x17);
        auVar130._8_4_ = 0x3f800000;
        auVar130._0_8_ = 0x3f8000003f800000;
        auVar130._12_4_ = 0x3f800000;
        auVar308 = vpaddd_avx512vl(auVar308,auVar130);
        auVar307 = vfmadd213ps_fma(auVar308,auVar307,auVar308);
        *(undefined1 (*) [16])*pauVar295 = auVar307;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        fVar368 = expf(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 8:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    auVar269._8_4_ = 0x80000000;
    auVar269._0_8_ = 0x8000000080000000;
    auVar269._12_4_ = 0x80000000;
    auVar269._16_4_ = 0x80000000;
    auVar269._20_4_ = 0x80000000;
    auVar269._24_4_ = 0x80000000;
    auVar269._28_4_ = 0x80000000;
    auVar269._32_4_ = 0x80000000;
    auVar269._36_4_ = 0x80000000;
    auVar269._40_4_ = 0x80000000;
    auVar269._44_4_ = 0x80000000;
    auVar269._48_4_ = 0x80000000;
    auVar269._52_4_ = 0x80000000;
    auVar269._56_4_ = 0x80000000;
    auVar269._60_4_ = 0x80000000;
    auVar361 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar269);
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        uVar297 = vcmpps_avx512f(*pauVar295,_DAT_0054e200,2);
        auVar352 = vmaxps_avx512f(*pauVar295,(undefined1  [64])_ps512_min_norm_pos);
        auVar353 = vpsrld_avx512f(auVar352,0x17);
        auVar353 = vpsubd_avx512f(auVar353,(undefined1  [64])::_pi32_512_0x7f);
        auVar354 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar352 = vpternlogd_avx512f(auVar352,auVar354,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        auVar353 = vcvtdq2ps_avx512f(auVar353);
        uVar19 = vcmpps_avx512f(auVar352,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar354 = vsubps_avx512f(auVar352,(undefined1  [64])::_ps512_1);
        auVar355 = vaddps_avx512f(auVar353,(undefined1  [64])::_ps512_1);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar358._0_4_ = (uint)bVar1 * auVar353._0_4_ | (uint)!bVar1 * auVar355._0_4_;
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar358._4_4_ = (uint)bVar1 * auVar353._4_4_ | (uint)!bVar1 * auVar355._4_4_;
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar358._8_4_ = (uint)bVar1 * auVar353._8_4_ | (uint)!bVar1 * auVar355._8_4_;
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar358._12_4_ = (uint)bVar1 * auVar353._12_4_ | (uint)!bVar1 * auVar355._12_4_;
        bVar1 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar358._16_4_ = (uint)bVar1 * auVar353._16_4_ | (uint)!bVar1 * auVar355._16_4_;
        bVar1 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar358._20_4_ = (uint)bVar1 * auVar353._20_4_ | (uint)!bVar1 * auVar355._20_4_;
        bVar1 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar358._24_4_ = (uint)bVar1 * auVar353._24_4_ | (uint)!bVar1 * auVar355._24_4_;
        bVar1 = (bool)((byte)(uVar19 >> 7) & 1);
        auVar358._28_4_ = (uint)bVar1 * auVar353._28_4_ | (uint)!bVar1 * auVar355._28_4_;
        bVar10 = (byte)(uVar19 >> 8);
        bVar1 = (bool)(bVar10 & 1);
        auVar358._32_4_ = (uint)bVar1 * auVar353._32_4_ | (uint)!bVar1 * auVar355._32_4_;
        bVar1 = (bool)((byte)(uVar19 >> 9) & 1);
        auVar358._36_4_ = (uint)bVar1 * auVar353._36_4_ | (uint)!bVar1 * auVar355._36_4_;
        bVar1 = (bool)((byte)(uVar19 >> 10) & 1);
        auVar358._40_4_ = (uint)bVar1 * auVar353._40_4_ | (uint)!bVar1 * auVar355._40_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xb) & 1);
        auVar358._44_4_ = (uint)bVar1 * auVar353._44_4_ | (uint)!bVar1 * auVar355._44_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xc) & 1);
        auVar358._48_4_ = (uint)bVar1 * auVar353._48_4_ | (uint)!bVar1 * auVar355._48_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xd) & 1);
        auVar358._52_4_ = (uint)bVar1 * auVar353._52_4_ | (uint)!bVar1 * auVar355._52_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xe) & 1);
        auVar358._56_4_ = (uint)bVar1 * auVar353._56_4_ | (uint)!bVar1 * auVar355._56_4_;
        bVar1 = SUB81(uVar19 >> 0xf,0);
        auVar358._60_4_ = (uint)bVar1 * auVar353._60_4_ | (uint)!bVar1 * auVar355._60_4_;
        auVar352 = vaddps_avx512f(auVar354,auVar352);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar359._0_4_ = (uint)bVar1 * auVar352._0_4_ | (uint)!bVar1 * auVar354._0_4_;
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar359._4_4_ = (uint)bVar1 * auVar352._4_4_ | (uint)!bVar1 * auVar354._4_4_;
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar359._8_4_ = (uint)bVar1 * auVar352._8_4_ | (uint)!bVar1 * auVar354._8_4_;
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar359._12_4_ = (uint)bVar1 * auVar352._12_4_ | (uint)!bVar1 * auVar354._12_4_;
        bVar1 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar359._16_4_ = (uint)bVar1 * auVar352._16_4_ | (uint)!bVar1 * auVar354._16_4_;
        bVar1 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar359._20_4_ = (uint)bVar1 * auVar352._20_4_ | (uint)!bVar1 * auVar354._20_4_;
        bVar1 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar359._24_4_ = (uint)bVar1 * auVar352._24_4_ | (uint)!bVar1 * auVar354._24_4_;
        bVar1 = (bool)((byte)(uVar19 >> 7) & 1);
        auVar359._28_4_ = (uint)bVar1 * auVar352._28_4_ | (uint)!bVar1 * auVar354._28_4_;
        bVar1 = (bool)(bVar10 & 1);
        auVar359._32_4_ = (uint)bVar1 * auVar352._32_4_ | (uint)!bVar1 * auVar354._32_4_;
        bVar1 = (bool)((byte)(uVar19 >> 9) & 1);
        auVar359._36_4_ = (uint)bVar1 * auVar352._36_4_ | (uint)!bVar1 * auVar354._36_4_;
        bVar1 = (bool)((byte)(uVar19 >> 10) & 1);
        auVar359._40_4_ = (uint)bVar1 * auVar352._40_4_ | (uint)!bVar1 * auVar354._40_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xb) & 1);
        auVar359._44_4_ = (uint)bVar1 * auVar352._44_4_ | (uint)!bVar1 * auVar354._44_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xc) & 1);
        auVar359._48_4_ = (uint)bVar1 * auVar352._48_4_ | (uint)!bVar1 * auVar354._48_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xd) & 1);
        auVar359._52_4_ = (uint)bVar1 * auVar352._52_4_ | (uint)!bVar1 * auVar354._52_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xe) & 1);
        auVar359._56_4_ = (uint)bVar1 * auVar352._56_4_ | (uint)!bVar1 * auVar354._56_4_;
        bVar1 = SUB81(uVar19 >> 0xf,0);
        auVar359._60_4_ = (uint)bVar1 * auVar352._60_4_ | (uint)!bVar1 * auVar354._60_4_;
        auVar352 = vmulps_avx512f(auVar359,auVar359);
        auVar353 = vfmadd132ps_avx512f(auVar359,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar353 = vfmadd213ps_avx512f(auVar353,auVar359,(undefined1  [64])_ps512_cephes_log_p2);
        auVar353 = vfmadd213ps_avx512f(auVar353,auVar359,(undefined1  [64])_ps512_cephes_log_p3);
        auVar353 = vfmadd213ps_avx512f(auVar353,auVar359,(undefined1  [64])_ps512_cephes_log_p4);
        auVar353 = vfmadd213ps_avx512f(auVar353,auVar359,(undefined1  [64])_ps512_cephes_log_p5);
        auVar353 = vfmadd213ps_avx512f(auVar353,auVar359,(undefined1  [64])_ps512_cephes_log_p6);
        auVar353 = vfmadd213ps_avx512f(auVar353,auVar359,(undefined1  [64])_ps512_cephes_log_p7);
        auVar353 = vfmadd213ps_avx512f(auVar353,auVar359,(undefined1  [64])_ps512_cephes_log_p8);
        auVar354 = vmulps_avx512f(auVar352,auVar359);
        auVar353 = vfmadd213ps_avx512f(auVar354,auVar353,auVar359);
        auVar353 = vfmadd231ps_avx512f(auVar353,auVar358,(undefined1  [64])_ps512_cephes_log_q1);
        auVar352 = vfmadd231ps_avx512f(auVar353,auVar352,auVar361);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar358,(undefined1  [64])_ps512_cephes_log_q2);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar360._0_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar360._4_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar360._8_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar360._12_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar360._16_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar360._20_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar360._24_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar360._28_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._28_4_;
        bVar1 = (bool)((byte)(uVar297 >> 8) & 1);
        auVar360._32_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar360._36_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar360._40_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar360._44_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar360._48_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar360._52_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar360._56_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar360._60_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._60_4_;
        *pauVar295 = auVar360;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        uVar297 = vcmpps_avx512vl(*(undefined1 (*) [32])*pauVar295,_DAT_00548840,2);
        auVar215._8_4_ = 0x800000;
        auVar215._0_8_ = 0x80000000800000;
        auVar215._12_4_ = 0x800000;
        auVar215._16_4_ = 0x800000;
        auVar215._20_4_ = 0x800000;
        auVar215._24_4_ = 0x800000;
        auVar215._28_4_ = 0x800000;
        auVar329 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar295,auVar215);
        auVar330 = vpsrld_avx2(auVar329,0x17);
        auVar216._8_4_ = 0xffffff82;
        auVar216._0_8_ = 0xffffff82ffffff82;
        auVar216._12_4_ = 0xffffff82;
        auVar216._16_4_ = 0xffffff82;
        auVar216._20_4_ = 0xffffff82;
        auVar216._24_4_ = 0xffffff82;
        auVar216._28_4_ = 0xffffff82;
        auVar330 = vpaddd_avx512vl(auVar330,auVar216);
        auVar429._8_4_ = 0x807fffff;
        auVar429._0_8_ = 0x807fffff807fffff;
        auVar429._12_4_ = 0x807fffff;
        auVar429._16_4_ = 0x807fffff;
        auVar429._20_4_ = 0x807fffff;
        auVar429._24_4_ = 0x807fffff;
        auVar429._28_4_ = 0x807fffff;
        auVar217._8_4_ = 0x3f000000;
        auVar217._0_8_ = 0x3f0000003f000000;
        auVar217._12_4_ = 0x3f000000;
        auVar217._16_4_ = 0x3f000000;
        auVar217._20_4_ = 0x3f000000;
        auVar217._24_4_ = 0x3f000000;
        auVar217._28_4_ = 0x3f000000;
        auVar399 = vpternlogd_avx512vl(auVar329,auVar429,auVar217,0xea);
        auVar329 = vcvtdq2ps_avx(auVar330);
        auVar218._8_4_ = 0x3f3504f3;
        auVar218._0_8_ = 0x3f3504f33f3504f3;
        auVar218._12_4_ = 0x3f3504f3;
        auVar218._16_4_ = 0x3f3504f3;
        auVar218._20_4_ = 0x3f3504f3;
        auVar218._24_4_ = 0x3f3504f3;
        auVar218._28_4_ = 0x3f3504f3;
        uVar19 = vcmpps_avx512vl(auVar399,auVar218,1);
        auVar459._8_4_ = 0xbf800000;
        auVar459._0_8_ = 0xbf800000bf800000;
        auVar459._12_4_ = 0xbf800000;
        auVar459._16_4_ = 0xbf800000;
        auVar459._20_4_ = 0xbf800000;
        auVar459._24_4_ = 0xbf800000;
        auVar459._28_4_ = 0xbf800000;
        auVar430._0_4_ = auVar399._0_4_ + -1.0;
        auVar430._4_4_ = auVar399._4_4_ + -1.0;
        auVar430._8_4_ = auVar399._8_4_ + -1.0;
        auVar430._12_4_ = auVar399._12_4_ + -1.0;
        auVar430._16_4_ = auVar399._16_4_ + -1.0;
        auVar430._20_4_ = auVar399._20_4_ + -1.0;
        auVar430._24_4_ = auVar399._24_4_ + -1.0;
        auVar430._28_4_ = auVar399._28_4_ + -1.0;
        auVar330 = vaddps_avx512vl(auVar329,auVar459);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar336._0_4_ = (uint)bVar1 * auVar330._0_4_ | (uint)!bVar1 * auVar329._0_4_;
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar336._4_4_ = (uint)bVar1 * auVar330._4_4_ | (uint)!bVar1 * auVar329._4_4_;
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar336._8_4_ = (uint)bVar1 * auVar330._8_4_ | (uint)!bVar1 * auVar329._8_4_;
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar336._12_4_ = (uint)bVar1 * auVar330._12_4_ | (uint)!bVar1 * auVar329._12_4_;
        bVar1 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar336._16_4_ = (uint)bVar1 * auVar330._16_4_ | (uint)!bVar1 * auVar329._16_4_;
        bVar1 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar336._20_4_ = (uint)bVar1 * auVar330._20_4_ | (uint)!bVar1 * auVar329._20_4_;
        bVar1 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar336._24_4_ = (uint)bVar1 * auVar330._24_4_ | (uint)!bVar1 * auVar329._24_4_;
        bVar1 = SUB81(uVar19 >> 7,0);
        auVar336._28_4_ = (uint)bVar1 * auVar330._28_4_ | (uint)!bVar1 * auVar329._28_4_;
        auVar329 = vaddps_avx512vl(auVar430,auVar399);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar337._0_4_ = (float)((uint)bVar1 * auVar329._0_4_ | (uint)!bVar1 * (int)auVar430._0_4_);
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar337._4_4_ = (float)((uint)bVar1 * auVar329._4_4_ | (uint)!bVar1 * (int)auVar430._4_4_);
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar337._8_4_ = (float)((uint)bVar1 * auVar329._8_4_ | (uint)!bVar1 * (int)auVar430._8_4_);
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar337._12_4_ =
             (float)((uint)bVar1 * auVar329._12_4_ | (uint)!bVar1 * (int)auVar430._12_4_);
        bVar1 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar337._16_4_ =
             (float)((uint)bVar1 * auVar329._16_4_ | (uint)!bVar1 * (int)auVar430._16_4_);
        bVar1 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar337._20_4_ =
             (float)((uint)bVar1 * auVar329._20_4_ | (uint)!bVar1 * (int)auVar430._20_4_);
        bVar1 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar337._24_4_ =
             (float)((uint)bVar1 * auVar329._24_4_ | (uint)!bVar1 * (int)auVar430._24_4_);
        bVar1 = SUB81(uVar19 >> 7,0);
        auVar337._28_4_ = (uint)bVar1 * auVar329._28_4_ | (uint)!bVar1 * (int)auVar430._28_4_;
        auVar288._4_4_ = auVar337._4_4_ * auVar337._4_4_;
        auVar288._0_4_ = auVar337._0_4_ * auVar337._0_4_;
        auVar288._8_4_ = auVar337._8_4_ * auVar337._8_4_;
        auVar288._12_4_ = auVar337._12_4_ * auVar337._12_4_;
        auVar288._16_4_ = auVar337._16_4_ * auVar337._16_4_;
        auVar288._20_4_ = auVar337._20_4_ * auVar337._20_4_;
        auVar288._24_4_ = auVar337._24_4_ * auVar337._24_4_;
        auVar288._28_4_ = auVar399._28_4_;
        auVar460._8_4_ = 0x3d9021bb;
        auVar460._0_8_ = 0x3d9021bb3d9021bb;
        auVar460._12_4_ = 0x3d9021bb;
        auVar460._16_4_ = 0x3d9021bb;
        auVar460._20_4_ = 0x3d9021bb;
        auVar460._24_4_ = 0x3d9021bb;
        auVar460._28_4_ = 0x3d9021bb;
        auVar219._8_4_ = 0xbdebd1b8;
        auVar219._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar219._12_4_ = 0xbdebd1b8;
        auVar219._16_4_ = 0xbdebd1b8;
        auVar219._20_4_ = 0xbdebd1b8;
        auVar219._24_4_ = 0xbdebd1b8;
        auVar219._28_4_ = 0xbdebd1b8;
        auVar329 = vfmadd213ps_avx512vl(auVar460,auVar337,auVar219);
        auVar220._8_4_ = 0x3def251a;
        auVar220._0_8_ = 0x3def251a3def251a;
        auVar220._12_4_ = 0x3def251a;
        auVar220._16_4_ = 0x3def251a;
        auVar220._20_4_ = 0x3def251a;
        auVar220._24_4_ = 0x3def251a;
        auVar220._28_4_ = 0x3def251a;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar337,auVar220);
        auVar221._8_4_ = 0xbdfe5d4f;
        auVar221._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar221._12_4_ = 0xbdfe5d4f;
        auVar221._16_4_ = 0xbdfe5d4f;
        auVar221._20_4_ = 0xbdfe5d4f;
        auVar221._24_4_ = 0xbdfe5d4f;
        auVar221._28_4_ = 0xbdfe5d4f;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar337,auVar221);
        auVar222._8_4_ = 0x3e11e9bf;
        auVar222._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar222._12_4_ = 0x3e11e9bf;
        auVar222._16_4_ = 0x3e11e9bf;
        auVar222._20_4_ = 0x3e11e9bf;
        auVar222._24_4_ = 0x3e11e9bf;
        auVar222._28_4_ = 0x3e11e9bf;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar337,auVar222);
        auVar223._8_4_ = 0xbe2aae50;
        auVar223._0_8_ = 0xbe2aae50be2aae50;
        auVar223._12_4_ = 0xbe2aae50;
        auVar223._16_4_ = 0xbe2aae50;
        auVar223._20_4_ = 0xbe2aae50;
        auVar223._24_4_ = 0xbe2aae50;
        auVar223._28_4_ = 0xbe2aae50;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar337,auVar223);
        auVar224._8_4_ = 0x3e4cceac;
        auVar224._0_8_ = 0x3e4cceac3e4cceac;
        auVar224._12_4_ = 0x3e4cceac;
        auVar224._16_4_ = 0x3e4cceac;
        auVar224._20_4_ = 0x3e4cceac;
        auVar224._24_4_ = 0x3e4cceac;
        auVar224._28_4_ = 0x3e4cceac;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar337,auVar224);
        auVar225._8_4_ = 0xbe7ffffc;
        auVar225._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar225._12_4_ = 0xbe7ffffc;
        auVar225._16_4_ = 0xbe7ffffc;
        auVar225._20_4_ = 0xbe7ffffc;
        auVar225._24_4_ = 0xbe7ffffc;
        auVar225._28_4_ = 0xbe7ffffc;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar337,auVar225);
        auVar226._8_4_ = 0x3eaaaaaa;
        auVar226._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar226._12_4_ = 0x3eaaaaaa;
        auVar226._16_4_ = 0x3eaaaaaa;
        auVar226._20_4_ = 0x3eaaaaaa;
        auVar226._24_4_ = 0x3eaaaaaa;
        auVar226._28_4_ = 0x3eaaaaaa;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar337,auVar226);
        auVar289._4_4_ = auVar337._4_4_ * auVar337._4_4_ * auVar337._4_4_ * auVar329._4_4_;
        auVar289._0_4_ = auVar337._0_4_ * auVar337._0_4_ * auVar337._0_4_ * auVar329._0_4_;
        auVar289._8_4_ = auVar337._8_4_ * auVar337._8_4_ * auVar337._8_4_ * auVar329._8_4_;
        auVar289._12_4_ = auVar337._12_4_ * auVar337._12_4_ * auVar337._12_4_ * auVar329._12_4_;
        auVar289._16_4_ = auVar337._16_4_ * auVar337._16_4_ * auVar337._16_4_ * auVar329._16_4_;
        auVar289._20_4_ = auVar337._20_4_ * auVar337._20_4_ * auVar337._20_4_ * auVar329._20_4_;
        auVar289._24_4_ = auVar337._24_4_ * auVar337._24_4_ * auVar337._24_4_ * auVar329._24_4_;
        auVar289._28_4_ = auVar329._28_4_;
        auVar227._8_4_ = 0xb95e8083;
        auVar227._0_8_ = 0xb95e8083b95e8083;
        auVar227._12_4_ = 0xb95e8083;
        auVar227._16_4_ = 0xb95e8083;
        auVar227._20_4_ = 0xb95e8083;
        auVar227._24_4_ = 0xb95e8083;
        auVar227._28_4_ = 0xb95e8083;
        auVar329 = vfmadd231ps_avx512vl(auVar289,auVar336,auVar227);
        auVar228._8_4_ = 0x3f000000;
        auVar228._0_8_ = 0x3f0000003f000000;
        auVar228._12_4_ = 0x3f000000;
        auVar228._16_4_ = 0x3f000000;
        auVar228._20_4_ = 0x3f000000;
        auVar228._24_4_ = 0x3f000000;
        auVar228._28_4_ = 0x3f000000;
        auVar329 = vfmsub231ps_avx512vl(auVar329,auVar288,auVar228);
        auVar329 = vsubps_avx(auVar329,auVar337);
        auVar229._8_4_ = 0x3f318000;
        auVar229._0_8_ = 0x3f3180003f318000;
        auVar229._12_4_ = 0x3f318000;
        auVar229._16_4_ = 0x3f318000;
        auVar229._20_4_ = 0x3f318000;
        auVar229._24_4_ = 0x3f318000;
        auVar229._28_4_ = 0x3f318000;
        auVar330 = vfmsub231ps_avx512vl(auVar329,auVar336,auVar229);
        auVar329 = vpcmpeqd_avx2(auVar336,auVar336);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar338._0_4_ = (uint)bVar1 * auVar329._0_4_ | (uint)!bVar1 * auVar330._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar338._4_4_ = (uint)bVar1 * auVar329._4_4_ | (uint)!bVar1 * auVar330._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar338._8_4_ = (uint)bVar1 * auVar329._8_4_ | (uint)!bVar1 * auVar330._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar338._12_4_ = (uint)bVar1 * auVar329._12_4_ | (uint)!bVar1 * auVar330._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar338._16_4_ = (uint)bVar1 * auVar329._16_4_ | (uint)!bVar1 * auVar330._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar338._20_4_ = (uint)bVar1 * auVar329._20_4_ | (uint)!bVar1 * auVar330._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar338._24_4_ = (uint)bVar1 * auVar329._24_4_ | (uint)!bVar1 * auVar330._24_4_;
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar338._28_4_ = (uint)bVar1 * auVar329._28_4_ | (uint)!bVar1 * auVar330._28_4_;
        *(undefined1 (*) [32])*pauVar295 = auVar338;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        uVar297 = vcmpps_avx512vl(*(undefined1 (*) [16])*pauVar295,_DAT_00545cc0,2);
        auVar106._8_4_ = 0x800000;
        auVar106._0_8_ = 0x80000000800000;
        auVar106._12_4_ = 0x800000;
        auVar307 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar295,auVar106);
        auVar308 = vpsrld_avx(auVar307,0x17);
        auVar107._8_4_ = 0xffffff82;
        auVar107._0_8_ = 0xffffff82ffffff82;
        auVar107._12_4_ = 0xffffff82;
        auVar308 = vpaddd_avx512vl(auVar308,auVar107);
        auVar421._8_4_ = 0x807fffff;
        auVar421._0_8_ = 0x807fffff807fffff;
        auVar421._12_4_ = 0x807fffff;
        auVar108._8_4_ = 0x3f000000;
        auVar108._0_8_ = 0x3f0000003f000000;
        auVar108._12_4_ = 0x3f000000;
        auVar392 = vpternlogd_avx512vl(auVar307,auVar421,auVar108,0xea);
        auVar307 = vcvtdq2ps_avx(auVar308);
        auVar109._8_4_ = 0x3f3504f3;
        auVar109._0_8_ = 0x3f3504f33f3504f3;
        auVar109._12_4_ = 0x3f3504f3;
        uVar19 = vcmpps_avx512vl(auVar392,auVar109,1);
        auVar447._8_4_ = 0xbf800000;
        auVar447._0_8_ = 0xbf800000bf800000;
        auVar447._12_4_ = 0xbf800000;
        auVar422._0_4_ = auVar392._0_4_ + -1.0;
        auVar422._4_4_ = auVar392._4_4_ + -1.0;
        auVar422._8_4_ = auVar392._8_4_ + -1.0;
        auVar422._12_4_ = auVar392._12_4_ + -1.0;
        auVar308 = vaddps_avx512vl(auVar307,auVar447);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar315._0_4_ = (uint)bVar1 * auVar308._0_4_ | (uint)!bVar1 * auVar307._0_4_;
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar315._4_4_ = (uint)bVar1 * auVar308._4_4_ | (uint)!bVar1 * auVar307._4_4_;
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar315._8_4_ = (uint)bVar1 * auVar308._8_4_ | (uint)!bVar1 * auVar307._8_4_;
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar315._12_4_ = (uint)bVar1 * auVar308._12_4_ | (uint)!bVar1 * auVar307._12_4_;
        auVar307 = vaddps_avx512vl(auVar422,auVar392);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar316._0_4_ = (float)((uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * (int)auVar422._0_4_);
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar316._4_4_ = (float)((uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * (int)auVar422._4_4_);
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar316._8_4_ = (float)((uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * (int)auVar422._8_4_);
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar316._12_4_ =
             (float)((uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * (int)auVar422._12_4_);
        auVar378._0_4_ = auVar316._0_4_ * auVar316._0_4_;
        auVar378._4_4_ = auVar316._4_4_ * auVar316._4_4_;
        auVar378._8_4_ = auVar316._8_4_ * auVar316._8_4_;
        auVar378._12_4_ = auVar316._12_4_ * auVar316._12_4_;
        auVar448._8_4_ = 0x3d9021bb;
        auVar448._0_8_ = 0x3d9021bb3d9021bb;
        auVar448._12_4_ = 0x3d9021bb;
        auVar110._8_4_ = 0xbdebd1b8;
        auVar110._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar110._12_4_ = 0xbdebd1b8;
        auVar307 = vfmadd213ps_avx512vl(auVar448,auVar316,auVar110);
        auVar111._8_4_ = 0x3def251a;
        auVar111._0_8_ = 0x3def251a3def251a;
        auVar111._12_4_ = 0x3def251a;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar316,auVar111);
        auVar112._8_4_ = 0xbdfe5d4f;
        auVar112._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar112._12_4_ = 0xbdfe5d4f;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar316,auVar112);
        auVar113._8_4_ = 0x3e11e9bf;
        auVar113._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar113._12_4_ = 0x3e11e9bf;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar316,auVar113);
        auVar114._8_4_ = 0xbe2aae50;
        auVar114._0_8_ = 0xbe2aae50be2aae50;
        auVar114._12_4_ = 0xbe2aae50;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar316,auVar114);
        auVar115._8_4_ = 0x3e4cceac;
        auVar115._0_8_ = 0x3e4cceac3e4cceac;
        auVar115._12_4_ = 0x3e4cceac;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar316,auVar115);
        auVar116._8_4_ = 0xbe7ffffc;
        auVar116._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar116._12_4_ = 0xbe7ffffc;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar316,auVar116);
        auVar117._8_4_ = 0x3eaaaaaa;
        auVar117._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar117._12_4_ = 0x3eaaaaaa;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar316,auVar117);
        auVar449._0_4_ = auVar378._0_4_ * auVar316._0_4_ * auVar307._0_4_;
        auVar449._4_4_ = auVar378._4_4_ * auVar316._4_4_ * auVar307._4_4_;
        auVar449._8_4_ = auVar378._8_4_ * auVar316._8_4_ * auVar307._8_4_;
        auVar449._12_4_ = auVar378._12_4_ * auVar316._12_4_ * auVar307._12_4_;
        auVar118._8_4_ = 0xb95e8083;
        auVar118._0_8_ = 0xb95e8083b95e8083;
        auVar118._12_4_ = 0xb95e8083;
        auVar307 = vfmadd231ps_avx512vl(auVar449,auVar315,auVar118);
        auVar119._8_4_ = 0x3f000000;
        auVar119._0_8_ = 0x3f0000003f000000;
        auVar119._12_4_ = 0x3f000000;
        auVar307 = vfmsub231ps_avx512vl(auVar307,auVar378,auVar119);
        auVar307 = vsubps_avx(auVar307,auVar316);
        auVar120._8_4_ = 0x3f318000;
        auVar120._0_8_ = 0x3f3180003f318000;
        auVar120._12_4_ = 0x3f318000;
        auVar308 = vfmsub231ps_avx512vl(auVar307,auVar315,auVar120);
        auVar307 = vpcmpeqd_avx(auVar315,auVar315);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar317._0_4_ = (uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * auVar308._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar317._4_4_ = (uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * auVar308._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar317._8_4_ = (uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * auVar308._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar317._12_4_ = (uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * auVar308._12_4_;
        *(undefined1 (*) [16])*pauVar295 = auVar317;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        fVar368 = logf(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 9:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    auVar267._8_4_ = 0x80000000;
    auVar267._0_8_ = 0x8000000080000000;
    auVar267._12_4_ = 0x80000000;
    auVar267._16_4_ = 0x80000000;
    auVar267._20_4_ = 0x80000000;
    auVar267._24_4_ = 0x80000000;
    auVar267._28_4_ = 0x80000000;
    auVar267._32_4_ = 0x80000000;
    auVar267._36_4_ = 0x80000000;
    auVar267._40_4_ = 0x80000000;
    auVar267._44_4_ = 0x80000000;
    auVar267._48_4_ = 0x80000000;
    auVar267._52_4_ = 0x80000000;
    auVar267._56_4_ = 0x80000000;
    auVar267._60_4_ = 0x80000000;
    auVar361 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar267);
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    auVar350 = auVar361;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar268._8_4_ = 0x7fffffff;
        auVar268._0_8_ = 0x7fffffff7fffffff;
        auVar268._12_4_ = 0x7fffffff;
        auVar268._16_4_ = 0x7fffffff;
        auVar268._20_4_ = 0x7fffffff;
        auVar268._24_4_ = 0x7fffffff;
        auVar268._28_4_ = 0x7fffffff;
        auVar268._32_4_ = 0x7fffffff;
        auVar268._36_4_ = 0x7fffffff;
        auVar268._40_4_ = 0x7fffffff;
        auVar268._44_4_ = 0x7fffffff;
        auVar268._48_4_ = 0x7fffffff;
        auVar268._52_4_ = 0x7fffffff;
        auVar268._56_4_ = 0x7fffffff;
        auVar268._60_4_ = 0x7fffffff;
        auVar352 = vandpd_avx512dq(*pauVar295,auVar268);
        auVar353 = vandpd_avx512dq(*pauVar295,(undefined1  [64])_ps512_sign_mask);
        auVar354 = vmulps_avx512f(auVar352,(undefined1  [64])_ps512_cephes_FOPI);
        auVar354 = vcvttps2dq_avx512f(auVar354);
        auVar354 = vpaddd_avx512f(auVar354,(undefined1  [64])_pi32_512_1);
        auVar354 = vpandq_avx512f(auVar354,(undefined1  [64])_pi32_512_inv1);
        auVar355 = vcvtdq2ps_avx512f(auVar354);
        auVar339 = vpandq_avx512f(auVar354,(undefined1  [64])_pi32_512_4);
        auVar339 = vpslld_avx512f(auVar339,0x1d);
        uVar297 = vptestnmd_avx512f(auVar354,(undefined1  [64])_pi32_512_2);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar355,(undefined1  [64])_ps512_minus_cephes_DP1);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar355,(undefined1  [64])_ps512_minus_cephes_DP2);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar355,(undefined1  [64])_ps512_minus_cephes_DP3);
        auVar354 = vmulps_avx512f(auVar352,auVar352);
        auVar355 = vfmadd132ps_avx512f(auVar354,(undefined1  [64])_ps512_coscof_p1,
                                       (undefined1  [64])_ps512_coscof_p0);
        auVar355 = vfmadd213ps_avx512f(auVar355,auVar354,(undefined1  [64])_ps512_coscof_p2);
        auVar342 = vmulps_avx512f(auVar354,auVar354);
        auVar355 = vfmadd213ps_avx512f(auVar342,auVar355,(undefined1  [64])::_ps512_1);
        auVar355 = vfmadd231ps_avx512f(auVar355,auVar354,auVar361);
        auVar342 = vfmadd132ps_avx512f(auVar354,(undefined1  [64])_ps512_sincof_p1,
                                       (undefined1  [64])_ps512_sincof_p0);
        in_ZMM3 = vfmadd213ps_avx512f(auVar342,auVar354,(undefined1  [64])_ps512_sincof_p2);
        auVar354 = vmulps_avx512f(in_ZMM3,auVar354);
        auVar352 = vfmadd213ps_avx512f(auVar354,auVar352,auVar352);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar349._0_4_ = (uint)bVar1 * auVar352._0_4_ | (uint)!bVar1 * auVar355._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar349._4_4_ = (uint)bVar1 * auVar352._4_4_ | (uint)!bVar1 * auVar355._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar349._8_4_ = (uint)bVar1 * auVar352._8_4_ | (uint)!bVar1 * auVar355._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar349._12_4_ = (uint)bVar1 * auVar352._12_4_ | (uint)!bVar1 * auVar355._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar349._16_4_ = (uint)bVar1 * auVar352._16_4_ | (uint)!bVar1 * auVar355._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar349._20_4_ = (uint)bVar1 * auVar352._20_4_ | (uint)!bVar1 * auVar355._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar349._24_4_ = (uint)bVar1 * auVar352._24_4_ | (uint)!bVar1 * auVar355._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar349._28_4_ = (uint)bVar1 * auVar352._28_4_ | (uint)!bVar1 * auVar355._28_4_;
        bVar1 = (bool)((byte)(uVar297 >> 8) & 1);
        auVar349._32_4_ = (uint)bVar1 * auVar352._32_4_ | (uint)!bVar1 * auVar355._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar349._36_4_ = (uint)bVar1 * auVar352._36_4_ | (uint)!bVar1 * auVar355._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar349._40_4_ = (uint)bVar1 * auVar352._40_4_ | (uint)!bVar1 * auVar355._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar349._44_4_ = (uint)bVar1 * auVar352._44_4_ | (uint)!bVar1 * auVar355._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar349._48_4_ = (uint)bVar1 * auVar352._48_4_ | (uint)!bVar1 * auVar355._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar349._52_4_ = (uint)bVar1 * auVar352._52_4_ | (uint)!bVar1 * auVar355._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar349._56_4_ = (uint)bVar1 * auVar352._56_4_ | (uint)!bVar1 * auVar355._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar349._60_4_ = (uint)bVar1 * auVar352._60_4_ | (uint)!bVar1 * auVar355._60_4_;
        auVar350 = vpternlogd_avx512f(auVar349,auVar339,auVar353,0x96);
        auVar352 = vmovdqu64_avx512f(auVar350);
        *pauVar295 = auVar352;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar201._8_4_ = 0x7fffffff;
        auVar201._0_8_ = 0x7fffffff7fffffff;
        auVar201._12_4_ = 0x7fffffff;
        auVar201._16_4_ = 0x7fffffff;
        auVar201._20_4_ = 0x7fffffff;
        auVar201._24_4_ = 0x7fffffff;
        auVar201._28_4_ = 0x7fffffff;
        vandps_avx512vl(*(undefined1 (*) [32])*pauVar295,auVar201);
        auVar202._8_4_ = 0x3fa2f983;
        auVar202._0_8_ = 0x3fa2f9833fa2f983;
        auVar202._12_4_ = 0x3fa2f983;
        auVar202._16_4_ = 0x3fa2f983;
        auVar202._20_4_ = 0x3fa2f983;
        auVar202._24_4_ = 0x3fa2f983;
        auVar202._28_4_ = 0x3fa2f983;
        auVar329 = vmulps_avx512vl(auVar350._0_32_,auVar202);
        auVar425._0_4_ = (int)auVar329._0_4_;
        auVar425._4_4_ = (int)auVar329._4_4_;
        auVar425._8_4_ = (int)auVar329._8_4_;
        auVar425._12_4_ = (int)auVar329._12_4_;
        auVar425._16_4_ = (int)auVar329._16_4_;
        auVar425._20_4_ = (int)auVar329._20_4_;
        auVar425._24_4_ = (int)auVar329._24_4_;
        auVar425._28_4_ = (int)auVar329._28_4_;
        auVar329 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
        auVar330 = vpsubd_avx2(auVar425,auVar329);
        auVar203._8_4_ = 0xfffffffe;
        auVar203._0_8_ = 0xfffffffefffffffe;
        auVar203._12_4_ = 0xfffffffe;
        auVar203._16_4_ = 0xfffffffe;
        auVar203._20_4_ = 0xfffffffe;
        auVar203._24_4_ = 0xfffffffe;
        auVar203._28_4_ = 0xfffffffe;
        auVar329 = vpandd_avx512vl(auVar330,auVar203);
        auVar329 = vcvtdq2ps_avx(auVar329);
        auVar322 = vpslld_avx2(auVar330,0x1d);
        auVar204._8_4_ = 2;
        auVar204._0_8_ = 0x200000002;
        auVar204._12_4_ = 2;
        auVar204._16_4_ = 2;
        auVar204._20_4_ = 2;
        auVar204._24_4_ = 2;
        auVar204._28_4_ = 2;
        uVar297 = vptestnmd_avx512vl(auVar330,auVar204);
        auVar205._8_4_ = 0xbf490000;
        auVar205._0_8_ = 0xbf490000bf490000;
        auVar205._12_4_ = 0xbf490000;
        auVar205._16_4_ = 0xbf490000;
        auVar205._20_4_ = 0xbf490000;
        auVar205._24_4_ = 0xbf490000;
        auVar205._28_4_ = 0xbf490000;
        auVar399 = vfmadd231ps_avx512vl(auVar350._0_32_,auVar329,auVar205);
        auVar206._8_4_ = 0xb97da000;
        auVar206._0_8_ = 0xb97da000b97da000;
        auVar206._12_4_ = 0xb97da000;
        auVar206._16_4_ = 0xb97da000;
        auVar206._20_4_ = 0xb97da000;
        auVar206._24_4_ = 0xb97da000;
        auVar206._28_4_ = 0xb97da000;
        auVar399 = vfmadd231ps_avx512vl(auVar399,auVar329,auVar206);
        auVar207._8_4_ = 0xb3222169;
        auVar207._0_8_ = 0xb3222169b3222169;
        auVar207._12_4_ = 0xb3222169;
        auVar207._16_4_ = 0xb3222169;
        auVar207._20_4_ = 0xb3222169;
        auVar207._24_4_ = 0xb3222169;
        auVar207._28_4_ = 0xb3222169;
        auVar329 = vfmadd231ps_avx512vl(auVar399,auVar329,auVar207);
        fVar368 = auVar329._0_4_ * auVar329._0_4_;
        fVar362 = auVar329._4_4_ * auVar329._4_4_;
        auVar278._4_4_ = fVar362;
        auVar278._0_4_ = fVar368;
        fVar363 = auVar329._8_4_ * auVar329._8_4_;
        auVar278._8_4_ = fVar363;
        fVar364 = auVar329._12_4_ * auVar329._12_4_;
        auVar278._12_4_ = fVar364;
        fVar365 = auVar329._16_4_ * auVar329._16_4_;
        auVar278._16_4_ = fVar365;
        fVar366 = auVar329._20_4_ * auVar329._20_4_;
        auVar278._20_4_ = fVar366;
        fVar367 = auVar329._24_4_ * auVar329._24_4_;
        auVar278._24_4_ = fVar367;
        auVar278._28_4_ = auVar330._28_4_;
        auVar451._8_4_ = 0x37ccf5ce;
        auVar451._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar451._12_4_ = 0x37ccf5ce;
        auVar451._16_4_ = 0x37ccf5ce;
        auVar451._20_4_ = 0x37ccf5ce;
        auVar451._24_4_ = 0x37ccf5ce;
        auVar451._28_4_ = 0x37ccf5ce;
        auVar208._8_4_ = 0xbab6061a;
        auVar208._0_8_ = 0xbab6061abab6061a;
        auVar208._12_4_ = 0xbab6061a;
        auVar208._16_4_ = 0xbab6061a;
        auVar208._20_4_ = 0xbab6061a;
        auVar208._24_4_ = 0xbab6061a;
        auVar208._28_4_ = 0xbab6061a;
        auVar399 = vfmadd213ps_avx512vl(auVar451,auVar278,auVar208);
        auVar209._8_4_ = 0x3d2aaaa5;
        auVar209._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar209._12_4_ = 0x3d2aaaa5;
        auVar209._16_4_ = 0x3d2aaaa5;
        auVar209._20_4_ = 0x3d2aaaa5;
        auVar209._24_4_ = 0x3d2aaaa5;
        auVar209._28_4_ = 0x3d2aaaa5;
        auVar399 = vfmadd213ps_avx512vl(auVar399,auVar278,auVar209);
        auVar279._4_4_ = fVar362 * fVar362 * auVar399._4_4_;
        auVar279._0_4_ = fVar368 * fVar368 * auVar399._0_4_;
        auVar279._8_4_ = fVar363 * fVar363 * auVar399._8_4_;
        auVar279._12_4_ = fVar364 * fVar364 * auVar399._12_4_;
        auVar279._16_4_ = fVar365 * fVar365 * auVar399._16_4_;
        auVar279._20_4_ = fVar366 * fVar366 * auVar399._20_4_;
        auVar279._24_4_ = fVar367 * fVar367 * auVar399._24_4_;
        auVar279._28_4_ = auVar399._28_4_;
        auVar210._8_4_ = 0x3f000000;
        auVar210._0_8_ = 0x3f0000003f000000;
        auVar210._12_4_ = 0x3f000000;
        auVar210._16_4_ = 0x3f000000;
        auVar210._20_4_ = 0x3f000000;
        auVar210._24_4_ = 0x3f000000;
        auVar210._28_4_ = 0x3f000000;
        auVar399 = vfnmadd231ps_avx512vl(auVar279,auVar278,auVar210);
        auVar211._8_4_ = 0x3f800000;
        auVar211._0_8_ = 0x3f8000003f800000;
        auVar211._12_4_ = 0x3f800000;
        auVar211._16_4_ = 0x3f800000;
        auVar211._20_4_ = 0x3f800000;
        auVar211._24_4_ = 0x3f800000;
        auVar211._28_4_ = 0x3f800000;
        auVar399 = vaddps_avx512vl(auVar399,auVar211);
        auVar478._8_4_ = 0xb94ca1f9;
        auVar478._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar478._12_4_ = 0xb94ca1f9;
        auVar478._16_4_ = 0xb94ca1f9;
        auVar478._20_4_ = 0xb94ca1f9;
        auVar478._24_4_ = 0xb94ca1f9;
        auVar478._28_4_ = 0xb94ca1f9;
        auVar212._8_4_ = 0x3c08839e;
        auVar212._0_8_ = 0x3c08839e3c08839e;
        auVar212._12_4_ = 0x3c08839e;
        auVar212._16_4_ = 0x3c08839e;
        auVar212._20_4_ = 0x3c08839e;
        auVar212._24_4_ = 0x3c08839e;
        auVar212._28_4_ = 0x3c08839e;
        auVar318 = vfmadd213ps_avx512vl(auVar478,auVar278,auVar212);
        auVar213._8_4_ = 0xbe2aaaa3;
        auVar213._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar213._12_4_ = 0xbe2aaaa3;
        auVar213._16_4_ = 0xbe2aaaa3;
        auVar213._20_4_ = 0xbe2aaaa3;
        auVar213._24_4_ = 0xbe2aaaa3;
        auVar213._28_4_ = 0xbe2aaaa3;
        auVar318 = vfmadd213ps_avx512vl(auVar318,auVar278,auVar213);
        auVar280._4_4_ = auVar318._4_4_ * fVar362;
        auVar280._0_4_ = auVar318._0_4_ * fVar368;
        auVar280._8_4_ = auVar318._8_4_ * fVar363;
        auVar280._12_4_ = auVar318._12_4_ * fVar364;
        auVar280._16_4_ = auVar318._16_4_ * fVar365;
        auVar280._20_4_ = auVar318._20_4_ * fVar366;
        auVar280._24_4_ = auVar318._24_4_ * fVar367;
        auVar280._28_4_ = auVar330._28_4_;
        auVar307 = vfmadd213ps_fma(auVar280,auVar329,auVar329);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar327._0_4_ = (uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * auVar399._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar327._4_4_ = (uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * auVar399._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar327._8_4_ = (uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * auVar399._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar327._12_4_ = (uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * auVar399._12_4_;
        auVar327._16_4_ = (uint)!(bool)((byte)(uVar297 >> 4) & 1) * auVar399._16_4_;
        auVar327._20_4_ = (uint)!(bool)((byte)(uVar297 >> 5) & 1) * auVar399._20_4_;
        auVar327._24_4_ = (uint)!(bool)((byte)(uVar297 >> 6) & 1) * auVar399._24_4_;
        auVar327._28_4_ = (uint)!SUB81(uVar297 >> 7,0) * auVar399._28_4_;
        auVar214._8_4_ = 0x80000000;
        auVar214._0_8_ = 0x8000000080000000;
        auVar214._12_4_ = 0x80000000;
        auVar214._16_4_ = 0x80000000;
        auVar214._20_4_ = 0x80000000;
        auVar214._24_4_ = 0x80000000;
        auVar214._28_4_ = 0x80000000;
        auVar350._0_32_ =
             vpternlogd_avx512vl(auVar327,auVar322 ^ *(undefined1 (*) [32])*pauVar295,auVar214,0x78)
        ;
        in_ZMM3 = ZEXT3264(auVar350._0_32_);
        *(undefined1 (*) [32])*pauVar295 = auVar350._0_32_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar92._8_4_ = 0x7fffffff;
        auVar92._0_8_ = 0x7fffffff7fffffff;
        auVar92._12_4_ = 0x7fffffff;
        auVar392 = vandps_avx512vl(*(undefined1 (*) [16])*pauVar295,auVar92);
        auVar93._8_4_ = 0x3fa2f983;
        auVar93._0_8_ = 0x3fa2f9833fa2f983;
        auVar93._12_4_ = 0x3fa2f983;
        auVar307 = vmulps_avx512vl(auVar392,auVar93);
        auVar411._0_4_ = (int)auVar307._0_4_;
        auVar411._4_4_ = (int)auVar307._4_4_;
        auVar411._8_4_ = (int)auVar307._8_4_;
        auVar411._12_4_ = (int)auVar307._12_4_;
        auVar307 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
        auVar308 = vpsubd_avx(auVar411,auVar307);
        auVar94._8_4_ = 0xfffffffe;
        auVar94._0_8_ = 0xfffffffefffffffe;
        auVar94._12_4_ = 0xfffffffe;
        auVar307 = vpandd_avx512vl(auVar308,auVar94);
        auVar307 = vcvtdq2ps_avx(auVar307);
        auVar312 = vpslld_avx(auVar308,0x1d);
        auVar95._8_4_ = 2;
        auVar95._0_8_ = 0x200000002;
        auVar95._12_4_ = 2;
        uVar297 = vptestnmd_avx512vl(auVar308,auVar95);
        uVar297 = uVar297 & 0xf;
        auVar96._8_4_ = 0xbf490000;
        auVar96._0_8_ = 0xbf490000bf490000;
        auVar96._12_4_ = 0xbf490000;
        auVar308 = vfmadd231ps_avx512vl(auVar392,auVar307,auVar96);
        auVar97._8_4_ = 0xb97da000;
        auVar97._0_8_ = 0xb97da000b97da000;
        auVar97._12_4_ = 0xb97da000;
        auVar308 = vfmadd231ps_avx512vl(auVar308,auVar307,auVar97);
        auVar98._8_4_ = 0xb3222169;
        auVar98._0_8_ = 0xb3222169b3222169;
        auVar98._12_4_ = 0xb3222169;
        auVar307 = vfmadd231ps_avx512vl(auVar308,auVar307,auVar98);
        auVar412._0_4_ = auVar307._0_4_ * auVar307._0_4_;
        auVar412._4_4_ = auVar307._4_4_ * auVar307._4_4_;
        auVar412._8_4_ = auVar307._8_4_ * auVar307._8_4_;
        auVar412._12_4_ = auVar307._12_4_ * auVar307._12_4_;
        auVar437._8_4_ = 0x37ccf5ce;
        auVar437._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar437._12_4_ = 0x37ccf5ce;
        auVar99._8_4_ = 0xbab6061a;
        auVar99._0_8_ = 0xbab6061abab6061a;
        auVar99._12_4_ = 0xbab6061a;
        auVar308 = vfmadd213ps_avx512vl(auVar437,auVar412,auVar99);
        auVar100._8_4_ = 0x3d2aaaa5;
        auVar100._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar100._12_4_ = 0x3d2aaaa5;
        auVar308 = vfmadd213ps_avx512vl(auVar308,auVar412,auVar100);
        auVar438._0_4_ = auVar412._0_4_ * auVar412._0_4_ * auVar308._0_4_;
        auVar438._4_4_ = auVar412._4_4_ * auVar412._4_4_ * auVar308._4_4_;
        auVar438._8_4_ = auVar412._8_4_ * auVar412._8_4_ * auVar308._8_4_;
        auVar438._12_4_ = auVar412._12_4_ * auVar412._12_4_ * auVar308._12_4_;
        auVar101._8_4_ = 0x3f000000;
        auVar101._0_8_ = 0x3f0000003f000000;
        auVar101._12_4_ = 0x3f000000;
        auVar308 = vfnmadd231ps_avx512vl(auVar438,auVar412,auVar101);
        auVar102._8_4_ = 0x3f800000;
        auVar102._0_8_ = 0x3f8000003f800000;
        auVar102._12_4_ = 0x3f800000;
        auVar308 = vaddps_avx512vl(auVar308,auVar102);
        auVar469._8_4_ = 0xb94ca1f9;
        auVar469._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar469._12_4_ = 0xb94ca1f9;
        auVar103._8_4_ = 0x3c08839e;
        auVar103._0_8_ = 0x3c08839e3c08839e;
        auVar103._12_4_ = 0x3c08839e;
        auVar392 = vfmadd213ps_avx512vl(auVar469,auVar412,auVar103);
        auVar104._8_4_ = 0xbe2aaaa3;
        auVar104._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar104._12_4_ = 0xbe2aaaa3;
        auVar392 = vfmadd213ps_avx512vl(auVar392,auVar412,auVar104);
        auVar413._0_4_ = auVar392._0_4_ * auVar412._0_4_;
        auVar413._4_4_ = auVar392._4_4_ * auVar412._4_4_;
        auVar413._8_4_ = auVar392._8_4_ * auVar412._8_4_;
        auVar413._12_4_ = auVar392._12_4_ * auVar412._12_4_;
        auVar307 = vfmadd213ps_fma(auVar413,auVar307,auVar307);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar305._0_4_ = (uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * auVar308._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar305._4_4_ = (uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * auVar308._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar305._8_4_ = (uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * auVar308._8_4_;
        bVar1 = SUB81(uVar297 >> 3,0);
        auVar305._12_4_ = (uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * auVar308._12_4_;
        auVar105._8_4_ = 0x80000000;
        auVar105._0_8_ = 0x8000000080000000;
        auVar105._12_4_ = 0x80000000;
        auVar350._0_16_ =
             vpternlogd_avx512vl(auVar305,auVar312 ^ *(undefined1 (*) [16])*pauVar295,auVar105,0x78)
        ;
        in_ZMM3 = ZEXT1664(auVar350._0_16_);
        *(undefined1 (*) [16])*pauVar295 = auVar350._0_16_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        fVar368 = sinf(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 10:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    auVar361 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
    auVar266._8_4_ = 0x80000000;
    auVar266._0_8_ = 0x8000000080000000;
    auVar266._12_4_ = 0x80000000;
    auVar266._16_4_ = 0x80000000;
    auVar266._20_4_ = 0x80000000;
    auVar266._24_4_ = 0x80000000;
    auVar266._28_4_ = 0x80000000;
    auVar266._32_4_ = 0x80000000;
    auVar266._36_4_ = 0x80000000;
    auVar266._40_4_ = 0x80000000;
    auVar266._44_4_ = 0x80000000;
    auVar266._48_4_ = 0x80000000;
    auVar266._52_4_ = 0x80000000;
    auVar266._56_4_ = 0x80000000;
    auVar266._60_4_ = 0x80000000;
    auVar361 = vpxord_avx512f(auVar361,auVar266);
    auVar361 = vmovdqu64_avx512f(auVar361);
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar352 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
        auVar352 = vandps_avx512dq(auVar352,*pauVar295);
        auVar353 = vmulps_avx512f(auVar352,(undefined1  [64])_ps512_cephes_FOPI);
        auVar353 = vcvttps2dq_avx512f(auVar353);
        auVar353 = vpaddd_avx512f(auVar353,(undefined1  [64])_pi32_512_1);
        auVar353 = vpandd_avx512f(auVar353,(undefined1  [64])_pi32_512_inv1);
        auVar354 = vcvtdq2ps_avx512f(auVar353);
        auVar355 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_2);
        auVar353 = vpsubd_avx512f(auVar353,auVar355);
        auVar339 = vpandnq_avx512f(auVar353,(undefined1  [64])_pi32_512_4);
        auVar339 = vpslld_avx512f(auVar339,0x1d);
        uVar297 = vptestnmd_avx512f(auVar355,auVar353);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar354,(undefined1  [64])_ps512_minus_cephes_DP1);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar354,(undefined1  [64])_ps512_minus_cephes_DP2);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar354,(undefined1  [64])_ps512_minus_cephes_DP3);
        auVar353 = vmulps_avx512f(auVar352,auVar352);
        auVar354 = vfmadd132ps_avx512f(auVar353,(undefined1  [64])_ps512_coscof_p1,
                                       (undefined1  [64])_ps512_coscof_p0);
        auVar354 = vfmadd213ps_avx512f(auVar354,auVar353,(undefined1  [64])_ps512_coscof_p2);
        auVar355 = vmulps_avx512f(auVar353,auVar353);
        auVar354 = vfmadd213ps_avx512f(auVar355,auVar354,(undefined1  [64])::_ps512_1);
        auVar354 = vfmadd231ps_avx512f(auVar354,auVar353,auVar361);
        auVar355 = vfmadd213ps_avx512f((undefined1  [64])_ps512_sincof_p0,auVar353,
                                       (undefined1  [64])_ps512_sincof_p1);
        in_ZMM2 = vfmadd213ps_avx512f(auVar355,auVar353,(undefined1  [64])_ps512_sincof_p2);
        auVar353 = vmulps_avx512f(auVar353,auVar352);
        auVar352 = vfmadd213ps_avx512f(auVar353,in_ZMM2,auVar352);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar357._0_4_ = (uint)bVar1 * auVar352._0_4_ | (uint)!bVar1 * auVar354._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar357._4_4_ = (uint)bVar1 * auVar352._4_4_ | (uint)!bVar1 * auVar354._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar357._8_4_ = (uint)bVar1 * auVar352._8_4_ | (uint)!bVar1 * auVar354._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar357._12_4_ = (uint)bVar1 * auVar352._12_4_ | (uint)!bVar1 * auVar354._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar357._16_4_ = (uint)bVar1 * auVar352._16_4_ | (uint)!bVar1 * auVar354._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar357._20_4_ = (uint)bVar1 * auVar352._20_4_ | (uint)!bVar1 * auVar354._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar357._24_4_ = (uint)bVar1 * auVar352._24_4_ | (uint)!bVar1 * auVar354._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar357._28_4_ = (uint)bVar1 * auVar352._28_4_ | (uint)!bVar1 * auVar354._28_4_;
        bVar1 = (bool)((byte)(uVar297 >> 8) & 1);
        auVar357._32_4_ = (uint)bVar1 * auVar352._32_4_ | (uint)!bVar1 * auVar354._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar357._36_4_ = (uint)bVar1 * auVar352._36_4_ | (uint)!bVar1 * auVar354._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar357._40_4_ = (uint)bVar1 * auVar352._40_4_ | (uint)!bVar1 * auVar354._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar357._44_4_ = (uint)bVar1 * auVar352._44_4_ | (uint)!bVar1 * auVar354._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar357._48_4_ = (uint)bVar1 * auVar352._48_4_ | (uint)!bVar1 * auVar354._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar357._52_4_ = (uint)bVar1 * auVar352._52_4_ | (uint)!bVar1 * auVar354._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar357._56_4_ = (uint)bVar1 * auVar352._56_4_ | (uint)!bVar1 * auVar354._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar357._60_4_ = (uint)bVar1 * auVar352._60_4_ | (uint)!bVar1 * auVar354._60_4_;
        auVar352 = vpxord_avx512f(auVar339,auVar357);
        auVar352 = vmovdqu64_avx512f(auVar352);
        *pauVar295 = auVar352;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar384._8_4_ = 0x7fffffff;
        auVar384._0_8_ = 0x7fffffff7fffffff;
        auVar384._12_4_ = 0x7fffffff;
        auVar384._16_4_ = 0x7fffffff;
        auVar384._20_4_ = 0x7fffffff;
        auVar384._24_4_ = 0x7fffffff;
        auVar384._28_4_ = 0x7fffffff;
        auVar329 = vandps_avx(auVar384,*(undefined1 (*) [32])*pauVar295);
        auVar190._8_4_ = 0x3fa2f983;
        auVar190._0_8_ = 0x3fa2f9833fa2f983;
        auVar190._12_4_ = 0x3fa2f983;
        auVar190._16_4_ = 0x3fa2f983;
        auVar190._20_4_ = 0x3fa2f983;
        auVar190._24_4_ = 0x3fa2f983;
        auVar190._28_4_ = 0x3fa2f983;
        auVar330 = vmulps_avx512vl(auVar329,auVar190);
        auVar400._0_4_ = (int)auVar330._0_4_;
        auVar400._4_4_ = (int)auVar330._4_4_;
        auVar400._8_4_ = (int)auVar330._8_4_;
        auVar400._12_4_ = (int)auVar330._12_4_;
        auVar400._16_4_ = (int)auVar330._16_4_;
        auVar400._20_4_ = (int)auVar330._20_4_;
        auVar400._24_4_ = (int)auVar330._24_4_;
        auVar400._28_4_ = (int)auVar330._28_4_;
        auVar330 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
        auVar330 = vpsubd_avx2(auVar400,auVar330);
        auVar458._8_4_ = 0xfffffffe;
        auVar458._0_8_ = 0xfffffffefffffffe;
        auVar458._12_4_ = 0xfffffffe;
        auVar458._16_4_ = 0xfffffffe;
        auVar458._20_4_ = 0xfffffffe;
        auVar458._24_4_ = 0xfffffffe;
        auVar458._28_4_ = 0xfffffffe;
        auVar399 = vpand_avx2(auVar330,auVar458);
        auVar330 = vcvtdq2ps_avx(auVar399);
        auVar399 = vpaddd_avx2(auVar399,auVar458);
        auVar322 = vpslld_avx2(auVar399,0x1d);
        auVar191._8_4_ = 2;
        auVar191._0_8_ = 0x200000002;
        auVar191._12_4_ = 2;
        auVar191._16_4_ = 2;
        auVar191._20_4_ = 2;
        auVar191._24_4_ = 2;
        auVar191._28_4_ = 2;
        uVar297 = vptestnmd_avx512vl(auVar399,auVar191);
        auVar192._8_4_ = 0xbf490000;
        auVar192._0_8_ = 0xbf490000bf490000;
        auVar192._12_4_ = 0xbf490000;
        auVar192._16_4_ = 0xbf490000;
        auVar192._20_4_ = 0xbf490000;
        auVar192._24_4_ = 0xbf490000;
        auVar192._28_4_ = 0xbf490000;
        auVar329 = vfmadd231ps_avx512vl(auVar329,auVar330,auVar192);
        auVar193._8_4_ = 0xb97da000;
        auVar193._0_8_ = 0xb97da000b97da000;
        auVar193._12_4_ = 0xb97da000;
        auVar193._16_4_ = 0xb97da000;
        auVar193._20_4_ = 0xb97da000;
        auVar193._24_4_ = 0xb97da000;
        auVar193._28_4_ = 0xb97da000;
        auVar329 = vfmadd231ps_avx512vl(auVar329,auVar330,auVar193);
        auVar194._8_4_ = 0xb3222169;
        auVar194._0_8_ = 0xb3222169b3222169;
        auVar194._12_4_ = 0xb3222169;
        auVar194._16_4_ = 0xb3222169;
        auVar194._20_4_ = 0xb3222169;
        auVar194._24_4_ = 0xb3222169;
        auVar194._28_4_ = 0xb3222169;
        auVar329 = vfmadd231ps_avx512vl(auVar329,auVar330,auVar194);
        fVar368 = auVar329._0_4_;
        fVar385 = fVar368 * fVar368;
        fVar362 = auVar329._4_4_;
        fVar402 = fVar362 * fVar362;
        auVar285._4_4_ = fVar402;
        auVar285._0_4_ = fVar385;
        fVar363 = auVar329._8_4_;
        fVar403 = fVar363 * fVar363;
        auVar285._8_4_ = fVar403;
        fVar364 = auVar329._12_4_;
        fVar404 = fVar364 * fVar364;
        auVar285._12_4_ = fVar404;
        fVar365 = auVar329._16_4_;
        fVar405 = fVar365 * fVar365;
        auVar285._16_4_ = fVar405;
        fVar366 = auVar329._20_4_;
        fVar406 = fVar366 * fVar366;
        auVar285._20_4_ = fVar406;
        fVar367 = auVar329._24_4_;
        fVar407 = fVar367 * fVar367;
        auVar285._24_4_ = fVar407;
        auVar285._28_4_ = auVar399._28_4_;
        auVar428._8_4_ = 0x37ccf5ce;
        auVar428._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar428._12_4_ = 0x37ccf5ce;
        auVar428._16_4_ = 0x37ccf5ce;
        auVar428._20_4_ = 0x37ccf5ce;
        auVar428._24_4_ = 0x37ccf5ce;
        auVar428._28_4_ = 0x37ccf5ce;
        auVar195._8_4_ = 0xbab6061a;
        auVar195._0_8_ = 0xbab6061abab6061a;
        auVar195._12_4_ = 0xbab6061a;
        auVar195._16_4_ = 0xbab6061a;
        auVar195._20_4_ = 0xbab6061a;
        auVar195._24_4_ = 0xbab6061a;
        auVar195._28_4_ = 0xbab6061a;
        auVar330 = vfmadd213ps_avx512vl(auVar428,auVar285,auVar195);
        auVar196._8_4_ = 0x3d2aaaa5;
        auVar196._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar196._12_4_ = 0x3d2aaaa5;
        auVar196._16_4_ = 0x3d2aaaa5;
        auVar196._20_4_ = 0x3d2aaaa5;
        auVar196._24_4_ = 0x3d2aaaa5;
        auVar196._28_4_ = 0x3d2aaaa5;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar285,auVar196);
        auVar286._4_4_ = fVar402 * fVar402 * auVar330._4_4_;
        auVar286._0_4_ = fVar385 * fVar385 * auVar330._0_4_;
        auVar286._8_4_ = fVar403 * fVar403 * auVar330._8_4_;
        auVar286._12_4_ = fVar404 * fVar404 * auVar330._12_4_;
        auVar286._16_4_ = fVar405 * fVar405 * auVar330._16_4_;
        auVar286._20_4_ = fVar406 * fVar406 * auVar330._20_4_;
        auVar286._24_4_ = fVar407 * fVar407 * auVar330._24_4_;
        auVar286._28_4_ = auVar330._28_4_;
        auVar197._8_4_ = 0x3f000000;
        auVar197._0_8_ = 0x3f0000003f000000;
        auVar197._12_4_ = 0x3f000000;
        auVar197._16_4_ = 0x3f000000;
        auVar197._20_4_ = 0x3f000000;
        auVar197._24_4_ = 0x3f000000;
        auVar197._28_4_ = 0x3f000000;
        auVar330 = vfnmadd231ps_avx512vl(auVar286,auVar285,auVar197);
        auVar198._8_4_ = 0x3f800000;
        auVar198._0_8_ = 0x3f8000003f800000;
        auVar198._12_4_ = 0x3f800000;
        auVar198._16_4_ = 0x3f800000;
        auVar198._20_4_ = 0x3f800000;
        auVar198._24_4_ = 0x3f800000;
        auVar198._28_4_ = 0x3f800000;
        auVar330 = vaddps_avx512vl(auVar330,auVar198);
        auVar481._8_4_ = 0xb94ca1f9;
        auVar481._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar481._12_4_ = 0xb94ca1f9;
        auVar481._16_4_ = 0xb94ca1f9;
        auVar481._20_4_ = 0xb94ca1f9;
        auVar481._24_4_ = 0xb94ca1f9;
        auVar481._28_4_ = 0xb94ca1f9;
        auVar199._8_4_ = 0x3c08839e;
        auVar199._0_8_ = 0x3c08839e3c08839e;
        auVar199._12_4_ = 0x3c08839e;
        auVar199._16_4_ = 0x3c08839e;
        auVar199._20_4_ = 0x3c08839e;
        auVar199._24_4_ = 0x3c08839e;
        auVar199._28_4_ = 0x3c08839e;
        auVar318 = vfmadd213ps_avx512vl(auVar481,auVar285,auVar199);
        auVar200._8_4_ = 0xbe2aaaa3;
        auVar200._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar200._12_4_ = 0xbe2aaaa3;
        auVar200._16_4_ = 0xbe2aaaa3;
        auVar200._20_4_ = 0xbe2aaaa3;
        auVar200._24_4_ = 0xbe2aaaa3;
        auVar200._28_4_ = 0xbe2aaaa3;
        auVar318 = vfmadd213ps_avx512vl(auVar318,auVar285,auVar200);
        auVar287._4_4_ = fVar402 * fVar362;
        auVar287._0_4_ = fVar385 * fVar368;
        auVar287._8_4_ = fVar403 * fVar363;
        auVar287._12_4_ = fVar404 * fVar364;
        auVar287._16_4_ = fVar405 * fVar365;
        auVar287._20_4_ = fVar406 * fVar366;
        auVar287._24_4_ = fVar407 * fVar367;
        auVar287._28_4_ = auVar399._28_4_;
        auVar307 = vfmadd213ps_fma(auVar287,auVar318,auVar329);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar335._0_4_ = (uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * auVar330._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar335._4_4_ = (uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * auVar330._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar335._8_4_ = (uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * auVar330._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar335._12_4_ = (uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * auVar330._12_4_;
        auVar335._16_4_ = (uint)!(bool)((byte)(uVar297 >> 4) & 1) * auVar330._16_4_;
        auVar335._20_4_ = (uint)!(bool)((byte)(uVar297 >> 5) & 1) * auVar330._20_4_;
        auVar335._24_4_ = (uint)!(bool)((byte)(uVar297 >> 6) & 1) * auVar330._24_4_;
        auVar335._28_4_ = (uint)!SUB81(uVar297 >> 7,0) * auVar330._28_4_;
        in_ZMM2 = ZEXT3264(auVar335);
        auVar401._8_4_ = 0x80000000;
        auVar401._0_8_ = 0x8000000080000000;
        auVar401._12_4_ = 0x80000000;
        auVar401._16_4_ = 0x80000000;
        auVar401._20_4_ = 0x80000000;
        auVar401._24_4_ = 0x80000000;
        auVar401._28_4_ = 0x80000000;
        auVar329 = vpand_avx2(auVar322,auVar401);
        auVar329 = vpternlogd_avx512vl(auVar329,auVar401,auVar335,0x96);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar377._8_4_ = 0x7fffffff;
        auVar377._0_8_ = 0x7fffffff7fffffff;
        auVar377._12_4_ = 0x7fffffff;
        auVar307 = vandps_avx(auVar377,*(undefined1 (*) [16])*pauVar295);
        auVar81._8_4_ = 0x3fa2f983;
        auVar81._0_8_ = 0x3fa2f9833fa2f983;
        auVar81._12_4_ = 0x3fa2f983;
        auVar308 = vmulps_avx512vl(auVar307,auVar81);
        auVar393._0_4_ = (int)auVar308._0_4_;
        auVar393._4_4_ = (int)auVar308._4_4_;
        auVar393._8_4_ = (int)auVar308._8_4_;
        auVar393._12_4_ = (int)auVar308._12_4_;
        auVar308 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
        auVar308 = vpsubd_avx(auVar393,auVar308);
        auVar446._8_4_ = 0xfffffffe;
        auVar446._0_8_ = 0xfffffffefffffffe;
        auVar446._12_4_ = 0xfffffffe;
        auVar392 = vpand_avx(auVar308,auVar446);
        auVar308 = vcvtdq2ps_avx(auVar392);
        auVar392 = vpaddd_avx(auVar392,auVar446);
        auVar312 = vpslld_avx(auVar392,0x1d);
        auVar82._8_4_ = 2;
        auVar82._0_8_ = 0x200000002;
        auVar82._12_4_ = 2;
        uVar297 = vptestnmd_avx512vl(auVar392,auVar82);
        uVar297 = uVar297 & 0xf;
        auVar83._8_4_ = 0xbf490000;
        auVar83._0_8_ = 0xbf490000bf490000;
        auVar83._12_4_ = 0xbf490000;
        auVar307 = vfmadd231ps_avx512vl(auVar307,auVar308,auVar83);
        auVar84._8_4_ = 0xb97da000;
        auVar84._0_8_ = 0xb97da000b97da000;
        auVar84._12_4_ = 0xb97da000;
        auVar307 = vfmadd231ps_avx512vl(auVar307,auVar308,auVar84);
        auVar85._8_4_ = 0xb3222169;
        auVar85._0_8_ = 0xb3222169b3222169;
        auVar85._12_4_ = 0xb3222169;
        auVar307 = vfmadd231ps_avx512vl(auVar307,auVar308,auVar85);
        auVar394._0_4_ = auVar307._0_4_ * auVar307._0_4_;
        auVar394._4_4_ = auVar307._4_4_ * auVar307._4_4_;
        auVar394._8_4_ = auVar307._8_4_ * auVar307._8_4_;
        auVar394._12_4_ = auVar307._12_4_ * auVar307._12_4_;
        auVar419._8_4_ = 0x37ccf5ce;
        auVar419._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar419._12_4_ = 0x37ccf5ce;
        auVar86._8_4_ = 0xbab6061a;
        auVar86._0_8_ = 0xbab6061abab6061a;
        auVar86._12_4_ = 0xbab6061a;
        auVar308 = vfmadd213ps_avx512vl(auVar419,auVar394,auVar86);
        auVar87._8_4_ = 0x3d2aaaa5;
        auVar87._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar87._12_4_ = 0x3d2aaaa5;
        auVar308 = vfmadd213ps_avx512vl(auVar308,auVar394,auVar87);
        auVar420._0_4_ = auVar394._0_4_ * auVar394._0_4_ * auVar308._0_4_;
        auVar420._4_4_ = auVar394._4_4_ * auVar394._4_4_ * auVar308._4_4_;
        auVar420._8_4_ = auVar394._8_4_ * auVar394._8_4_ * auVar308._8_4_;
        auVar420._12_4_ = auVar394._12_4_ * auVar394._12_4_ * auVar308._12_4_;
        auVar88._8_4_ = 0x3f000000;
        auVar88._0_8_ = 0x3f0000003f000000;
        auVar88._12_4_ = 0x3f000000;
        auVar308 = vfnmadd231ps_avx512vl(auVar420,auVar394,auVar88);
        auVar89._8_4_ = 0x3f800000;
        auVar89._0_8_ = 0x3f8000003f800000;
        auVar89._12_4_ = 0x3f800000;
        auVar308 = vaddps_avx512vl(auVar308,auVar89);
        auVar473._8_4_ = 0xb94ca1f9;
        auVar473._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar473._12_4_ = 0xb94ca1f9;
        auVar90._8_4_ = 0x3c08839e;
        auVar90._0_8_ = 0x3c08839e3c08839e;
        auVar90._12_4_ = 0x3c08839e;
        auVar392 = vfmadd213ps_avx512vl(auVar473,auVar394,auVar90);
        auVar91._8_4_ = 0xbe2aaaa3;
        auVar91._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar91._12_4_ = 0xbe2aaaa3;
        auVar392 = vfmadd213ps_avx512vl(auVar392,auVar394,auVar91);
        auVar395._0_4_ = auVar392._0_4_ * auVar394._0_4_;
        auVar395._4_4_ = auVar392._4_4_ * auVar394._4_4_;
        auVar395._8_4_ = auVar392._8_4_ * auVar394._8_4_;
        auVar395._12_4_ = auVar392._12_4_ * auVar394._12_4_;
        auVar307 = vfmadd213ps_fma(auVar395,auVar307,auVar307);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar314._0_4_ = (uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * auVar308._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar314._4_4_ = (uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * auVar308._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar314._8_4_ = (uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * auVar308._8_4_;
        bVar1 = SUB81(uVar297 >> 3,0);
        auVar314._12_4_ = (uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * auVar308._12_4_;
        in_ZMM2 = ZEXT1664(auVar314);
        auVar396._8_4_ = 0x80000000;
        auVar396._0_8_ = 0x8000000080000000;
        auVar396._12_4_ = 0x80000000;
        auVar307 = vpand_avx(auVar312,auVar396);
        auVar307 = vpternlogd_avx512vl(auVar307,auVar396,auVar314,0x96);
        *(undefined1 (*) [16])*pauVar295 = auVar307;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        fVar368 = cosf(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 0xb:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    auVar264._8_4_ = 0x80000000;
    auVar264._0_8_ = 0x8000000080000000;
    auVar264._12_4_ = 0x80000000;
    auVar264._16_4_ = 0x80000000;
    auVar264._20_4_ = 0x80000000;
    auVar264._24_4_ = 0x80000000;
    auVar264._28_4_ = 0x80000000;
    auVar264._32_4_ = 0x80000000;
    auVar264._36_4_ = 0x80000000;
    auVar264._40_4_ = 0x80000000;
    auVar264._44_4_ = 0x80000000;
    auVar264._48_4_ = 0x80000000;
    auVar264._52_4_ = 0x80000000;
    auVar264._56_4_ = 0x80000000;
    auVar264._60_4_ = 0x80000000;
    auVar361 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar264);
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    auVar346 = auVar361;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar265._8_4_ = 0x7fffffff;
        auVar265._0_8_ = 0x7fffffff7fffffff;
        auVar265._12_4_ = 0x7fffffff;
        auVar265._16_4_ = 0x7fffffff;
        auVar265._20_4_ = 0x7fffffff;
        auVar265._24_4_ = 0x7fffffff;
        auVar265._28_4_ = 0x7fffffff;
        auVar265._32_4_ = 0x7fffffff;
        auVar265._36_4_ = 0x7fffffff;
        auVar265._40_4_ = 0x7fffffff;
        auVar265._44_4_ = 0x7fffffff;
        auVar265._48_4_ = 0x7fffffff;
        auVar265._52_4_ = 0x7fffffff;
        auVar265._56_4_ = 0x7fffffff;
        auVar265._60_4_ = 0x7fffffff;
        auVar352 = vandpd_avx512dq(*pauVar295,auVar265);
        auVar353 = vandpd_avx512dq(*pauVar295,(undefined1  [64])_ps512_sign_mask);
        auVar354 = vmulps_avx512f(auVar352,(undefined1  [64])_ps512_cephes_FOPI);
        auVar354 = vcvttps2dq_avx512f(auVar354);
        auVar354 = vpaddd_avx512f(auVar354,(undefined1  [64])_pi32_512_1);
        auVar354 = vpandq_avx512f(auVar354,(undefined1  [64])_pi32_512_inv1);
        auVar355 = vcvtdq2ps_avx512f(auVar354);
        auVar339 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_4);
        auVar342 = vpandq_avx512f(auVar354,auVar339);
        auVar342 = vpslld_avx512f(auVar342,0x1d);
        auVar343 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_2);
        uVar297 = vptestnmd_avx512f(auVar354,auVar343);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar355,(undefined1  [64])_ps512_minus_cephes_DP1);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar355,(undefined1  [64])_ps512_minus_cephes_DP2);
        auVar352 = vfmadd231ps_avx512f(auVar352,auVar355,(undefined1  [64])_ps512_minus_cephes_DP3);
        auVar354 = vpsubd_avx512f(auVar354,auVar343);
        auVar354 = vpandnq_avx512f(auVar354,auVar339);
        auVar354 = vpslld_avx512f(auVar354,0x1d);
        auVar355 = vmulps_avx512f(auVar352,auVar352);
        auVar339 = vfmadd132ps_avx512f(auVar355,(undefined1  [64])_ps512_coscof_p1,
                                       (undefined1  [64])_ps512_coscof_p0);
        auVar339 = vfmadd213ps_avx512f(auVar339,auVar355,(undefined1  [64])_ps512_coscof_p2);
        auVar343 = vmulps_avx512f(auVar355,auVar355);
        auVar339 = vfmadd213ps_avx512f(auVar343,auVar339,(undefined1  [64])::_ps512_1);
        auVar339 = vfmadd231ps_avx512f(auVar339,auVar355,auVar361);
        auVar343 = vfmadd132ps_avx512f(auVar355,(undefined1  [64])_ps512_sincof_p1,
                                       (undefined1  [64])_ps512_sincof_p0);
        auVar343 = vfmadd213ps_avx512f(auVar343,auVar355,(undefined1  [64])_ps512_sincof_p2);
        auVar355 = vmulps_avx512f(auVar343,auVar355);
        auVar355 = vfmadd213ps_avx512f(auVar355,auVar352,auVar352);
        auVar343 = vblendmps_avx512f(auVar339,auVar355);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar344._0_4_ = (uint)bVar1 * auVar343._0_4_ | (uint)!bVar1 * auVar352._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar344._4_4_ = (uint)bVar1 * auVar343._4_4_ | (uint)!bVar1 * auVar352._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar344._8_4_ = (uint)bVar1 * auVar343._8_4_ | (uint)!bVar1 * auVar352._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar344._12_4_ = (uint)bVar1 * auVar343._12_4_ | (uint)!bVar1 * auVar352._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar344._16_4_ = (uint)bVar1 * auVar343._16_4_ | (uint)!bVar1 * auVar352._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar344._20_4_ = (uint)bVar1 * auVar343._20_4_ | (uint)!bVar1 * auVar352._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar344._24_4_ = (uint)bVar1 * auVar343._24_4_ | (uint)!bVar1 * auVar352._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar344._28_4_ = (uint)bVar1 * auVar343._28_4_ | (uint)!bVar1 * auVar352._28_4_;
        bVar10 = (byte)(uVar297 >> 8);
        bVar1 = (bool)(bVar10 & 1);
        auVar344._32_4_ = (uint)bVar1 * auVar343._32_4_ | (uint)!bVar1 * auVar352._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar344._36_4_ = (uint)bVar1 * auVar343._36_4_ | (uint)!bVar1 * auVar352._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar344._40_4_ = (uint)bVar1 * auVar343._40_4_ | (uint)!bVar1 * auVar352._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar344._44_4_ = (uint)bVar1 * auVar343._44_4_ | (uint)!bVar1 * auVar352._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar344._48_4_ = (uint)bVar1 * auVar343._48_4_ | (uint)!bVar1 * auVar352._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar344._52_4_ = (uint)bVar1 * auVar343._52_4_ | (uint)!bVar1 * auVar352._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar344._56_4_ = (uint)bVar1 * auVar343._56_4_ | (uint)!bVar1 * auVar352._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar344._60_4_ = (uint)bVar1 * auVar343._60_4_ | (uint)!bVar1 * auVar352._60_4_;
        bVar1 = (bool)((byte)uVar297 & 1);
        in_ZMM3._0_4_ = (uint)bVar1 * auVar339._0_4_ | (uint)!bVar1 * auVar355._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        in_ZMM3._4_4_ = (uint)bVar1 * auVar339._4_4_ | (uint)!bVar1 * auVar355._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        in_ZMM3._8_4_ = (uint)bVar1 * auVar339._8_4_ | (uint)!bVar1 * auVar355._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        in_ZMM3._12_4_ = (uint)bVar1 * auVar339._12_4_ | (uint)!bVar1 * auVar355._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        in_ZMM3._16_4_ = (uint)bVar1 * auVar339._16_4_ | (uint)!bVar1 * auVar355._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        in_ZMM3._20_4_ = (uint)bVar1 * auVar339._20_4_ | (uint)!bVar1 * auVar355._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        in_ZMM3._24_4_ = (uint)bVar1 * auVar339._24_4_ | (uint)!bVar1 * auVar355._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        in_ZMM3._28_4_ = (uint)bVar1 * auVar339._28_4_ | (uint)!bVar1 * auVar355._28_4_;
        bVar1 = (bool)(bVar10 & 1);
        in_ZMM3._32_4_ = (uint)bVar1 * auVar339._32_4_ | (uint)!bVar1 * auVar355._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        in_ZMM3._36_4_ = (uint)bVar1 * auVar339._36_4_ | (uint)!bVar1 * auVar355._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        in_ZMM3._40_4_ = (uint)bVar1 * auVar339._40_4_ | (uint)!bVar1 * auVar355._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        in_ZMM3._44_4_ = (uint)bVar1 * auVar339._44_4_ | (uint)!bVar1 * auVar355._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        in_ZMM3._48_4_ = (uint)bVar1 * auVar339._48_4_ | (uint)!bVar1 * auVar355._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        in_ZMM3._52_4_ = (uint)bVar1 * auVar339._52_4_ | (uint)!bVar1 * auVar355._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        in_ZMM3._56_4_ = (uint)bVar1 * auVar339._56_4_ | (uint)!bVar1 * auVar355._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        in_ZMM3._60_4_ = (uint)bVar1 * auVar339._60_4_ | (uint)!bVar1 * auVar355._60_4_;
        auVar352 = vpxord_avx512f(auVar354,in_ZMM3);
        uVar297 = vcmpps_avx512f(auVar352,_DAT_0054e200,0);
        auVar354 = vbroadcastss_avx512f(ZEXT416(0x322bcc77));
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar345._0_4_ = (uint)bVar1 * auVar354._0_4_ | (uint)!bVar1 * auVar352._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar345._4_4_ = (uint)bVar1 * auVar354._4_4_ | (uint)!bVar1 * auVar352._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar345._8_4_ = (uint)bVar1 * auVar354._8_4_ | (uint)!bVar1 * auVar352._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar345._12_4_ = (uint)bVar1 * auVar354._12_4_ | (uint)!bVar1 * auVar352._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar345._16_4_ = (uint)bVar1 * auVar354._16_4_ | (uint)!bVar1 * auVar352._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar345._20_4_ = (uint)bVar1 * auVar354._20_4_ | (uint)!bVar1 * auVar352._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar345._24_4_ = (uint)bVar1 * auVar354._24_4_ | (uint)!bVar1 * auVar352._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar345._28_4_ = (uint)bVar1 * auVar354._28_4_ | (uint)!bVar1 * auVar352._28_4_;
        bVar1 = (bool)((byte)(uVar297 >> 8) & 1);
        auVar345._32_4_ = (uint)bVar1 * auVar354._32_4_ | (uint)!bVar1 * auVar352._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar345._36_4_ = (uint)bVar1 * auVar354._36_4_ | (uint)!bVar1 * auVar352._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar345._40_4_ = (uint)bVar1 * auVar354._40_4_ | (uint)!bVar1 * auVar352._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar345._44_4_ = (uint)bVar1 * auVar354._44_4_ | (uint)!bVar1 * auVar352._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar345._48_4_ = (uint)bVar1 * auVar354._48_4_ | (uint)!bVar1 * auVar352._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar345._52_4_ = (uint)bVar1 * auVar354._52_4_ | (uint)!bVar1 * auVar352._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar345._56_4_ = (uint)bVar1 * auVar354._56_4_ | (uint)!bVar1 * auVar352._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar345._60_4_ = (uint)bVar1 * auVar354._60_4_ | (uint)!bVar1 * auVar352._60_4_;
        auVar352 = vpternlogd_avx512f(auVar344,auVar342,auVar353,0x96);
        auVar346 = vdivps_avx512f(auVar352,auVar345);
        *pauVar295 = auVar346;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar175._8_4_ = 0x7fffffff;
        auVar175._0_8_ = 0x7fffffff7fffffff;
        auVar175._12_4_ = 0x7fffffff;
        auVar175._16_4_ = 0x7fffffff;
        auVar175._20_4_ = 0x7fffffff;
        auVar175._24_4_ = 0x7fffffff;
        auVar175._28_4_ = 0x7fffffff;
        vandps_avx512vl(*(undefined1 (*) [32])*pauVar295,auVar175);
        auVar176._8_4_ = 0x3fa2f983;
        auVar176._0_8_ = 0x3fa2f9833fa2f983;
        auVar176._12_4_ = 0x3fa2f983;
        auVar176._16_4_ = 0x3fa2f983;
        auVar176._20_4_ = 0x3fa2f983;
        auVar176._24_4_ = 0x3fa2f983;
        auVar176._28_4_ = 0x3fa2f983;
        auVar329 = vmulps_avx512vl(auVar346._0_32_,auVar176);
        auVar423._0_4_ = (int)auVar329._0_4_;
        auVar423._4_4_ = (int)auVar329._4_4_;
        auVar423._8_4_ = (int)auVar329._8_4_;
        auVar423._12_4_ = (int)auVar329._12_4_;
        auVar423._16_4_ = (int)auVar329._16_4_;
        auVar423._20_4_ = (int)auVar329._20_4_;
        auVar423._24_4_ = (int)auVar329._24_4_;
        auVar423._28_4_ = (int)auVar329._28_4_;
        auVar329 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
        auVar330 = vpsubd_avx2(auVar423,auVar329);
        auVar177._8_4_ = 0xfffffffe;
        auVar177._0_8_ = 0xfffffffefffffffe;
        auVar177._12_4_ = 0xfffffffe;
        auVar177._16_4_ = 0xfffffffe;
        auVar177._20_4_ = 0xfffffffe;
        auVar177._24_4_ = 0xfffffffe;
        auVar177._28_4_ = 0xfffffffe;
        auVar329 = vpandd_avx512vl(auVar330,auVar177);
        auVar329 = vcvtdq2ps_avx(auVar329);
        auVar492 = vpslld_avx2(auVar330,0x1d);
        auVar178._8_4_ = 2;
        auVar178._0_8_ = 0x200000002;
        auVar178._12_4_ = 2;
        auVar178._16_4_ = 2;
        auVar178._20_4_ = 2;
        auVar178._24_4_ = 2;
        auVar178._28_4_ = 2;
        uVar297 = vptestnmd_avx512vl(auVar330,auVar178);
        auVar179._8_4_ = 0xbf490000;
        auVar179._0_8_ = 0xbf490000bf490000;
        auVar179._12_4_ = 0xbf490000;
        auVar179._16_4_ = 0xbf490000;
        auVar179._20_4_ = 0xbf490000;
        auVar179._24_4_ = 0xbf490000;
        auVar179._28_4_ = 0xbf490000;
        auVar399 = vfmadd231ps_avx512vl(auVar346._0_32_,auVar329,auVar179);
        auVar180._8_4_ = 0xb97da000;
        auVar180._0_8_ = 0xb97da000b97da000;
        auVar180._12_4_ = 0xb97da000;
        auVar180._16_4_ = 0xb97da000;
        auVar180._20_4_ = 0xb97da000;
        auVar180._24_4_ = 0xb97da000;
        auVar180._28_4_ = 0xb97da000;
        auVar399 = vfmadd231ps_avx512vl(auVar399,auVar329,auVar180);
        auVar181._8_4_ = 0xb3222169;
        auVar181._0_8_ = 0xb3222169b3222169;
        auVar181._12_4_ = 0xb3222169;
        auVar181._16_4_ = 0xb3222169;
        auVar181._20_4_ = 0xb3222169;
        auVar181._24_4_ = 0xb3222169;
        auVar181._28_4_ = 0xb3222169;
        auVar329 = vfmadd231ps_avx512vl(auVar399,auVar329,auVar181);
        auVar399 = vpslld_avx2(auVar423,0x1d);
        auVar182._8_4_ = 0xe0000000;
        auVar182._0_8_ = 0xe0000000e0000000;
        auVar182._12_4_ = 0xe0000000;
        auVar182._16_4_ = 0xe0000000;
        auVar182._20_4_ = 0xe0000000;
        auVar182._24_4_ = 0xe0000000;
        auVar182._28_4_ = 0xe0000000;
        auVar399 = vpaddd_avx512vl(auVar399,auVar182);
        fVar368 = auVar329._0_4_;
        fVar385 = fVar368 * fVar368;
        fVar362 = auVar329._4_4_;
        fVar402 = fVar362 * fVar362;
        auVar273._4_4_ = fVar402;
        auVar273._0_4_ = fVar385;
        fVar363 = auVar329._8_4_;
        fVar403 = fVar363 * fVar363;
        auVar273._8_4_ = fVar403;
        fVar364 = auVar329._12_4_;
        fVar404 = fVar364 * fVar364;
        auVar273._12_4_ = fVar404;
        fVar365 = auVar329._16_4_;
        fVar405 = fVar365 * fVar365;
        auVar273._16_4_ = fVar405;
        fVar366 = auVar329._20_4_;
        fVar406 = fVar366 * fVar366;
        auVar273._20_4_ = fVar406;
        fVar367 = auVar329._24_4_;
        fVar407 = fVar367 * fVar367;
        auVar273._24_4_ = fVar407;
        auVar273._28_4_ = auVar330._28_4_;
        auVar476._8_4_ = 0x37ccf5ce;
        auVar476._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar476._12_4_ = 0x37ccf5ce;
        auVar476._16_4_ = 0x37ccf5ce;
        auVar476._20_4_ = 0x37ccf5ce;
        auVar476._24_4_ = 0x37ccf5ce;
        auVar476._28_4_ = 0x37ccf5ce;
        auVar183._8_4_ = 0xbab6061a;
        auVar183._0_8_ = 0xbab6061abab6061a;
        auVar183._12_4_ = 0xbab6061a;
        auVar183._16_4_ = 0xbab6061a;
        auVar183._20_4_ = 0xbab6061a;
        auVar183._24_4_ = 0xbab6061a;
        auVar183._28_4_ = 0xbab6061a;
        auVar318 = vfmadd213ps_avx512vl(auVar476,auVar273,auVar183);
        auVar184._8_4_ = 0x3d2aaaa5;
        auVar184._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar184._12_4_ = 0x3d2aaaa5;
        auVar184._16_4_ = 0x3d2aaaa5;
        auVar184._20_4_ = 0x3d2aaaa5;
        auVar184._24_4_ = 0x3d2aaaa5;
        auVar184._28_4_ = 0x3d2aaaa5;
        auVar318 = vfmadd213ps_avx512vl(auVar318,auVar273,auVar184);
        auVar274._4_4_ = fVar402 * fVar402 * auVar318._4_4_;
        auVar274._0_4_ = fVar385 * fVar385 * auVar318._0_4_;
        auVar274._8_4_ = fVar403 * fVar403 * auVar318._8_4_;
        auVar274._12_4_ = fVar404 * fVar404 * auVar318._12_4_;
        auVar274._16_4_ = fVar405 * fVar405 * auVar318._16_4_;
        auVar274._20_4_ = fVar406 * fVar406 * auVar318._20_4_;
        auVar274._24_4_ = fVar407 * fVar407 * auVar318._24_4_;
        auVar274._28_4_ = auVar318._28_4_;
        auVar185._8_4_ = 0x3f000000;
        auVar185._0_8_ = 0x3f0000003f000000;
        auVar185._12_4_ = 0x3f000000;
        auVar185._16_4_ = 0x3f000000;
        auVar185._20_4_ = 0x3f000000;
        auVar185._24_4_ = 0x3f000000;
        auVar185._28_4_ = 0x3f000000;
        auVar318 = vfnmadd231ps_avx512vl(auVar274,auVar273,auVar185);
        auVar186._8_4_ = 0x3f800000;
        auVar186._0_8_ = 0x3f8000003f800000;
        auVar186._12_4_ = 0x3f800000;
        auVar186._16_4_ = 0x3f800000;
        auVar186._20_4_ = 0x3f800000;
        auVar186._24_4_ = 0x3f800000;
        auVar186._28_4_ = 0x3f800000;
        auVar318 = vaddps_avx512vl(auVar318,auVar186);
        auVar493._8_4_ = 0xb94ca1f9;
        auVar493._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar493._12_4_ = 0xb94ca1f9;
        auVar493._16_4_ = 0xb94ca1f9;
        auVar493._20_4_ = 0xb94ca1f9;
        auVar493._24_4_ = 0xb94ca1f9;
        auVar493._28_4_ = 0xb94ca1f9;
        auVar187._8_4_ = 0x3c08839e;
        auVar187._0_8_ = 0x3c08839e3c08839e;
        auVar187._12_4_ = 0x3c08839e;
        auVar187._16_4_ = 0x3c08839e;
        auVar187._20_4_ = 0x3c08839e;
        auVar187._24_4_ = 0x3c08839e;
        auVar187._28_4_ = 0x3c08839e;
        auVar322 = vfmadd213ps_avx512vl(auVar493,auVar273,auVar187);
        auVar188._8_4_ = 0xbe2aaaa3;
        auVar188._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar188._12_4_ = 0xbe2aaaa3;
        auVar188._16_4_ = 0xbe2aaaa3;
        auVar188._20_4_ = 0xbe2aaaa3;
        auVar188._24_4_ = 0xbe2aaaa3;
        auVar188._28_4_ = 0xbe2aaaa3;
        auVar322 = vfmadd213ps_avx512vl(auVar322,auVar273,auVar188);
        auVar275._4_4_ = auVar322._4_4_ * fVar402;
        auVar275._0_4_ = auVar322._0_4_ * fVar385;
        auVar275._8_4_ = auVar322._8_4_ * fVar403;
        auVar275._12_4_ = auVar322._12_4_ * fVar404;
        auVar275._16_4_ = auVar322._16_4_ * fVar405;
        auVar275._20_4_ = auVar322._20_4_ * fVar406;
        auVar275._24_4_ = auVar322._24_4_ * fVar407;
        auVar275._28_4_ = auVar330._28_4_;
        auVar307 = vfmadd213ps_fma(auVar275,auVar329,auVar329);
        auVar330 = vblendmps_avx512vl(auVar318,ZEXT1632(auVar307));
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar323._0_4_ = (uint)bVar1 * auVar330._0_4_ | (uint)!bVar1 * (int)fVar368;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar323._4_4_ = (uint)bVar1 * auVar330._4_4_ | (uint)!bVar1 * (int)fVar362;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar323._8_4_ = (uint)bVar1 * auVar330._8_4_ | (uint)!bVar1 * (int)fVar363;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar323._12_4_ = (uint)bVar1 * auVar330._12_4_ | (uint)!bVar1 * (int)fVar364;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar323._16_4_ = (uint)bVar1 * auVar330._16_4_ | (uint)!bVar1 * (int)fVar365;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar323._20_4_ = (uint)bVar1 * auVar330._20_4_ | (uint)!bVar1 * (int)fVar366;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar323._24_4_ = (uint)bVar1 * auVar330._24_4_ | (uint)!bVar1 * (int)fVar367;
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar323._28_4_ = (uint)bVar1 * auVar330._28_4_ | (uint)!bVar1 * auVar329._28_4_;
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar324._0_4_ = (uint)bVar1 * auVar318._0_4_ | (uint)!bVar1 * auVar307._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar324._4_4_ = (uint)bVar1 * auVar318._4_4_ | (uint)!bVar1 * auVar307._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar324._8_4_ = (uint)bVar1 * auVar318._8_4_ | (uint)!bVar1 * auVar307._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar324._12_4_ = (uint)bVar1 * auVar318._12_4_ | (uint)!bVar1 * auVar307._12_4_;
        auVar324._16_4_ = (uint)((byte)(uVar297 >> 4) & 1) * auVar318._16_4_;
        auVar324._20_4_ = (uint)((byte)(uVar297 >> 5) & 1) * auVar318._20_4_;
        auVar324._24_4_ = (uint)((byte)(uVar297 >> 6) & 1) * auVar318._24_4_;
        auVar324._28_4_ = (uint)(byte)(uVar297 >> 7) * auVar318._28_4_;
        in_ZMM3 = ZEXT3264(auVar324);
        auVar477._8_4_ = 0x80000000;
        auVar477._0_8_ = 0x8000000080000000;
        auVar477._12_4_ = 0x80000000;
        auVar477._16_4_ = 0x80000000;
        auVar477._20_4_ = 0x80000000;
        auVar477._24_4_ = 0x80000000;
        auVar477._28_4_ = 0x80000000;
        auVar330 = vpternlogd_avx512vl(auVar323,auVar492 ^ *(undefined1 (*) [32])*pauVar295,auVar477
                                       ,0x78);
        auVar329 = vpand_avx2(auVar399,auVar477);
        auVar329 = vpternlogd_avx512vl(auVar329,auVar477,auVar324,0x96);
        uVar297 = vcmpps_avx512vl(auVar329,_DAT_00548840,0);
        auVar189._8_4_ = 0x322bcc77;
        auVar189._0_8_ = 0x322bcc77322bcc77;
        auVar189._12_4_ = 0x322bcc77;
        auVar189._16_4_ = 0x322bcc77;
        auVar189._20_4_ = 0x322bcc77;
        auVar189._24_4_ = 0x322bcc77;
        auVar189._28_4_ = 0x322bcc77;
        auVar399 = vaddps_avx512vl(auVar329,auVar189);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar325._0_4_ = (uint)bVar1 * auVar399._0_4_ | (uint)!bVar1 * auVar329._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar325._4_4_ = (uint)bVar1 * auVar399._4_4_ | (uint)!bVar1 * auVar329._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar325._8_4_ = (uint)bVar1 * auVar399._8_4_ | (uint)!bVar1 * auVar329._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar325._12_4_ = (uint)bVar1 * auVar399._12_4_ | (uint)!bVar1 * auVar329._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar325._16_4_ = (uint)bVar1 * auVar399._16_4_ | (uint)!bVar1 * auVar329._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar325._20_4_ = (uint)bVar1 * auVar399._20_4_ | (uint)!bVar1 * auVar329._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar325._24_4_ = (uint)bVar1 * auVar399._24_4_ | (uint)!bVar1 * auVar329._24_4_;
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar325._28_4_ = (uint)bVar1 * auVar399._28_4_ | (uint)!bVar1 * auVar329._28_4_;
        auVar346._0_32_ = auVar325;
        auVar329 = vdivps_avx(auVar330,auVar325);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar66._8_4_ = 0x7fffffff;
        auVar66._0_8_ = 0x7fffffff7fffffff;
        auVar66._12_4_ = 0x7fffffff;
        auVar392 = vandps_avx512vl(*(undefined1 (*) [16])*pauVar295,auVar66);
        auVar67._8_4_ = 0x3fa2f983;
        auVar67._0_8_ = 0x3fa2f9833fa2f983;
        auVar67._12_4_ = 0x3fa2f983;
        auVar307 = vmulps_avx512vl(auVar392,auVar67);
        auVar410._0_4_ = (int)auVar307._0_4_;
        auVar410._4_4_ = (int)auVar307._4_4_;
        auVar410._8_4_ = (int)auVar307._8_4_;
        auVar410._12_4_ = (int)auVar307._12_4_;
        auVar307 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
        auVar308 = vpsubd_avx(auVar410,auVar307);
        auVar68._8_4_ = 0xfffffffe;
        auVar68._0_8_ = 0xfffffffefffffffe;
        auVar68._12_4_ = 0xfffffffe;
        auVar307 = vpandd_avx512vl(auVar308,auVar68);
        auVar307 = vcvtdq2ps_avx(auVar307);
        auVar486 = vpslld_avx(auVar308,0x1d);
        auVar69._8_4_ = 2;
        auVar69._0_8_ = 0x200000002;
        auVar69._12_4_ = 2;
        uVar297 = vptestnmd_avx512vl(auVar308,auVar69);
        uVar297 = uVar297 & 0xf;
        auVar70._8_4_ = 0xbf490000;
        auVar70._0_8_ = 0xbf490000bf490000;
        auVar70._12_4_ = 0xbf490000;
        auVar308 = vfmadd231ps_avx512vl(auVar392,auVar307,auVar70);
        auVar71._8_4_ = 0xb97da000;
        auVar71._0_8_ = 0xb97da000b97da000;
        auVar71._12_4_ = 0xb97da000;
        auVar308 = vfmadd231ps_avx512vl(auVar308,auVar307,auVar71);
        auVar72._8_4_ = 0xb3222169;
        auVar72._0_8_ = 0xb3222169b3222169;
        auVar72._12_4_ = 0xb3222169;
        auVar307 = vfmadd231ps_avx512vl(auVar308,auVar307,auVar72);
        auVar308 = vpslld_avx(auVar410,0x1d);
        auVar73._8_4_ = 0xe0000000;
        auVar73._0_8_ = 0xe0000000e0000000;
        auVar73._12_4_ = 0xe0000000;
        auVar308 = vpaddd_avx512vl(auVar308,auVar73);
        fVar368 = auVar307._0_4_;
        auVar433._0_4_ = fVar368 * fVar368;
        fVar362 = auVar307._4_4_;
        auVar433._4_4_ = fVar362 * fVar362;
        fVar363 = auVar307._8_4_;
        auVar433._8_4_ = fVar363 * fVar363;
        fVar364 = auVar307._12_4_;
        auVar433._12_4_ = fVar364 * fVar364;
        auVar465._8_4_ = 0x37ccf5ce;
        auVar465._0_8_ = 0x37ccf5ce37ccf5ce;
        auVar465._12_4_ = 0x37ccf5ce;
        auVar74._8_4_ = 0xbab6061a;
        auVar74._0_8_ = 0xbab6061abab6061a;
        auVar74._12_4_ = 0xbab6061a;
        auVar392 = vfmadd213ps_avx512vl(auVar465,auVar433,auVar74);
        auVar75._8_4_ = 0x3d2aaaa5;
        auVar75._0_8_ = 0x3d2aaaa53d2aaaa5;
        auVar75._12_4_ = 0x3d2aaaa5;
        auVar392 = vfmadd213ps_avx512vl(auVar392,auVar433,auVar75);
        auVar466._0_4_ = auVar433._0_4_ * auVar433._0_4_ * auVar392._0_4_;
        auVar466._4_4_ = auVar433._4_4_ * auVar433._4_4_ * auVar392._4_4_;
        auVar466._8_4_ = auVar433._8_4_ * auVar433._8_4_ * auVar392._8_4_;
        auVar466._12_4_ = auVar433._12_4_ * auVar433._12_4_ * auVar392._12_4_;
        auVar76._8_4_ = 0x3f000000;
        auVar76._0_8_ = 0x3f0000003f000000;
        auVar76._12_4_ = 0x3f000000;
        auVar392 = vfnmadd231ps_avx512vl(auVar466,auVar433,auVar76);
        auVar77._8_4_ = 0x3f800000;
        auVar77._0_8_ = 0x3f8000003f800000;
        auVar77._12_4_ = 0x3f800000;
        auVar392 = vaddps_avx512vl(auVar392,auVar77);
        auVar487._8_4_ = 0xb94ca1f9;
        auVar487._0_8_ = 0xb94ca1f9b94ca1f9;
        auVar487._12_4_ = 0xb94ca1f9;
        auVar78._8_4_ = 0x3c08839e;
        auVar78._0_8_ = 0x3c08839e3c08839e;
        auVar78._12_4_ = 0x3c08839e;
        auVar312 = vfmadd213ps_avx512vl(auVar487,auVar433,auVar78);
        auVar79._8_4_ = 0xbe2aaaa3;
        auVar79._0_8_ = 0xbe2aaaa3be2aaaa3;
        auVar79._12_4_ = 0xbe2aaaa3;
        auVar312 = vfmadd213ps_avx512vl(auVar312,auVar433,auVar79);
        auVar434._0_4_ = auVar312._0_4_ * auVar433._0_4_;
        auVar434._4_4_ = auVar312._4_4_ * auVar433._4_4_;
        auVar434._8_4_ = auVar312._8_4_ * auVar433._8_4_;
        auVar434._12_4_ = auVar312._12_4_ * auVar433._12_4_;
        auVar307 = vfmadd213ps_fma(auVar434,auVar307,auVar307);
        auVar312 = vblendmps_avx512vl(auVar392,auVar307);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar301._0_4_ = (uint)bVar1 * auVar312._0_4_ | (uint)!bVar1 * (int)fVar368;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar301._4_4_ = (uint)bVar1 * auVar312._4_4_ | (uint)!bVar1 * (int)fVar362;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar301._8_4_ = (uint)bVar1 * auVar312._8_4_ | (uint)!bVar1 * (int)fVar363;
        bVar1 = SUB81(uVar297 >> 3,0);
        auVar301._12_4_ = (uint)bVar1 * auVar312._12_4_ | (uint)!bVar1 * (int)fVar364;
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar302._0_4_ = (uint)bVar1 * auVar392._0_4_ | (uint)!bVar1 * auVar307._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar302._4_4_ = (uint)bVar1 * auVar392._4_4_ | (uint)!bVar1 * auVar307._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar302._8_4_ = (uint)bVar1 * auVar392._8_4_ | (uint)!bVar1 * auVar307._8_4_;
        bVar1 = SUB81(uVar297 >> 3,0);
        auVar302._12_4_ = (uint)bVar1 * auVar392._12_4_ | (uint)!bVar1 * auVar307._12_4_;
        in_ZMM3 = ZEXT1664(auVar302);
        auVar467._8_4_ = 0x80000000;
        auVar467._0_8_ = 0x8000000080000000;
        auVar467._12_4_ = 0x80000000;
        auVar392 = vpternlogd_avx512vl(auVar301,auVar486 ^ *(undefined1 (*) [16])*pauVar295,auVar467
                                       ,0x78);
        auVar307 = vpand_avx(auVar308,auVar467);
        auVar307 = vpternlogd_avx512vl(auVar307,auVar467,auVar302,0x96);
        uVar297 = vcmpps_avx512vl(auVar307,_DAT_00545cc0,0);
        auVar80._8_4_ = 0x322bcc77;
        auVar80._0_8_ = 0x322bcc77322bcc77;
        auVar80._12_4_ = 0x322bcc77;
        auVar308 = vaddps_avx512vl(auVar307,auVar80);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar303._0_4_ = (uint)bVar1 * auVar308._0_4_ | (uint)!bVar1 * auVar307._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar303._4_4_ = (uint)bVar1 * auVar308._4_4_ | (uint)!bVar1 * auVar307._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar303._8_4_ = (uint)bVar1 * auVar308._8_4_ | (uint)!bVar1 * auVar307._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar303._12_4_ = (uint)bVar1 * auVar308._12_4_ | (uint)!bVar1 * auVar307._12_4_;
        auVar346._0_16_ = auVar303;
        auVar307 = vdivps_avx(auVar392,auVar303);
        *(undefined1 (*) [16])*pauVar295 = auVar307;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        fVar368 = tanf(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 0xc:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar257._8_4_ = 0x7fffffff;
        auVar257._0_8_ = 0x7fffffff7fffffff;
        auVar257._12_4_ = 0x7fffffff;
        auVar257._16_4_ = 0x7fffffff;
        auVar257._20_4_ = 0x7fffffff;
        auVar257._24_4_ = 0x7fffffff;
        auVar257._28_4_ = 0x7fffffff;
        auVar257._32_4_ = 0x7fffffff;
        auVar257._36_4_ = 0x7fffffff;
        auVar257._40_4_ = 0x7fffffff;
        auVar257._44_4_ = 0x7fffffff;
        auVar257._48_4_ = 0x7fffffff;
        auVar257._52_4_ = 0x7fffffff;
        auVar257._56_4_ = 0x7fffffff;
        auVar257._60_4_ = 0x7fffffff;
        auVar361 = vandps_avx512dq(*pauVar295,auVar257);
        auVar352 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
        uVar297 = vcmpps_avx512f(auVar361,auVar352,2);
        uVar19 = vcmpps_avx512f(auVar352,auVar361,1);
        auVar352 = vfnmadd213ps_avx512f(auVar352,auVar361,auVar352);
        auVar352 = vsqrtps_avx512f(auVar352);
        auVar353 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar347._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar353._4_4_;
        auVar347._0_4_ = (uint)((byte)uVar19 & 1) * auVar353._0_4_;
        auVar347._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar353._8_4_;
        auVar347._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar353._12_4_;
        auVar347._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar353._16_4_;
        auVar347._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar353._20_4_;
        auVar347._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar353._24_4_;
        auVar347._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar353._28_4_;
        auVar347._32_4_ = (uint)((byte)(uVar19 >> 8) & 1) * auVar353._32_4_;
        auVar347._36_4_ = (uint)((byte)(uVar19 >> 9) & 1) * auVar353._36_4_;
        auVar347._40_4_ = (uint)((byte)(uVar19 >> 10) & 1) * auVar353._40_4_;
        auVar347._44_4_ = (uint)((byte)(uVar19 >> 0xb) & 1) * auVar353._44_4_;
        auVar347._48_4_ = (uint)((byte)(uVar19 >> 0xc) & 1) * auVar353._48_4_;
        auVar347._52_4_ = (uint)((byte)(uVar19 >> 0xd) & 1) * auVar353._52_4_;
        auVar347._56_4_ = (uint)((byte)(uVar19 >> 0xe) & 1) * auVar353._56_4_;
        auVar347._60_4_ = (uint)(byte)(uVar19 >> 0xf) * auVar353._60_4_;
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar348._0_4_ = (uint)bVar1 * auVar361._0_4_ | (uint)!bVar1 * auVar352._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar348._4_4_ = (uint)bVar1 * auVar361._4_4_ | (uint)!bVar1 * auVar352._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar348._8_4_ = (uint)bVar1 * auVar361._8_4_ | (uint)!bVar1 * auVar352._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar348._12_4_ = (uint)bVar1 * auVar361._12_4_ | (uint)!bVar1 * auVar352._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar348._16_4_ = (uint)bVar1 * auVar361._16_4_ | (uint)!bVar1 * auVar352._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar348._20_4_ = (uint)bVar1 * auVar361._20_4_ | (uint)!bVar1 * auVar352._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar348._24_4_ = (uint)bVar1 * auVar361._24_4_ | (uint)!bVar1 * auVar352._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar348._28_4_ = (uint)bVar1 * auVar361._28_4_ | (uint)!bVar1 * auVar352._28_4_;
        bVar1 = (bool)((byte)(uVar297 >> 8) & 1);
        auVar348._32_4_ = (uint)bVar1 * auVar361._32_4_ | (uint)!bVar1 * auVar352._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar348._36_4_ = (uint)bVar1 * auVar361._36_4_ | (uint)!bVar1 * auVar352._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar348._40_4_ = (uint)bVar1 * auVar361._40_4_ | (uint)!bVar1 * auVar352._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar348._44_4_ = (uint)bVar1 * auVar361._44_4_ | (uint)!bVar1 * auVar352._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar348._48_4_ = (uint)bVar1 * auVar361._48_4_ | (uint)!bVar1 * auVar352._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar348._52_4_ = (uint)bVar1 * auVar361._52_4_ | (uint)!bVar1 * auVar352._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar348._56_4_ = (uint)bVar1 * auVar361._56_4_ | (uint)!bVar1 * auVar352._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar348._60_4_ = (uint)bVar1 * auVar361._60_4_ | (uint)!bVar1 * auVar352._60_4_;
        auVar361 = vmulps_avx512f(auVar348,auVar348);
        in_ZMM4 = vmulps_avx512f(auVar361,auVar361);
        auVar352 = vbroadcastss_avx512f(ZEXT416(0x3d2dbdcf));
        auVar258._8_4_ = 0x3d3a73d8;
        auVar258._0_8_ = 0x3d3a73d83d3a73d8;
        auVar258._12_4_ = 0x3d3a73d8;
        auVar258._16_4_ = 0x3d3a73d8;
        auVar258._20_4_ = 0x3d3a73d8;
        auVar258._24_4_ = 0x3d3a73d8;
        auVar258._28_4_ = 0x3d3a73d8;
        auVar258._32_4_ = 0x3d3a73d8;
        auVar258._36_4_ = 0x3d3a73d8;
        auVar258._40_4_ = 0x3d3a73d8;
        auVar258._44_4_ = 0x3d3a73d8;
        auVar258._48_4_ = 0x3d3a73d8;
        auVar258._52_4_ = 0x3d3a73d8;
        auVar258._56_4_ = 0x3d3a73d8;
        auVar258._60_4_ = 0x3d3a73d8;
        auVar352 = vfmadd213ps_avx512f(auVar352,in_ZMM4,auVar258);
        auVar259._8_4_ = 0x3e2aaaf8;
        auVar259._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar259._12_4_ = 0x3e2aaaf8;
        auVar259._16_4_ = 0x3e2aaaf8;
        auVar259._20_4_ = 0x3e2aaaf8;
        auVar259._24_4_ = 0x3e2aaaf8;
        auVar259._28_4_ = 0x3e2aaaf8;
        auVar259._32_4_ = 0x3e2aaaf8;
        auVar259._36_4_ = 0x3e2aaaf8;
        auVar259._40_4_ = 0x3e2aaaf8;
        auVar259._44_4_ = 0x3e2aaaf8;
        auVar259._48_4_ = 0x3e2aaaf8;
        auVar259._52_4_ = 0x3e2aaaf8;
        auVar259._56_4_ = 0x3e2aaaf8;
        auVar259._60_4_ = 0x3e2aaaf8;
        auVar352 = vfmadd213ps_avx512f(auVar352,in_ZMM4,auVar259);
        auVar354 = vbroadcastss_avx512f(ZEXT416(0x3cc48f19));
        auVar260._8_4_ = 0x3d997dcc;
        auVar260._0_8_ = 0x3d997dcc3d997dcc;
        auVar260._12_4_ = 0x3d997dcc;
        auVar260._16_4_ = 0x3d997dcc;
        auVar260._20_4_ = 0x3d997dcc;
        auVar260._24_4_ = 0x3d997dcc;
        auVar260._28_4_ = 0x3d997dcc;
        auVar260._32_4_ = 0x3d997dcc;
        auVar260._36_4_ = 0x3d997dcc;
        auVar260._40_4_ = 0x3d997dcc;
        auVar260._44_4_ = 0x3d997dcc;
        auVar260._48_4_ = 0x3d997dcc;
        auVar260._52_4_ = 0x3d997dcc;
        auVar260._56_4_ = 0x3d997dcc;
        auVar260._60_4_ = 0x3d997dcc;
        auVar354 = vfmadd213ps_avx512f(auVar354,in_ZMM4,auVar260);
        auVar354 = vfmadd213ps_avx512f(auVar354,in_ZMM4,auVar353);
        auVar361 = vfnmsub231ps_avx512f(auVar354,auVar361,auVar352);
        auVar361 = vmulps_avx512f(auVar361,auVar348);
        auVar261._8_4_ = 0x40400000;
        auVar261._0_8_ = 0x4040000040400000;
        auVar261._12_4_ = 0x40400000;
        auVar261._16_4_ = 0x40400000;
        auVar261._20_4_ = 0x40400000;
        auVar261._24_4_ = 0x40400000;
        auVar261._28_4_ = 0x40400000;
        auVar261._32_4_ = 0x40400000;
        auVar261._36_4_ = 0x40400000;
        auVar261._40_4_ = 0x40400000;
        auVar261._44_4_ = 0x40400000;
        auVar261._48_4_ = 0x40400000;
        auVar261._52_4_ = 0x40400000;
        auVar261._56_4_ = 0x40400000;
        auVar261._60_4_ = 0x40400000;
        auVar352 = vfmsub231ps_avx512f(auVar353,auVar347,auVar261);
        auVar262._8_4_ = 0x3fc90fdb;
        auVar262._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar262._12_4_ = 0x3fc90fdb;
        auVar262._16_4_ = 0x3fc90fdb;
        auVar262._20_4_ = 0x3fc90fdb;
        auVar262._24_4_ = 0x3fc90fdb;
        auVar262._28_4_ = 0x3fc90fdb;
        auVar262._32_4_ = 0x3fc90fdb;
        auVar262._36_4_ = 0x3fc90fdb;
        auVar262._40_4_ = 0x3fc90fdb;
        auVar262._44_4_ = 0x3fc90fdb;
        auVar262._48_4_ = 0x3fc90fdb;
        auVar262._52_4_ = 0x3fc90fdb;
        auVar262._56_4_ = 0x3fc90fdb;
        auVar262._60_4_ = 0x3fc90fdb;
        auVar353 = vmulps_avx512f(auVar347,auVar262);
        auVar361 = vfmadd231ps_avx512f(auVar353,auVar361,auVar352);
        auVar263._8_4_ = 0x80000000;
        auVar263._0_8_ = 0x8000000080000000;
        auVar263._12_4_ = 0x80000000;
        auVar263._16_4_ = 0x80000000;
        auVar263._20_4_ = 0x80000000;
        auVar263._24_4_ = 0x80000000;
        auVar263._28_4_ = 0x80000000;
        auVar263._32_4_ = 0x80000000;
        auVar263._36_4_ = 0x80000000;
        auVar263._40_4_ = 0x80000000;
        auVar263._44_4_ = 0x80000000;
        auVar263._48_4_ = 0x80000000;
        auVar263._52_4_ = 0x80000000;
        auVar263._56_4_ = 0x80000000;
        auVar263._60_4_ = 0x80000000;
        in_ZmmResult = vpternlogd_avx512f(auVar361,*pauVar295,auVar263,0xf8);
        auVar361 = vmovdqu64_avx512f(in_ZmmResult);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
        in_ZMM3 = in_ZmmResult;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar168._8_4_ = 0x7fffffff;
        auVar168._0_8_ = 0x7fffffff7fffffff;
        auVar168._12_4_ = 0x7fffffff;
        auVar168._16_4_ = 0x7fffffff;
        auVar168._20_4_ = 0x7fffffff;
        auVar168._24_4_ = 0x7fffffff;
        auVar168._28_4_ = 0x7fffffff;
        vandps_avx512vl(*(undefined1 (*) [32])*pauVar295,auVar168);
        auVar424._8_4_ = 0x3f000000;
        auVar424._0_8_ = 0x3f0000003f000000;
        auVar424._12_4_ = 0x3f000000;
        auVar424._16_4_ = 0x3f000000;
        auVar424._20_4_ = 0x3f000000;
        auVar424._24_4_ = 0x3f000000;
        auVar424._28_4_ = 0x3f000000;
        uVar297 = vcmpps_avx512vl(auVar424,in_ZmmResult._0_32_,1);
        auVar307 = vfnmadd213ps_fma(auVar424,in_ZmmResult._0_32_,auVar424);
        auVar329 = vsqrtps_avx512vl(ZEXT1632(auVar307));
        bVar1 = (bool)((byte)uVar297 & 1);
        fVar368 = (float)((uint)bVar1 * auVar329._0_4_ | (uint)!bVar1 * in_ZmmResult._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        fVar362 = (float)((uint)bVar1 * auVar329._4_4_ | (uint)!bVar1 * in_ZmmResult._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        fVar363 = (float)((uint)bVar1 * auVar329._8_4_ | (uint)!bVar1 * in_ZmmResult._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        fVar364 = (float)((uint)bVar1 * auVar329._12_4_ | (uint)!bVar1 * in_ZmmResult._12_4_);
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        fVar365 = (float)((uint)bVar1 * auVar329._16_4_ | (uint)!bVar1 * in_ZmmResult._16_4_);
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        fVar366 = (float)((uint)bVar1 * auVar329._20_4_ | (uint)!bVar1 * in_ZmmResult._20_4_);
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        fVar367 = (float)((uint)bVar1 * auVar329._24_4_ | (uint)!bVar1 * in_ZmmResult._24_4_);
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar504._8_4_ = 0x3f800000;
        auVar504._0_8_ = 0x3f8000003f800000;
        auVar504._12_4_ = 0x3f800000;
        auVar504._16_4_ = 0x3f800000;
        auVar504._20_4_ = 0x3f800000;
        auVar504._24_4_ = 0x3f800000;
        auVar504._28_4_ = 0x3f800000;
        auVar326._4_4_ = (uint)((byte)(uVar297 >> 1) & 1) * 0x3f800000;
        auVar326._0_4_ = (uint)((byte)uVar297 & 1) * 0x3f800000;
        auVar326._8_4_ = (uint)((byte)(uVar297 >> 2) & 1) * 0x3f800000;
        auVar326._12_4_ = (uint)((byte)(uVar297 >> 3) & 1) * 0x3f800000;
        auVar326._16_4_ = (uint)((byte)(uVar297 >> 4) & 1) * 0x3f800000;
        auVar326._20_4_ = (uint)((byte)(uVar297 >> 5) & 1) * 0x3f800000;
        auVar326._24_4_ = (uint)((byte)(uVar297 >> 6) & 1) * 0x3f800000;
        auVar326._28_4_ = (uint)(byte)(uVar297 >> 7) * 0x3f800000;
        auVar462._0_4_ = fVar368 * fVar368;
        auVar462._4_4_ = fVar362 * fVar362;
        auVar462._8_4_ = fVar363 * fVar363;
        auVar462._12_4_ = fVar364 * fVar364;
        auVar462._16_4_ = fVar365 * fVar365;
        auVar462._20_4_ = fVar366 * fVar366;
        auVar462._28_36_ = in_ZMM3._28_36_;
        auVar462._24_4_ = fVar367 * fVar367;
        auVar482._0_4_ = auVar462._0_4_ * auVar462._0_4_;
        auVar482._4_4_ = auVar462._4_4_ * auVar462._4_4_;
        auVar482._8_4_ = auVar462._8_4_ * auVar462._8_4_;
        auVar482._12_4_ = auVar462._12_4_ * auVar462._12_4_;
        auVar482._16_4_ = auVar462._16_4_ * auVar462._16_4_;
        auVar482._20_4_ = auVar462._20_4_ * auVar462._20_4_;
        auVar482._28_36_ = in_ZMM4._28_36_;
        auVar482._24_4_ = auVar462._24_4_ * auVar462._24_4_;
        auVar318 = auVar482._0_32_;
        in_ZMM4 = ZEXT3264(auVar318);
        auVar494._8_4_ = 0x3d2dbdcf;
        auVar494._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar494._12_4_ = 0x3d2dbdcf;
        auVar494._16_4_ = 0x3d2dbdcf;
        auVar494._20_4_ = 0x3d2dbdcf;
        auVar494._24_4_ = 0x3d2dbdcf;
        auVar494._28_4_ = 0x3d2dbdcf;
        auVar169._8_4_ = 0x3d3a73d8;
        auVar169._0_8_ = 0x3d3a73d83d3a73d8;
        auVar169._12_4_ = 0x3d3a73d8;
        auVar169._16_4_ = 0x3d3a73d8;
        auVar169._20_4_ = 0x3d3a73d8;
        auVar169._24_4_ = 0x3d3a73d8;
        auVar169._28_4_ = 0x3d3a73d8;
        auVar330 = vfmadd213ps_avx512vl(auVar494,auVar318,auVar169);
        auVar170._8_4_ = 0x3e2aaaf8;
        auVar170._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar170._12_4_ = 0x3e2aaaf8;
        auVar170._16_4_ = 0x3e2aaaf8;
        auVar170._20_4_ = 0x3e2aaaf8;
        auVar170._24_4_ = 0x3e2aaaf8;
        auVar170._28_4_ = 0x3e2aaaf8;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar318,auVar170);
        auVar501._8_4_ = 0x3cc48f19;
        auVar501._0_8_ = 0x3cc48f193cc48f19;
        auVar501._12_4_ = 0x3cc48f19;
        auVar501._16_4_ = 0x3cc48f19;
        auVar501._20_4_ = 0x3cc48f19;
        auVar501._24_4_ = 0x3cc48f19;
        auVar501._28_4_ = 0x3cc48f19;
        auVar171._8_4_ = 0x3d997dcc;
        auVar171._0_8_ = 0x3d997dcc3d997dcc;
        auVar171._12_4_ = 0x3d997dcc;
        auVar171._16_4_ = 0x3d997dcc;
        auVar171._20_4_ = 0x3d997dcc;
        auVar171._24_4_ = 0x3d997dcc;
        auVar171._28_4_ = 0x3d997dcc;
        auVar399 = vfmadd213ps_avx512vl(auVar501,auVar318,auVar171);
        auVar307 = vfmadd213ps_fma(auVar399,auVar318,auVar504);
        auVar307 = vfmadd231ps_fma(ZEXT1632(auVar307),auVar462._0_32_,auVar330);
        auVar277._4_4_ = auVar307._4_4_ * fVar362;
        auVar277._0_4_ = auVar307._0_4_ * fVar368;
        auVar277._8_4_ = auVar307._8_4_ * fVar363;
        auVar277._12_4_ = auVar307._12_4_ * fVar364;
        auVar277._16_4_ = fVar365 * 0.0;
        auVar277._20_4_ = fVar366 * 0.0;
        auVar277._24_4_ = fVar367 * 0.0;
        auVar277._28_4_ = (uint)bVar1 * auVar329._28_4_ | (uint)!bVar1 * in_ZmmResult._28_4_;
        auVar172._8_4_ = 0xc0400000;
        auVar172._0_8_ = 0xc0400000c0400000;
        auVar172._12_4_ = 0xc0400000;
        auVar172._16_4_ = 0xc0400000;
        auVar172._20_4_ = 0xc0400000;
        auVar172._24_4_ = 0xc0400000;
        auVar172._28_4_ = 0xc0400000;
        auVar329 = vfmadd231ps_avx512vl(auVar504,auVar326,auVar172);
        in_ZMM3 = ZEXT3264(auVar329);
        auVar173._8_4_ = 0x3fc90fdb;
        auVar173._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar173._12_4_ = 0x3fc90fdb;
        auVar173._16_4_ = 0x3fc90fdb;
        auVar173._20_4_ = 0x3fc90fdb;
        auVar173._24_4_ = 0x3fc90fdb;
        auVar173._28_4_ = 0x3fc90fdb;
        auVar330 = vmulps_avx512vl(auVar326,auVar173);
        auVar307 = vfmadd231ps_fma(auVar330,auVar277,auVar329);
        auVar174._8_4_ = 0x80000000;
        auVar174._0_8_ = 0x8000000080000000;
        auVar174._12_4_ = 0x80000000;
        auVar174._16_4_ = 0x80000000;
        auVar174._20_4_ = 0x80000000;
        auVar174._24_4_ = 0x80000000;
        auVar174._28_4_ = 0x80000000;
        in_ZmmResult._0_32_ =
             vpternlogd_avx512vl(ZEXT1632(auVar307),*(undefined1 (*) [32])*pauVar295,auVar174,0xf8);
        *(undefined1 (*) [32])*pauVar295 = in_ZmmResult._0_32_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar59._8_4_ = 0x7fffffff;
        auVar59._0_8_ = 0x7fffffff7fffffff;
        auVar59._12_4_ = 0x7fffffff;
        auVar308 = vandps_avx512vl(*(undefined1 (*) [16])*pauVar295,auVar59);
        auVar435._8_4_ = 0x3f000000;
        auVar435._0_8_ = 0x3f0000003f000000;
        auVar435._12_4_ = 0x3f000000;
        uVar297 = vcmpps_avx512vl(auVar435,auVar308,1);
        auVar503._8_4_ = 0x3f800000;
        auVar503._0_8_ = 0x3f8000003f800000;
        auVar503._12_4_ = 0x3f800000;
        auVar304._4_4_ = (uint)((byte)(uVar297 >> 1) & 1) * 0x3f800000;
        auVar304._0_4_ = (uint)((byte)uVar297 & 1) * 0x3f800000;
        auVar304._8_4_ = (uint)((byte)(uVar297 >> 2) & 1) * 0x3f800000;
        auVar304._12_4_ = (uint)((byte)(uVar297 >> 3) & 1) * 0x3f800000;
        auVar307 = vfnmadd213ps_fma(auVar435,auVar308,auVar435);
        auVar307 = vsqrtps_avx512vl(auVar307);
        bVar1 = (bool)((byte)uVar297 & 1);
        fVar368 = (float)((uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * auVar308._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        fVar362 = (float)((uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * auVar308._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        fVar363 = (float)((uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * auVar308._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        fVar364 = (float)((uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * auVar308._12_4_);
        auVar436._0_4_ = fVar368 * fVar368;
        auVar436._4_4_ = fVar362 * fVar362;
        auVar436._8_4_ = fVar363 * fVar363;
        auVar436._12_4_ = fVar364 * fVar364;
        auVar468._0_4_ = auVar436._0_4_ * auVar436._0_4_;
        auVar468._4_4_ = auVar436._4_4_ * auVar436._4_4_;
        auVar468._8_4_ = auVar436._8_4_ * auVar436._8_4_;
        auVar468._12_4_ = auVar436._12_4_ * auVar436._12_4_;
        in_ZMM4 = ZEXT1664(auVar468);
        auVar488._8_4_ = 0x3d2dbdcf;
        auVar488._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar488._12_4_ = 0x3d2dbdcf;
        auVar60._8_4_ = 0x3d3a73d8;
        auVar60._0_8_ = 0x3d3a73d83d3a73d8;
        auVar60._12_4_ = 0x3d3a73d8;
        auVar307 = vfmadd213ps_avx512vl(auVar488,auVar468,auVar60);
        auVar61._8_4_ = 0x3e2aaaf8;
        auVar61._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar61._12_4_ = 0x3e2aaaf8;
        auVar308 = vfmadd213ps_avx512vl(auVar307,auVar468,auVar61);
        auVar497._8_4_ = 0x3cc48f19;
        auVar497._0_8_ = 0x3cc48f193cc48f19;
        auVar497._12_4_ = 0x3cc48f19;
        auVar62._8_4_ = 0x3d997dcc;
        auVar62._0_8_ = 0x3d997dcc3d997dcc;
        auVar62._12_4_ = 0x3d997dcc;
        auVar307 = vfmadd213ps_avx512vl(auVar497,auVar468,auVar62);
        auVar307 = vfmadd213ps_fma(auVar307,auVar468,auVar503);
        auVar307 = vfmadd231ps_fma(auVar307,auVar436,auVar308);
        auVar390._0_4_ = auVar307._0_4_ * fVar368;
        auVar390._4_4_ = auVar307._4_4_ * fVar362;
        auVar390._8_4_ = auVar307._8_4_ * fVar363;
        auVar390._12_4_ = auVar307._12_4_ * fVar364;
        auVar63._8_4_ = 0xc0400000;
        auVar63._0_8_ = 0xc0400000c0400000;
        auVar63._12_4_ = 0xc0400000;
        auVar307 = vfmadd231ps_avx512vl(auVar503,auVar304,auVar63);
        in_ZMM3 = ZEXT1664(auVar307);
        auVar64._8_4_ = 0x3fc90fdb;
        auVar64._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar64._12_4_ = 0x3fc90fdb;
        auVar308 = vmulps_avx512vl(auVar304,auVar64);
        auVar307 = vfmadd231ps_fma(auVar308,auVar390,auVar307);
        auVar65._8_4_ = 0x80000000;
        auVar65._0_8_ = 0x8000000080000000;
        auVar65._12_4_ = 0x80000000;
        in_ZmmResult._0_16_ =
             vpternlogd_avx512vl(auVar307,*(undefined1 (*) [16])*pauVar295,auVar65,0xf8);
        *(undefined1 (*) [16])*pauVar295 = in_ZmmResult._0_16_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        fVar368 = asinf(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 0xd:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar361 = *pauVar295;
        auVar250._8_4_ = 0x80000000;
        auVar250._0_8_ = 0x8000000080000000;
        auVar250._12_4_ = 0x80000000;
        auVar250._16_4_ = 0x80000000;
        auVar250._20_4_ = 0x80000000;
        auVar250._24_4_ = 0x80000000;
        auVar250._28_4_ = 0x80000000;
        auVar250._32_4_ = 0x80000000;
        auVar250._36_4_ = 0x80000000;
        auVar250._40_4_ = 0x80000000;
        auVar250._44_4_ = 0x80000000;
        auVar250._48_4_ = 0x80000000;
        auVar250._52_4_ = 0x80000000;
        auVar250._56_4_ = 0x80000000;
        auVar250._60_4_ = 0x80000000;
        auVar352 = vandps_avx512dq(auVar361,auVar250);
        auVar251._8_4_ = 0x7fffffff;
        auVar251._0_8_ = 0x7fffffff7fffffff;
        auVar251._12_4_ = 0x7fffffff;
        auVar251._16_4_ = 0x7fffffff;
        auVar251._20_4_ = 0x7fffffff;
        auVar251._24_4_ = 0x7fffffff;
        auVar251._28_4_ = 0x7fffffff;
        auVar251._32_4_ = 0x7fffffff;
        auVar251._36_4_ = 0x7fffffff;
        auVar251._40_4_ = 0x7fffffff;
        auVar251._44_4_ = 0x7fffffff;
        auVar251._48_4_ = 0x7fffffff;
        auVar251._52_4_ = 0x7fffffff;
        auVar251._56_4_ = 0x7fffffff;
        auVar251._60_4_ = 0x7fffffff;
        auVar353 = vandps_avx512dq(auVar361,auVar251);
        auVar354 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
        uVar297 = vcmpps_avx512f(auVar353,auVar354,2);
        auVar354 = vfnmadd213ps_avx512f(auVar354,auVar353,auVar354);
        auVar354 = vsqrtps_avx512f(auVar354);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar356._0_4_ = (uint)bVar1 * auVar353._0_4_ | (uint)!bVar1 * auVar354._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar356._4_4_ = (uint)bVar1 * auVar353._4_4_ | (uint)!bVar1 * auVar354._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar356._8_4_ = (uint)bVar1 * auVar353._8_4_ | (uint)!bVar1 * auVar354._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar356._12_4_ = (uint)bVar1 * auVar353._12_4_ | (uint)!bVar1 * auVar354._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar356._16_4_ = (uint)bVar1 * auVar353._16_4_ | (uint)!bVar1 * auVar354._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar356._20_4_ = (uint)bVar1 * auVar353._20_4_ | (uint)!bVar1 * auVar354._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar356._24_4_ = (uint)bVar1 * auVar353._24_4_ | (uint)!bVar1 * auVar354._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar356._28_4_ = (uint)bVar1 * auVar353._28_4_ | (uint)!bVar1 * auVar354._28_4_;
        bVar10 = (byte)(uVar297 >> 8);
        bVar1 = (bool)(bVar10 & 1);
        auVar356._32_4_ = (uint)bVar1 * auVar353._32_4_ | (uint)!bVar1 * auVar354._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar356._36_4_ = (uint)bVar1 * auVar353._36_4_ | (uint)!bVar1 * auVar354._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar356._40_4_ = (uint)bVar1 * auVar353._40_4_ | (uint)!bVar1 * auVar354._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar356._44_4_ = (uint)bVar1 * auVar353._44_4_ | (uint)!bVar1 * auVar354._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar356._48_4_ = (uint)bVar1 * auVar353._48_4_ | (uint)!bVar1 * auVar354._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar356._52_4_ = (uint)bVar1 * auVar353._52_4_ | (uint)!bVar1 * auVar354._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar356._56_4_ = (uint)bVar1 * auVar353._56_4_ | (uint)!bVar1 * auVar354._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar356._60_4_ = (uint)bVar1 * auVar353._60_4_ | (uint)!bVar1 * auVar354._60_4_;
        auVar353 = vmulps_avx512f(auVar356,auVar356);
        in_ZMM4 = vmulps_avx512f(auVar353,auVar353);
        auVar354 = vbroadcastss_avx512f(ZEXT416(0x3d2dbdcf));
        auVar252._8_4_ = 0x3d3a73d8;
        auVar252._0_8_ = 0x3d3a73d83d3a73d8;
        auVar252._12_4_ = 0x3d3a73d8;
        auVar252._16_4_ = 0x3d3a73d8;
        auVar252._20_4_ = 0x3d3a73d8;
        auVar252._24_4_ = 0x3d3a73d8;
        auVar252._28_4_ = 0x3d3a73d8;
        auVar252._32_4_ = 0x3d3a73d8;
        auVar252._36_4_ = 0x3d3a73d8;
        auVar252._40_4_ = 0x3d3a73d8;
        auVar252._44_4_ = 0x3d3a73d8;
        auVar252._48_4_ = 0x3d3a73d8;
        auVar252._52_4_ = 0x3d3a73d8;
        auVar252._56_4_ = 0x3d3a73d8;
        auVar252._60_4_ = 0x3d3a73d8;
        auVar354 = vfmadd213ps_avx512f(auVar354,in_ZMM4,auVar252);
        auVar253._8_4_ = 0x3e2aaaf8;
        auVar253._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar253._12_4_ = 0x3e2aaaf8;
        auVar253._16_4_ = 0x3e2aaaf8;
        auVar253._20_4_ = 0x3e2aaaf8;
        auVar253._24_4_ = 0x3e2aaaf8;
        auVar253._28_4_ = 0x3e2aaaf8;
        auVar253._32_4_ = 0x3e2aaaf8;
        auVar253._36_4_ = 0x3e2aaaf8;
        auVar253._40_4_ = 0x3e2aaaf8;
        auVar253._44_4_ = 0x3e2aaaf8;
        auVar253._48_4_ = 0x3e2aaaf8;
        auVar253._52_4_ = 0x3e2aaaf8;
        auVar253._56_4_ = 0x3e2aaaf8;
        auVar253._60_4_ = 0x3e2aaaf8;
        auVar354 = vfmadd213ps_avx512f(auVar354,in_ZMM4,auVar253);
        auVar355 = vbroadcastss_avx512f(ZEXT416(0x3cc48f19));
        auVar254._8_4_ = 0x3d997dcc;
        auVar254._0_8_ = 0x3d997dcc3d997dcc;
        auVar254._12_4_ = 0x3d997dcc;
        auVar254._16_4_ = 0x3d997dcc;
        auVar254._20_4_ = 0x3d997dcc;
        auVar254._24_4_ = 0x3d997dcc;
        auVar254._28_4_ = 0x3d997dcc;
        auVar254._32_4_ = 0x3d997dcc;
        auVar254._36_4_ = 0x3d997dcc;
        auVar254._40_4_ = 0x3d997dcc;
        auVar254._44_4_ = 0x3d997dcc;
        auVar254._48_4_ = 0x3d997dcc;
        auVar254._52_4_ = 0x3d997dcc;
        auVar254._56_4_ = 0x3d997dcc;
        auVar254._60_4_ = 0x3d997dcc;
        auVar355 = vfmadd213ps_avx512f(auVar355,in_ZMM4,auVar254);
        auVar255._8_4_ = 0x3f800000;
        auVar255._0_8_ = 0x3f8000003f800000;
        auVar255._12_4_ = 0x3f800000;
        auVar255._16_4_ = 0x3f800000;
        auVar255._20_4_ = 0x3f800000;
        auVar255._24_4_ = 0x3f800000;
        auVar255._28_4_ = 0x3f800000;
        auVar255._32_4_ = 0x3f800000;
        auVar255._36_4_ = 0x3f800000;
        auVar255._40_4_ = 0x3f800000;
        auVar255._44_4_ = 0x3f800000;
        auVar255._48_4_ = 0x3f800000;
        auVar255._52_4_ = 0x3f800000;
        auVar255._56_4_ = 0x3f800000;
        auVar255._60_4_ = 0x3f800000;
        auVar355 = vfmadd213ps_avx512f(auVar355,in_ZMM4,auVar255);
        auVar353 = vfmadd231ps_avx512f(auVar355,auVar353,auVar354);
        auVar353 = vmulps_avx512f(auVar353,auVar356);
        auVar354 = vorps_avx512dq(auVar352,auVar353);
        uVar19 = vcmpps_avx512f(auVar361,_DAT_0054e200,1);
        auVar361 = vaddps_avx512f(auVar353,auVar353);
        auVar361 = vorps_avx512dq(auVar352,auVar361);
        auVar256._8_4_ = 0x40490fdb;
        auVar256._0_8_ = 0x40490fdb40490fdb;
        auVar256._12_4_ = 0x40490fdb;
        auVar256._16_4_ = 0x40490fdb;
        auVar256._20_4_ = 0x40490fdb;
        auVar256._24_4_ = 0x40490fdb;
        auVar256._28_4_ = 0x40490fdb;
        auVar256._32_4_ = 0x40490fdb;
        auVar256._36_4_ = 0x40490fdb;
        auVar256._40_4_ = 0x40490fdb;
        auVar256._44_4_ = 0x40490fdb;
        auVar256._48_4_ = 0x40490fdb;
        auVar256._52_4_ = 0x40490fdb;
        auVar256._56_4_ = 0x40490fdb;
        auVar256._60_4_ = 0x40490fdb;
        auVar352 = vaddps_avx512f(auVar361,auVar256);
        bVar1 = (bool)((byte)uVar19 & 1);
        bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar19 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar19 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar19 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar19 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar19 >> 7) & 1);
        bVar11 = (bool)((byte)(uVar19 >> 8) & 1);
        bVar12 = (bool)((byte)(uVar19 >> 9) & 1);
        bVar13 = (bool)((byte)(uVar19 >> 10) & 1);
        bVar14 = (bool)((byte)(uVar19 >> 0xb) & 1);
        bVar15 = (bool)((byte)(uVar19 >> 0xc) & 1);
        bVar16 = (bool)((byte)(uVar19 >> 0xd) & 1);
        bVar17 = (bool)((byte)(uVar19 >> 0xe) & 1);
        bVar18 = SUB81(uVar19 >> 0xf,0);
        auVar353 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar353 = vsubps_avx512f(auVar353,auVar354);
        bVar2 = (bool)((byte)uVar297 & 1);
        in_ZmmResult._0_4_ =
             (uint)bVar2 * auVar353._0_4_ |
             (uint)!bVar2 * ((uint)bVar1 * auVar352._0_4_ | (uint)!bVar1 * auVar361._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        in_ZmmResult._4_4_ =
             (uint)bVar1 * auVar353._4_4_ |
             (uint)!bVar1 * ((uint)bVar3 * auVar352._4_4_ | (uint)!bVar3 * auVar361._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        in_ZmmResult._8_4_ =
             (uint)bVar1 * auVar353._8_4_ |
             (uint)!bVar1 * ((uint)bVar4 * auVar352._8_4_ | (uint)!bVar4 * auVar361._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        in_ZmmResult._12_4_ =
             (uint)bVar1 * auVar353._12_4_ |
             (uint)!bVar1 * ((uint)bVar5 * auVar352._12_4_ | (uint)!bVar5 * auVar361._12_4_);
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        in_ZmmResult._16_4_ =
             (uint)bVar1 * auVar353._16_4_ |
             (uint)!bVar1 * ((uint)bVar6 * auVar352._16_4_ | (uint)!bVar6 * auVar361._16_4_);
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        in_ZmmResult._20_4_ =
             (uint)bVar1 * auVar353._20_4_ |
             (uint)!bVar1 * ((uint)bVar7 * auVar352._20_4_ | (uint)!bVar7 * auVar361._20_4_);
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        in_ZmmResult._24_4_ =
             (uint)bVar1 * auVar353._24_4_ |
             (uint)!bVar1 * ((uint)bVar8 * auVar352._24_4_ | (uint)!bVar8 * auVar361._24_4_);
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        in_ZmmResult._28_4_ =
             (uint)bVar1 * auVar353._28_4_ |
             (uint)!bVar1 * ((uint)bVar9 * auVar352._28_4_ | (uint)!bVar9 * auVar361._28_4_);
        bVar1 = (bool)(bVar10 & 1);
        in_ZmmResult._32_4_ =
             (uint)bVar1 * auVar353._32_4_ |
             (uint)!bVar1 * ((uint)bVar11 * auVar352._32_4_ | (uint)!bVar11 * auVar361._32_4_);
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        in_ZmmResult._36_4_ =
             (uint)bVar1 * auVar353._36_4_ |
             (uint)!bVar1 * ((uint)bVar12 * auVar352._36_4_ | (uint)!bVar12 * auVar361._36_4_);
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        in_ZmmResult._40_4_ =
             (uint)bVar1 * auVar353._40_4_ |
             (uint)!bVar1 * ((uint)bVar13 * auVar352._40_4_ | (uint)!bVar13 * auVar361._40_4_);
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        in_ZmmResult._44_4_ =
             (uint)bVar1 * auVar353._44_4_ |
             (uint)!bVar1 * ((uint)bVar14 * auVar352._44_4_ | (uint)!bVar14 * auVar361._44_4_);
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        in_ZmmResult._48_4_ =
             (uint)bVar1 * auVar353._48_4_ |
             (uint)!bVar1 * ((uint)bVar15 * auVar352._48_4_ | (uint)!bVar15 * auVar361._48_4_);
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        in_ZmmResult._52_4_ =
             (uint)bVar1 * auVar353._52_4_ |
             (uint)!bVar1 * ((uint)bVar16 * auVar352._52_4_ | (uint)!bVar16 * auVar361._52_4_);
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        in_ZmmResult._56_4_ =
             (uint)bVar1 * auVar353._56_4_ |
             (uint)!bVar1 * ((uint)bVar17 * auVar352._56_4_ | (uint)!bVar17 * auVar361._56_4_);
        bVar1 = SUB81(uVar297 >> 0xf,0);
        in_ZmmResult._60_4_ =
             (uint)bVar1 * auVar353._60_4_ |
             (uint)!bVar1 * ((uint)bVar18 * auVar352._60_4_ | (uint)!bVar18 * auVar361._60_4_);
        *pauVar295 = in_ZmmResult;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = *(undefined1 (*) [32])*pauVar295;
        auVar161._8_4_ = 0x80000000;
        auVar161._0_8_ = 0x8000000080000000;
        auVar161._12_4_ = 0x80000000;
        auVar161._16_4_ = 0x80000000;
        auVar161._20_4_ = 0x80000000;
        auVar161._24_4_ = 0x80000000;
        auVar161._28_4_ = 0x80000000;
        vandps_avx512vl(auVar329,auVar161);
        auVar399 = in_ZmmResult._0_32_;
        auVar162._8_4_ = 0x7fffffff;
        auVar162._0_8_ = 0x7fffffff7fffffff;
        auVar162._12_4_ = 0x7fffffff;
        auVar162._16_4_ = 0x7fffffff;
        auVar162._20_4_ = 0x7fffffff;
        auVar162._24_4_ = 0x7fffffff;
        auVar162._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar329,auVar162);
        auVar456._8_4_ = 0x3f000000;
        auVar456._0_8_ = 0x3f0000003f000000;
        auVar456._12_4_ = 0x3f000000;
        auVar456._16_4_ = 0x3f000000;
        auVar456._20_4_ = 0x3f000000;
        auVar456._24_4_ = 0x3f000000;
        auVar456._28_4_ = 0x3f000000;
        uVar297 = vcmpps_avx512vl(auVar456,auVar399,1);
        auVar307 = vfnmadd213ps_fma(auVar456,auVar399,auVar456);
        auVar330 = vsqrtps_avx512vl(ZEXT1632(auVar307));
        bVar1 = (bool)((byte)uVar297 & 1);
        fVar368 = (float)((uint)bVar1 * auVar330._0_4_ | (uint)!bVar1 * in_ZmmResult._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        fVar362 = (float)((uint)bVar1 * auVar330._4_4_ | (uint)!bVar1 * in_ZmmResult._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        fVar363 = (float)((uint)bVar1 * auVar330._8_4_ | (uint)!bVar1 * in_ZmmResult._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        fVar364 = (float)((uint)bVar1 * auVar330._12_4_ | (uint)!bVar1 * in_ZmmResult._12_4_);
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        fVar365 = (float)((uint)bVar1 * auVar330._16_4_ | (uint)!bVar1 * in_ZmmResult._16_4_);
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        fVar366 = (float)((uint)bVar1 * auVar330._20_4_ | (uint)!bVar1 * in_ZmmResult._20_4_);
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        fVar367 = (float)((uint)bVar1 * auVar330._24_4_ | (uint)!bVar1 * in_ZmmResult._24_4_);
        bVar1 = SUB81(uVar297 >> 7,0);
        fVar385 = (float)((uint)bVar1 * auVar330._28_4_ | (uint)!bVar1 * in_ZmmResult._28_4_);
        auVar457._0_4_ = fVar368 * fVar368;
        auVar457._4_4_ = fVar362 * fVar362;
        auVar457._8_4_ = fVar363 * fVar363;
        auVar457._12_4_ = fVar364 * fVar364;
        auVar457._16_4_ = fVar365 * fVar365;
        auVar457._20_4_ = fVar366 * fVar366;
        auVar457._24_4_ = fVar367 * fVar367;
        auVar457._28_4_ = 0;
        auVar483._0_4_ = auVar457._0_4_ * auVar457._0_4_;
        auVar483._4_4_ = auVar457._4_4_ * auVar457._4_4_;
        auVar483._8_4_ = auVar457._8_4_ * auVar457._8_4_;
        auVar483._12_4_ = auVar457._12_4_ * auVar457._12_4_;
        auVar483._16_4_ = auVar457._16_4_ * auVar457._16_4_;
        auVar483._20_4_ = auVar457._20_4_ * auVar457._20_4_;
        auVar483._28_36_ = in_ZMM4._28_36_;
        auVar483._24_4_ = auVar457._24_4_ * auVar457._24_4_;
        auVar322 = auVar483._0_32_;
        auVar495._8_4_ = 0x3d2dbdcf;
        auVar495._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar495._12_4_ = 0x3d2dbdcf;
        auVar495._16_4_ = 0x3d2dbdcf;
        auVar495._20_4_ = 0x3d2dbdcf;
        auVar495._24_4_ = 0x3d2dbdcf;
        auVar495._28_4_ = 0x3d2dbdcf;
        auVar163._8_4_ = 0x3d3a73d8;
        auVar163._0_8_ = 0x3d3a73d83d3a73d8;
        auVar163._12_4_ = 0x3d3a73d8;
        auVar163._16_4_ = 0x3d3a73d8;
        auVar163._20_4_ = 0x3d3a73d8;
        auVar163._24_4_ = 0x3d3a73d8;
        auVar163._28_4_ = 0x3d3a73d8;
        auVar330 = vfmadd213ps_avx512vl(auVar495,auVar322,auVar163);
        auVar164._8_4_ = 0x3e2aaaf8;
        auVar164._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar164._12_4_ = 0x3e2aaaf8;
        auVar164._16_4_ = 0x3e2aaaf8;
        auVar164._20_4_ = 0x3e2aaaf8;
        auVar164._24_4_ = 0x3e2aaaf8;
        auVar164._28_4_ = 0x3e2aaaf8;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar322,auVar164);
        auVar502._8_4_ = 0x3cc48f19;
        auVar502._0_8_ = 0x3cc48f193cc48f19;
        auVar502._12_4_ = 0x3cc48f19;
        auVar502._16_4_ = 0x3cc48f19;
        auVar502._20_4_ = 0x3cc48f19;
        auVar502._24_4_ = 0x3cc48f19;
        auVar502._28_4_ = 0x3cc48f19;
        auVar165._8_4_ = 0x3d997dcc;
        auVar165._0_8_ = 0x3d997dcc3d997dcc;
        auVar165._12_4_ = 0x3d997dcc;
        auVar165._16_4_ = 0x3d997dcc;
        auVar165._20_4_ = 0x3d997dcc;
        auVar165._24_4_ = 0x3d997dcc;
        auVar165._28_4_ = 0x3d997dcc;
        auVar318 = vfmadd213ps_avx512vl(auVar502,auVar322,auVar165);
        auVar166._8_4_ = 0x3f800000;
        auVar166._0_8_ = 0x3f8000003f800000;
        auVar166._12_4_ = 0x3f800000;
        auVar166._16_4_ = 0x3f800000;
        auVar166._20_4_ = 0x3f800000;
        auVar166._24_4_ = 0x3f800000;
        auVar166._28_4_ = 0x3f800000;
        auVar318 = vfmadd213ps_avx512vl(auVar318,auVar322,auVar166);
        auVar307 = vfmadd231ps_fma(auVar318,auVar457,auVar330);
        fVar368 = auVar307._0_4_ * fVar368;
        fVar362 = auVar307._4_4_ * fVar362;
        auVar284._4_4_ = fVar362;
        auVar284._0_4_ = fVar368;
        fVar363 = auVar307._8_4_ * fVar363;
        auVar284._8_4_ = fVar363;
        fVar364 = auVar307._12_4_ * fVar364;
        auVar284._12_4_ = fVar364;
        fVar365 = fVar365 * 0.0;
        auVar284._16_4_ = fVar365;
        fVar366 = fVar366 * 0.0;
        auVar284._20_4_ = fVar366;
        fVar367 = fVar367 * 0.0;
        auVar284._24_4_ = fVar367;
        auVar284._28_4_ = fVar385;
        auVar330 = vorps_avx(auVar399,auVar284);
        auVar480._8_4_ = 0x3fc90fdb;
        auVar480._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar480._12_4_ = 0x3fc90fdb;
        auVar480._16_4_ = 0x3fc90fdb;
        auVar480._20_4_ = 0x3fc90fdb;
        auVar480._24_4_ = 0x3fc90fdb;
        auVar480._28_4_ = 0x3fc90fdb;
        in_ZMM4 = ZEXT3264(auVar480);
        auVar330 = vsubps_avx(auVar480,auVar330);
        uVar19 = vcmpps_avx512vl(auVar329,_DAT_00548840,1);
        auVar383._0_4_ = fVar368 + fVar368;
        auVar383._4_4_ = fVar362 + fVar362;
        auVar383._8_4_ = fVar363 + fVar363;
        auVar383._12_4_ = fVar364 + fVar364;
        auVar383._16_4_ = fVar365 + fVar365;
        auVar383._20_4_ = fVar366 + fVar366;
        auVar383._24_4_ = fVar367 + fVar367;
        auVar383._28_4_ = fVar385 + fVar385;
        auVar329 = vorps_avx(auVar399,auVar383);
        auVar167._8_4_ = 0x40490fdb;
        auVar167._0_8_ = 0x40490fdb40490fdb;
        auVar167._12_4_ = 0x40490fdb;
        auVar167._16_4_ = 0x40490fdb;
        auVar167._20_4_ = 0x40490fdb;
        auVar167._24_4_ = 0x40490fdb;
        auVar167._28_4_ = 0x40490fdb;
        auVar399 = vaddps_avx512vl(auVar329,auVar167);
        bVar1 = (bool)((byte)uVar19 & 1);
        bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar19 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar19 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar19 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar19 >> 6) & 1);
        bVar9 = SUB81(uVar19 >> 7,0);
        bVar2 = (bool)((byte)uVar297 & 1);
        auVar334._0_4_ =
             (uint)bVar2 * ((uint)bVar1 * auVar399._0_4_ | (uint)!bVar1 * auVar329._0_4_) |
             (uint)!bVar2 * auVar330._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar334._4_4_ =
             (uint)bVar1 * ((uint)bVar3 * auVar399._4_4_ | (uint)!bVar3 * auVar329._4_4_) |
             (uint)!bVar1 * auVar330._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar334._8_4_ =
             (uint)bVar1 * ((uint)bVar4 * auVar399._8_4_ | (uint)!bVar4 * auVar329._8_4_) |
             (uint)!bVar1 * auVar330._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar334._12_4_ =
             (uint)bVar1 * ((uint)bVar5 * auVar399._12_4_ | (uint)!bVar5 * auVar329._12_4_) |
             (uint)!bVar1 * auVar330._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar334._16_4_ =
             (uint)bVar1 * ((uint)bVar6 * auVar399._16_4_ | (uint)!bVar6 * auVar329._16_4_) |
             (uint)!bVar1 * auVar330._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar334._20_4_ =
             (uint)bVar1 * ((uint)bVar7 * auVar399._20_4_ | (uint)!bVar7 * auVar329._20_4_) |
             (uint)!bVar1 * auVar330._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar334._24_4_ =
             (uint)bVar1 * ((uint)bVar8 * auVar399._24_4_ | (uint)!bVar8 * auVar329._24_4_) |
             (uint)!bVar1 * auVar330._24_4_;
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar334._28_4_ =
             (uint)bVar1 * ((uint)bVar9 * auVar399._28_4_ | (uint)!bVar9 * auVar329._28_4_) |
             (uint)!bVar1 * auVar330._28_4_;
        in_ZmmResult._0_32_ = auVar334;
        *(undefined1 (*) [32])*pauVar295 = auVar334;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar307 = *(undefined1 (*) [16])*pauVar295;
        auVar52._8_4_ = 0x80000000;
        auVar52._0_8_ = 0x8000000080000000;
        auVar52._12_4_ = 0x80000000;
        auVar392 = vandps_avx512vl(auVar307,auVar52);
        auVar53._8_4_ = 0x7fffffff;
        auVar53._0_8_ = 0x7fffffff7fffffff;
        auVar53._12_4_ = 0x7fffffff;
        auVar312 = vandps_avx512vl(auVar307,auVar53);
        auVar444._8_4_ = 0x3f000000;
        auVar444._0_8_ = 0x3f0000003f000000;
        auVar444._12_4_ = 0x3f000000;
        uVar297 = vcmpps_avx512vl(auVar444,auVar312,1);
        auVar308 = vfnmadd213ps_fma(auVar444,auVar312,auVar444);
        auVar308 = vsqrtps_avx512vl(auVar308);
        bVar1 = (bool)((byte)uVar297 & 1);
        fVar368 = (float)((uint)bVar1 * auVar308._0_4_ | (uint)!bVar1 * auVar312._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        fVar362 = (float)((uint)bVar1 * auVar308._4_4_ | (uint)!bVar1 * auVar312._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        fVar363 = (float)((uint)bVar1 * auVar308._8_4_ | (uint)!bVar1 * auVar312._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        fVar364 = (float)((uint)bVar1 * auVar308._12_4_ | (uint)!bVar1 * auVar312._12_4_);
        auVar445._0_4_ = fVar368 * fVar368;
        auVar445._4_4_ = fVar362 * fVar362;
        auVar445._8_4_ = fVar363 * fVar363;
        auVar445._12_4_ = fVar364 * fVar364;
        auVar471._0_4_ = auVar445._0_4_ * auVar445._0_4_;
        auVar471._4_4_ = auVar445._4_4_ * auVar445._4_4_;
        auVar471._8_4_ = auVar445._8_4_ * auVar445._8_4_;
        auVar471._12_4_ = auVar445._12_4_ * auVar445._12_4_;
        auVar489._8_4_ = 0x3d2dbdcf;
        auVar489._0_8_ = 0x3d2dbdcf3d2dbdcf;
        auVar489._12_4_ = 0x3d2dbdcf;
        auVar54._8_4_ = 0x3d3a73d8;
        auVar54._0_8_ = 0x3d3a73d83d3a73d8;
        auVar54._12_4_ = 0x3d3a73d8;
        auVar308 = vfmadd213ps_avx512vl(auVar489,auVar471,auVar54);
        auVar55._8_4_ = 0x3e2aaaf8;
        auVar55._0_8_ = 0x3e2aaaf83e2aaaf8;
        auVar55._12_4_ = 0x3e2aaaf8;
        auVar308 = vfmadd213ps_avx512vl(auVar308,auVar471,auVar55);
        auVar498._8_4_ = 0x3cc48f19;
        auVar498._0_8_ = 0x3cc48f193cc48f19;
        auVar498._12_4_ = 0x3cc48f19;
        auVar56._8_4_ = 0x3d997dcc;
        auVar56._0_8_ = 0x3d997dcc3d997dcc;
        auVar56._12_4_ = 0x3d997dcc;
        auVar312 = vfmadd213ps_avx512vl(auVar498,auVar471,auVar56);
        auVar57._8_4_ = 0x3f800000;
        auVar57._0_8_ = 0x3f8000003f800000;
        auVar57._12_4_ = 0x3f800000;
        auVar312 = vfmadd213ps_avx512vl(auVar312,auVar471,auVar57);
        auVar308 = vfmadd231ps_fma(auVar312,auVar445,auVar308);
        auVar418._0_4_ = auVar308._0_4_ * fVar368;
        auVar418._4_4_ = auVar308._4_4_ * fVar362;
        auVar418._8_4_ = auVar308._8_4_ * fVar363;
        auVar418._12_4_ = auVar308._12_4_ * fVar364;
        auVar308 = vorps_avx(auVar392,auVar418);
        auVar472._8_4_ = 0x3fc90fdb;
        auVar472._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar472._12_4_ = 0x3fc90fdb;
        in_ZMM4 = ZEXT1664(auVar472);
        auVar308 = vsubps_avx(auVar472,auVar308);
        uVar19 = vcmpps_avx512vl(auVar307,_DAT_00545cc0,1);
        auVar376._0_4_ = auVar418._0_4_ + auVar418._0_4_;
        auVar376._4_4_ = auVar418._4_4_ + auVar418._4_4_;
        auVar376._8_4_ = auVar418._8_4_ + auVar418._8_4_;
        auVar376._12_4_ = auVar418._12_4_ + auVar418._12_4_;
        auVar307 = vorps_avx(auVar392,auVar376);
        auVar58._8_4_ = 0x40490fdb;
        auVar58._0_8_ = 0x40490fdb40490fdb;
        auVar58._12_4_ = 0x40490fdb;
        auVar392 = vaddps_avx512vl(auVar307,auVar58);
        bVar1 = (bool)((byte)uVar19 & 1);
        bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar19 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar19 >> 3) & 1);
        bVar2 = (bool)((byte)uVar297 & 1);
        auVar313._0_4_ =
             (uint)bVar2 * ((uint)bVar1 * auVar392._0_4_ | (uint)!bVar1 * auVar307._0_4_) |
             (uint)!bVar2 * auVar308._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar313._4_4_ =
             (uint)bVar1 * ((uint)bVar3 * auVar392._4_4_ | (uint)!bVar3 * auVar307._4_4_) |
             (uint)!bVar1 * auVar308._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar313._8_4_ =
             (uint)bVar1 * ((uint)bVar4 * auVar392._8_4_ | (uint)!bVar4 * auVar307._8_4_) |
             (uint)!bVar1 * auVar308._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar313._12_4_ =
             (uint)bVar1 * ((uint)bVar5 * auVar392._12_4_ | (uint)!bVar5 * auVar307._12_4_) |
             (uint)!bVar1 * auVar308._12_4_;
        in_ZmmResult._0_16_ = auVar313;
        *(undefined1 (*) [16])*pauVar295 = auVar313;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        fVar368 = acosf(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 0xe:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar240._8_4_ = 0x7fffffff;
        auVar240._0_8_ = 0x7fffffff7fffffff;
        auVar240._12_4_ = 0x7fffffff;
        auVar240._16_4_ = 0x7fffffff;
        auVar240._20_4_ = 0x7fffffff;
        auVar240._24_4_ = 0x7fffffff;
        auVar240._28_4_ = 0x7fffffff;
        auVar240._32_4_ = 0x7fffffff;
        auVar240._36_4_ = 0x7fffffff;
        auVar240._40_4_ = 0x7fffffff;
        auVar240._44_4_ = 0x7fffffff;
        auVar240._48_4_ = 0x7fffffff;
        auVar240._52_4_ = 0x7fffffff;
        auVar240._56_4_ = 0x7fffffff;
        auVar240._60_4_ = 0x7fffffff;
        auVar361 = vandps_avx512dq(*pauVar295,auVar240);
        auVar352 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        uVar297 = vcmpps_avx512f(auVar352,auVar361,1);
        auVar241._8_4_ = 0xbf800000;
        auVar241._0_8_ = 0xbf800000bf800000;
        auVar241._12_4_ = 0xbf800000;
        auVar241._16_4_ = 0xbf800000;
        auVar241._20_4_ = 0xbf800000;
        auVar241._24_4_ = 0xbf800000;
        auVar241._28_4_ = 0xbf800000;
        auVar241._32_4_ = 0xbf800000;
        auVar241._36_4_ = 0xbf800000;
        auVar241._40_4_ = 0xbf800000;
        auVar241._44_4_ = 0xbf800000;
        auVar241._48_4_ = 0xbf800000;
        auVar241._52_4_ = 0xbf800000;
        auVar241._56_4_ = 0xbf800000;
        auVar241._60_4_ = 0xbf800000;
        auVar353 = vblendmps_avx512f(auVar361,auVar241);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar340._0_4_ = (uint)bVar1 * auVar353._0_4_ | (uint)!bVar1 * in_ZMM2._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar340._4_4_ = (uint)bVar1 * auVar353._4_4_ | (uint)!bVar1 * in_ZMM2._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar340._8_4_ = (uint)bVar1 * auVar353._8_4_ | (uint)!bVar1 * in_ZMM2._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar340._12_4_ = (uint)bVar1 * auVar353._12_4_ | (uint)!bVar1 * in_ZMM2._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar340._16_4_ = (uint)bVar1 * auVar353._16_4_ | (uint)!bVar1 * in_ZMM2._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar340._20_4_ = (uint)bVar1 * auVar353._20_4_ | (uint)!bVar1 * in_ZMM2._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar340._24_4_ = (uint)bVar1 * auVar353._24_4_ | (uint)!bVar1 * in_ZMM2._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar340._28_4_ = (uint)bVar1 * auVar353._28_4_ | (uint)!bVar1 * in_ZMM2._28_4_;
        bVar10 = (byte)(uVar297 >> 8);
        bVar1 = (bool)(bVar10 & 1);
        auVar340._32_4_ = (uint)bVar1 * auVar353._32_4_ | (uint)!bVar1 * in_ZMM2._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar340._36_4_ = (uint)bVar1 * auVar353._36_4_ | (uint)!bVar1 * in_ZMM2._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar340._40_4_ = (uint)bVar1 * auVar353._40_4_ | (uint)!bVar1 * in_ZMM2._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar340._44_4_ = (uint)bVar1 * auVar353._44_4_ | (uint)!bVar1 * in_ZMM2._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar340._48_4_ = (uint)bVar1 * auVar353._48_4_ | (uint)!bVar1 * in_ZMM2._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar340._52_4_ = (uint)bVar1 * auVar353._52_4_ | (uint)!bVar1 * in_ZMM2._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar340._56_4_ = (uint)bVar1 * auVar353._56_4_ | (uint)!bVar1 * in_ZMM2._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar340._60_4_ = (uint)bVar1 * auVar353._60_4_ | (uint)!bVar1 * in_ZMM2._60_4_;
        auVar361 = vmaxps_avx512f(auVar361,auVar352);
        auVar361 = vdivps_avx512f(auVar340,auVar361);
        in_ZMM2 = vmulps_avx512f(auVar361,auVar361);
        in_ZMM3 = vmulps_avx512f(in_ZMM2,in_ZMM2);
        auVar353 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar242._8_4_ = 0xbd99b01e;
        auVar242._0_8_ = 0xbd99b01ebd99b01e;
        auVar242._12_4_ = 0xbd99b01e;
        auVar242._16_4_ = 0xbd99b01e;
        auVar242._20_4_ = 0xbd99b01e;
        auVar242._24_4_ = 0xbd99b01e;
        auVar242._28_4_ = 0xbd99b01e;
        auVar242._32_4_ = 0xbd99b01e;
        auVar242._36_4_ = 0xbd99b01e;
        auVar242._40_4_ = 0xbd99b01e;
        auVar242._44_4_ = 0xbd99b01e;
        auVar242._48_4_ = 0xbd99b01e;
        auVar242._52_4_ = 0xbd99b01e;
        auVar242._56_4_ = 0xbd99b01e;
        auVar242._60_4_ = 0xbd99b01e;
        auVar353 = vfmadd213ps_avx512f(auVar353,in_ZMM3,auVar242);
        auVar243._8_4_ = 0xbe117200;
        auVar243._0_8_ = 0xbe117200be117200;
        auVar243._12_4_ = 0xbe117200;
        auVar243._16_4_ = 0xbe117200;
        auVar243._20_4_ = 0xbe117200;
        auVar243._24_4_ = 0xbe117200;
        auVar243._28_4_ = 0xbe117200;
        auVar243._32_4_ = 0xbe117200;
        auVar243._36_4_ = 0xbe117200;
        auVar243._40_4_ = 0xbe117200;
        auVar243._44_4_ = 0xbe117200;
        auVar243._48_4_ = 0xbe117200;
        auVar243._52_4_ = 0xbe117200;
        auVar243._56_4_ = 0xbe117200;
        auVar243._60_4_ = 0xbe117200;
        auVar353 = vfmadd213ps_avx512f(auVar353,in_ZMM3,auVar243);
        auVar244._8_4_ = 0xbeaaaa53;
        auVar244._0_8_ = 0xbeaaaa53beaaaa53;
        auVar244._12_4_ = 0xbeaaaa53;
        auVar244._16_4_ = 0xbeaaaa53;
        auVar244._20_4_ = 0xbeaaaa53;
        auVar244._24_4_ = 0xbeaaaa53;
        auVar244._28_4_ = 0xbeaaaa53;
        auVar244._32_4_ = 0xbeaaaa53;
        auVar244._36_4_ = 0xbeaaaa53;
        auVar244._40_4_ = 0xbeaaaa53;
        auVar244._44_4_ = 0xbeaaaa53;
        auVar244._48_4_ = 0xbeaaaa53;
        auVar244._52_4_ = 0xbeaaaa53;
        auVar244._56_4_ = 0xbeaaaa53;
        auVar244._60_4_ = 0xbeaaaa53;
        auVar353 = vfmadd213ps_avx512f(auVar353,in_ZMM3,auVar244);
        auVar354 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar245._8_4_ = 0x3d2edd4e;
        auVar245._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar245._12_4_ = 0x3d2edd4e;
        auVar245._16_4_ = 0x3d2edd4e;
        auVar245._20_4_ = 0x3d2edd4e;
        auVar245._24_4_ = 0x3d2edd4e;
        auVar245._28_4_ = 0x3d2edd4e;
        auVar245._32_4_ = 0x3d2edd4e;
        auVar245._36_4_ = 0x3d2edd4e;
        auVar245._40_4_ = 0x3d2edd4e;
        auVar245._44_4_ = 0x3d2edd4e;
        auVar245._48_4_ = 0x3d2edd4e;
        auVar245._52_4_ = 0x3d2edd4e;
        auVar245._56_4_ = 0x3d2edd4e;
        auVar245._60_4_ = 0x3d2edd4e;
        auVar354 = vfmadd213ps_avx512f(auVar354,in_ZMM3,auVar245);
        auVar246._8_4_ = 0x3dd9ed24;
        auVar246._0_8_ = 0x3dd9ed243dd9ed24;
        auVar246._12_4_ = 0x3dd9ed24;
        auVar246._16_4_ = 0x3dd9ed24;
        auVar246._20_4_ = 0x3dd9ed24;
        auVar246._24_4_ = 0x3dd9ed24;
        auVar246._28_4_ = 0x3dd9ed24;
        auVar246._32_4_ = 0x3dd9ed24;
        auVar246._36_4_ = 0x3dd9ed24;
        auVar246._40_4_ = 0x3dd9ed24;
        auVar246._44_4_ = 0x3dd9ed24;
        auVar246._48_4_ = 0x3dd9ed24;
        auVar246._52_4_ = 0x3dd9ed24;
        auVar246._56_4_ = 0x3dd9ed24;
        auVar246._60_4_ = 0x3dd9ed24;
        auVar354 = vfmadd213ps_avx512f(auVar354,in_ZMM3,auVar246);
        auVar247._8_4_ = 0x3e4cb974;
        auVar247._0_8_ = 0x3e4cb9743e4cb974;
        auVar247._12_4_ = 0x3e4cb974;
        auVar247._16_4_ = 0x3e4cb974;
        auVar247._20_4_ = 0x3e4cb974;
        auVar247._24_4_ = 0x3e4cb974;
        auVar247._28_4_ = 0x3e4cb974;
        auVar247._32_4_ = 0x3e4cb974;
        auVar247._36_4_ = 0x3e4cb974;
        auVar247._40_4_ = 0x3e4cb974;
        auVar247._44_4_ = 0x3e4cb974;
        auVar247._48_4_ = 0x3e4cb974;
        auVar247._52_4_ = 0x3e4cb974;
        auVar247._56_4_ = 0x3e4cb974;
        auVar247._60_4_ = 0x3e4cb974;
        auVar354 = vfmadd213ps_avx512f(auVar354,in_ZMM3,auVar247);
        auVar352 = vfmadd213ps_avx512f(auVar354,in_ZMM3,auVar352);
        auVar352 = vfmadd231ps_avx512f(auVar352,in_ZMM2,auVar353);
        auVar361 = vmulps_avx512f(auVar352,auVar361);
        auVar248._8_4_ = 0x3fc90fdb;
        auVar248._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar248._12_4_ = 0x3fc90fdb;
        auVar248._16_4_ = 0x3fc90fdb;
        auVar248._20_4_ = 0x3fc90fdb;
        auVar248._24_4_ = 0x3fc90fdb;
        auVar248._28_4_ = 0x3fc90fdb;
        auVar248._32_4_ = 0x3fc90fdb;
        auVar248._36_4_ = 0x3fc90fdb;
        auVar248._40_4_ = 0x3fc90fdb;
        auVar248._44_4_ = 0x3fc90fdb;
        auVar248._48_4_ = 0x3fc90fdb;
        auVar248._52_4_ = 0x3fc90fdb;
        auVar248._56_4_ = 0x3fc90fdb;
        auVar248._60_4_ = 0x3fc90fdb;
        auVar352 = vaddps_avx512f(auVar361,auVar248);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar341._0_4_ = (uint)bVar1 * auVar352._0_4_ | (uint)!bVar1 * auVar361._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar341._4_4_ = (uint)bVar1 * auVar352._4_4_ | (uint)!bVar1 * auVar361._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar341._8_4_ = (uint)bVar1 * auVar352._8_4_ | (uint)!bVar1 * auVar361._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar341._12_4_ = (uint)bVar1 * auVar352._12_4_ | (uint)!bVar1 * auVar361._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar341._16_4_ = (uint)bVar1 * auVar352._16_4_ | (uint)!bVar1 * auVar361._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar341._20_4_ = (uint)bVar1 * auVar352._20_4_ | (uint)!bVar1 * auVar361._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar341._24_4_ = (uint)bVar1 * auVar352._24_4_ | (uint)!bVar1 * auVar361._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar341._28_4_ = (uint)bVar1 * auVar352._28_4_ | (uint)!bVar1 * auVar361._28_4_;
        bVar1 = (bool)(bVar10 & 1);
        auVar341._32_4_ = (uint)bVar1 * auVar352._32_4_ | (uint)!bVar1 * auVar361._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar341._36_4_ = (uint)bVar1 * auVar352._36_4_ | (uint)!bVar1 * auVar361._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar341._40_4_ = (uint)bVar1 * auVar352._40_4_ | (uint)!bVar1 * auVar361._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar341._44_4_ = (uint)bVar1 * auVar352._44_4_ | (uint)!bVar1 * auVar361._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar341._48_4_ = (uint)bVar1 * auVar352._48_4_ | (uint)!bVar1 * auVar361._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar341._52_4_ = (uint)bVar1 * auVar352._52_4_ | (uint)!bVar1 * auVar361._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar341._56_4_ = (uint)bVar1 * auVar352._56_4_ | (uint)!bVar1 * auVar361._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar341._60_4_ = (uint)bVar1 * auVar352._60_4_ | (uint)!bVar1 * auVar361._60_4_;
        auVar249._8_4_ = 0x80000000;
        auVar249._0_8_ = 0x8000000080000000;
        auVar249._12_4_ = 0x80000000;
        auVar249._16_4_ = 0x80000000;
        auVar249._20_4_ = 0x80000000;
        auVar249._24_4_ = 0x80000000;
        auVar249._28_4_ = 0x80000000;
        auVar249._32_4_ = 0x80000000;
        auVar249._36_4_ = 0x80000000;
        auVar249._40_4_ = 0x80000000;
        auVar249._44_4_ = 0x80000000;
        auVar249._48_4_ = 0x80000000;
        auVar249._52_4_ = 0x80000000;
        auVar249._56_4_ = 0x80000000;
        auVar249._60_4_ = 0x80000000;
        in_ZmmResult = vpternlogd_avx512f(auVar341,*pauVar295,auVar249,0xf8);
        auVar361 = vmovdqu64_avx512f(in_ZmmResult);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar151._8_4_ = 0x7fffffff;
        auVar151._0_8_ = 0x7fffffff7fffffff;
        auVar151._12_4_ = 0x7fffffff;
        auVar151._16_4_ = 0x7fffffff;
        auVar151._20_4_ = 0x7fffffff;
        auVar151._24_4_ = 0x7fffffff;
        auVar151._28_4_ = 0x7fffffff;
        vandps_avx512vl(*(undefined1 (*) [32])*pauVar295,auVar151);
        auVar329 = in_ZmmResult._0_32_;
        auVar500._8_4_ = 0x3f800000;
        auVar500._0_8_ = 0x3f8000003f800000;
        auVar500._12_4_ = 0x3f800000;
        auVar500._16_4_ = 0x3f800000;
        auVar500._20_4_ = 0x3f800000;
        auVar500._24_4_ = 0x3f800000;
        auVar500._28_4_ = 0x3f800000;
        uVar297 = vcmpps_avx512vl(auVar500,auVar329,1);
        auVar152._8_4_ = 0xbf800000;
        auVar152._0_8_ = 0xbf800000bf800000;
        auVar152._12_4_ = 0xbf800000;
        auVar152._16_4_ = 0xbf800000;
        auVar152._20_4_ = 0xbf800000;
        auVar152._24_4_ = 0xbf800000;
        auVar152._28_4_ = 0xbf800000;
        auVar330 = vblendmps_avx512vl(auVar329,auVar152);
        bVar10 = (byte)uVar297;
        auVar320._0_4_ =
             (uint)(bVar10 & 1) * auVar330._0_4_ | (uint)!(bool)(bVar10 & 1) * in_ZMM2._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar320._4_4_ = (uint)bVar1 * auVar330._4_4_ | (uint)!bVar1 * in_ZMM2._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar320._8_4_ = (uint)bVar1 * auVar330._8_4_ | (uint)!bVar1 * in_ZMM2._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar320._12_4_ = (uint)bVar1 * auVar330._12_4_ | (uint)!bVar1 * in_ZMM2._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar320._16_4_ = (uint)bVar1 * auVar330._16_4_ | (uint)!bVar1 * in_ZMM2._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar320._20_4_ = (uint)bVar1 * auVar330._20_4_ | (uint)!bVar1 * in_ZMM2._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar320._24_4_ = (uint)bVar1 * auVar330._24_4_ | (uint)!bVar1 * in_ZMM2._24_4_;
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar320._28_4_ = (uint)bVar1 * auVar330._28_4_ | (uint)!bVar1 * in_ZMM2._28_4_;
        auVar329 = vdivps_avx512vl(auVar320,auVar329);
        fVar368 = (float)((uint)(bVar10 & 1) * auVar329._0_4_ | !(bool)(bVar10 & 1) * auVar320._0_4_
                         );
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        fVar362 = (float)((uint)bVar1 * auVar329._4_4_ | !bVar1 * auVar320._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        fVar363 = (float)((uint)bVar1 * auVar329._8_4_ | !bVar1 * auVar320._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        fVar364 = (float)((uint)bVar1 * auVar329._12_4_ | !bVar1 * auVar320._12_4_);
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        fVar365 = (float)((uint)bVar1 * auVar329._16_4_ | !bVar1 * auVar320._16_4_);
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        fVar366 = (float)((uint)bVar1 * auVar329._20_4_ | !bVar1 * auVar320._20_4_);
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        fVar367 = (float)((uint)bVar1 * auVar329._24_4_ | !bVar1 * auVar320._24_4_);
        bVar1 = SUB81(uVar297 >> 7,0);
        in_ZMM2 = ZEXT3264(CONCAT428((uint)bVar1 * auVar329._28_4_ | !bVar1 * auVar320._28_4_,
                                     CONCAT424(fVar367,CONCAT420(fVar366,CONCAT416(fVar365,CONCAT412
                                                  (fVar364,CONCAT48(fVar363,CONCAT44(fVar362,fVar368
                                                                                    ))))))));
        fVar385 = fVar368 * fVar368;
        fVar402 = fVar362 * fVar362;
        auVar271._4_4_ = fVar402;
        auVar271._0_4_ = fVar385;
        fVar403 = fVar363 * fVar363;
        auVar271._8_4_ = fVar403;
        fVar404 = fVar364 * fVar364;
        auVar271._12_4_ = fVar404;
        fVar405 = fVar365 * fVar365;
        auVar271._16_4_ = fVar405;
        fVar406 = fVar366 * fVar366;
        auVar271._20_4_ = fVar406;
        iVar294 = in_ZmmResult._28_4_;
        fVar407 = fVar367 * fVar367;
        auVar271._24_4_ = fVar407;
        auVar271._28_4_ = iVar294;
        auVar461._0_4_ = fVar385 * fVar385;
        auVar461._4_4_ = fVar402 * fVar402;
        auVar461._8_4_ = fVar403 * fVar403;
        auVar461._12_4_ = fVar404 * fVar404;
        auVar461._16_4_ = fVar405 * fVar405;
        auVar461._20_4_ = fVar406 * fVar406;
        auVar461._28_36_ = in_ZMM3._28_36_;
        auVar461._24_4_ = fVar407 * fVar407;
        auVar399 = auVar461._0_32_;
        in_ZMM3 = ZEXT3264(auVar399);
        auVar475._8_4_ = 0xbc83a25c;
        auVar475._0_8_ = 0xbc83a25cbc83a25c;
        auVar475._12_4_ = 0xbc83a25c;
        auVar475._16_4_ = 0xbc83a25c;
        auVar475._20_4_ = 0xbc83a25c;
        auVar475._24_4_ = 0xbc83a25c;
        auVar475._28_4_ = 0xbc83a25c;
        auVar153._8_4_ = 0xbd99b01e;
        auVar153._0_8_ = 0xbd99b01ebd99b01e;
        auVar153._12_4_ = 0xbd99b01e;
        auVar153._16_4_ = 0xbd99b01e;
        auVar153._20_4_ = 0xbd99b01e;
        auVar153._24_4_ = 0xbd99b01e;
        auVar153._28_4_ = 0xbd99b01e;
        auVar329 = vfmadd213ps_avx512vl(auVar475,auVar399,auVar153);
        auVar154._8_4_ = 0xbe117200;
        auVar154._0_8_ = 0xbe117200be117200;
        auVar154._12_4_ = 0xbe117200;
        auVar154._16_4_ = 0xbe117200;
        auVar154._20_4_ = 0xbe117200;
        auVar154._24_4_ = 0xbe117200;
        auVar154._28_4_ = 0xbe117200;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar399,auVar154);
        auVar155._8_4_ = 0xbeaaaa53;
        auVar155._0_8_ = 0xbeaaaa53beaaaa53;
        auVar155._12_4_ = 0xbeaaaa53;
        auVar155._16_4_ = 0xbeaaaa53;
        auVar155._20_4_ = 0xbeaaaa53;
        auVar155._24_4_ = 0xbeaaaa53;
        auVar155._28_4_ = 0xbeaaaa53;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar399,auVar155);
        auVar491._8_4_ = 0x3b3ac537;
        auVar491._0_8_ = 0x3b3ac5373b3ac537;
        auVar491._12_4_ = 0x3b3ac537;
        auVar491._16_4_ = 0x3b3ac537;
        auVar491._20_4_ = 0x3b3ac537;
        auVar491._24_4_ = 0x3b3ac537;
        auVar491._28_4_ = 0x3b3ac537;
        auVar156._8_4_ = 0x3d2edd4e;
        auVar156._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar156._12_4_ = 0x3d2edd4e;
        auVar156._16_4_ = 0x3d2edd4e;
        auVar156._20_4_ = 0x3d2edd4e;
        auVar156._24_4_ = 0x3d2edd4e;
        auVar156._28_4_ = 0x3d2edd4e;
        auVar330 = vfmadd213ps_avx512vl(auVar491,auVar399,auVar156);
        auVar157._8_4_ = 0x3dd9ed24;
        auVar157._0_8_ = 0x3dd9ed243dd9ed24;
        auVar157._12_4_ = 0x3dd9ed24;
        auVar157._16_4_ = 0x3dd9ed24;
        auVar157._20_4_ = 0x3dd9ed24;
        auVar157._24_4_ = 0x3dd9ed24;
        auVar157._28_4_ = 0x3dd9ed24;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar399,auVar157);
        auVar158._8_4_ = 0x3e4cb974;
        auVar158._0_8_ = 0x3e4cb9743e4cb974;
        auVar158._12_4_ = 0x3e4cb974;
        auVar158._16_4_ = 0x3e4cb974;
        auVar158._20_4_ = 0x3e4cb974;
        auVar158._24_4_ = 0x3e4cb974;
        auVar158._28_4_ = 0x3e4cb974;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar399,auVar158);
        auVar307 = vfmadd213ps_fma(auVar330,auVar399,auVar500);
        auVar307 = vfmadd231ps_fma(ZEXT1632(auVar307),auVar271,auVar329);
        fVar368 = auVar307._0_4_ * fVar368;
        fVar362 = auVar307._4_4_ * fVar362;
        auVar272._4_4_ = fVar362;
        auVar272._0_4_ = fVar368;
        fVar363 = auVar307._8_4_ * fVar363;
        auVar272._8_4_ = fVar363;
        fVar364 = auVar307._12_4_ * fVar364;
        auVar272._12_4_ = fVar364;
        auVar272._16_4_ = fVar365 * 0.0;
        auVar272._20_4_ = fVar366 * 0.0;
        auVar272._24_4_ = fVar367 * 0.0;
        auVar272._28_4_ = iVar294;
        auVar159._8_4_ = 0x3fc90fdb;
        auVar159._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar159._12_4_ = 0x3fc90fdb;
        auVar159._16_4_ = 0x3fc90fdb;
        auVar159._20_4_ = 0x3fc90fdb;
        auVar159._24_4_ = 0x3fc90fdb;
        auVar159._28_4_ = 0x3fc90fdb;
        auVar329 = vaddps_avx512vl(auVar272,auVar159);
        auVar321._0_4_ =
             (uint)(bVar10 & 1) * auVar329._0_4_ | (uint)!(bool)(bVar10 & 1) * (int)fVar368;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar321._4_4_ = (uint)bVar1 * auVar329._4_4_ | (uint)!bVar1 * (int)fVar362;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar321._8_4_ = (uint)bVar1 * auVar329._8_4_ | (uint)!bVar1 * (int)fVar363;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar321._12_4_ = (uint)bVar1 * auVar329._12_4_ | (uint)!bVar1 * (int)fVar364;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar321._16_4_ = (uint)bVar1 * auVar329._16_4_ | (uint)!bVar1 * (int)(fVar365 * 0.0);
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar321._20_4_ = (uint)bVar1 * auVar329._20_4_ | (uint)!bVar1 * (int)(fVar366 * 0.0);
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar321._24_4_ = (uint)bVar1 * auVar329._24_4_ | (uint)!bVar1 * (int)(fVar367 * 0.0);
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar321._28_4_ = (uint)bVar1 * auVar329._28_4_ | (uint)!bVar1 * iVar294;
        auVar160._8_4_ = 0x80000000;
        auVar160._0_8_ = 0x8000000080000000;
        auVar160._12_4_ = 0x80000000;
        auVar160._16_4_ = 0x80000000;
        auVar160._20_4_ = 0x80000000;
        auVar160._24_4_ = 0x80000000;
        auVar160._28_4_ = 0x80000000;
        in_ZmmResult._0_32_ =
             vpternlogd_avx512vl(auVar321,*(undefined1 (*) [32])*pauVar295,auVar160,0xf8);
        *(undefined1 (*) [32])*pauVar295 = in_ZmmResult._0_32_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar42._8_4_ = 0x7fffffff;
        auVar42._0_8_ = 0x7fffffff7fffffff;
        auVar42._12_4_ = 0x7fffffff;
        auVar307 = vandps_avx512vl(*(undefined1 (*) [16])*pauVar295,auVar42);
        auVar496._8_4_ = 0x3f800000;
        auVar496._0_8_ = 0x3f8000003f800000;
        auVar496._12_4_ = 0x3f800000;
        uVar297 = vcmpps_avx512vl(auVar496,auVar307,1);
        auVar43._8_4_ = 0xbf800000;
        auVar43._0_8_ = 0xbf800000bf800000;
        auVar43._12_4_ = 0xbf800000;
        auVar308 = vblendmps_avx512vl(auVar307,auVar43);
        bVar10 = (byte)uVar297;
        auVar299._0_4_ =
             (uint)(bVar10 & 1) * auVar308._0_4_ | (uint)!(bool)(bVar10 & 1) * in_ZMM2._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar299._4_4_ = (uint)bVar1 * auVar308._4_4_ | (uint)!bVar1 * in_ZMM2._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar299._8_4_ = (uint)bVar1 * auVar308._8_4_ | (uint)!bVar1 * in_ZMM2._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar299._12_4_ = (uint)bVar1 * auVar308._12_4_ | (uint)!bVar1 * in_ZMM2._12_4_;
        auVar307 = vdivps_avx512vl(auVar299,auVar307);
        fVar368 = (float)((uint)(bVar10 & 1) * auVar307._0_4_ | !(bool)(bVar10 & 1) * auVar299._0_4_
                         );
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        fVar362 = (float)((uint)bVar1 * auVar307._4_4_ | !bVar1 * auVar299._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        fVar363 = (float)((uint)bVar1 * auVar307._8_4_ | !bVar1 * auVar299._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        fVar364 = (float)((uint)bVar1 * auVar307._12_4_ | !bVar1 * auVar299._12_4_);
        in_ZMM2 = ZEXT1664(CONCAT412(fVar364,CONCAT48(fVar363,CONCAT44(fVar362,fVar368))));
        auVar388._0_4_ = fVar368 * fVar368;
        auVar388._4_4_ = fVar362 * fVar362;
        auVar388._8_4_ = fVar363 * fVar363;
        auVar388._12_4_ = fVar364 * fVar364;
        auVar432._0_4_ = auVar388._0_4_ * auVar388._0_4_;
        auVar432._4_4_ = auVar388._4_4_ * auVar388._4_4_;
        auVar432._8_4_ = auVar388._8_4_ * auVar388._8_4_;
        auVar432._12_4_ = auVar388._12_4_ * auVar388._12_4_;
        in_ZMM3 = ZEXT1664(auVar432);
        auVar464._8_4_ = 0xbc83a25c;
        auVar464._0_8_ = 0xbc83a25cbc83a25c;
        auVar464._12_4_ = 0xbc83a25c;
        auVar44._8_4_ = 0xbd99b01e;
        auVar44._0_8_ = 0xbd99b01ebd99b01e;
        auVar44._12_4_ = 0xbd99b01e;
        auVar307 = vfmadd213ps_avx512vl(auVar464,auVar432,auVar44);
        auVar45._8_4_ = 0xbe117200;
        auVar45._0_8_ = 0xbe117200be117200;
        auVar45._12_4_ = 0xbe117200;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar432,auVar45);
        auVar46._8_4_ = 0xbeaaaa53;
        auVar46._0_8_ = 0xbeaaaa53beaaaa53;
        auVar46._12_4_ = 0xbeaaaa53;
        auVar308 = vfmadd213ps_avx512vl(auVar307,auVar432,auVar46);
        auVar485._8_4_ = 0x3b3ac537;
        auVar485._0_8_ = 0x3b3ac5373b3ac537;
        auVar485._12_4_ = 0x3b3ac537;
        auVar47._8_4_ = 0x3d2edd4e;
        auVar47._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar47._12_4_ = 0x3d2edd4e;
        auVar307 = vfmadd213ps_avx512vl(auVar485,auVar432,auVar47);
        auVar48._8_4_ = 0x3dd9ed24;
        auVar48._0_8_ = 0x3dd9ed243dd9ed24;
        auVar48._12_4_ = 0x3dd9ed24;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar432,auVar48);
        auVar49._8_4_ = 0x3e4cb974;
        auVar49._0_8_ = 0x3e4cb9743e4cb974;
        auVar49._12_4_ = 0x3e4cb974;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar432,auVar49);
        auVar307 = vfmadd213ps_fma(auVar307,auVar432,auVar496);
        auVar307 = vfmadd231ps_fma(auVar307,auVar388,auVar308);
        auVar389._0_4_ = auVar307._0_4_ * fVar368;
        auVar389._4_4_ = auVar307._4_4_ * fVar362;
        auVar389._8_4_ = auVar307._8_4_ * fVar363;
        auVar389._12_4_ = auVar307._12_4_ * fVar364;
        auVar50._8_4_ = 0x3fc90fdb;
        auVar50._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar50._12_4_ = 0x3fc90fdb;
        auVar307 = vaddps_avx512vl(auVar389,auVar50);
        auVar300._0_4_ =
             (uint)(bVar10 & 1) * auVar307._0_4_ | (uint)!(bool)(bVar10 & 1) * (int)auVar389._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar300._4_4_ = (uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * (int)auVar389._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar300._8_4_ = (uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * (int)auVar389._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar300._12_4_ = (uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * (int)auVar389._12_4_;
        auVar51._8_4_ = 0x80000000;
        auVar51._0_8_ = 0x8000000080000000;
        auVar51._12_4_ = 0x80000000;
        in_ZmmResult._0_16_ =
             vpternlogd_avx512vl(auVar300,*(undefined1 (*) [16])*pauVar295,auVar51,0xf8);
        *(undefined1 (*) [16])*pauVar295 = in_ZmmResult._0_16_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        fVar368 = atanf(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 0xf:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    auVar380._8_4_ = 0x3f800000;
    auVar380._0_8_ = 0x3f8000003f800000;
    auVar380._12_4_ = 0x3f800000;
    auVar380._16_4_ = 0x3f800000;
    auVar380._20_4_ = 0x3f800000;
    auVar380._24_4_ = 0x3f800000;
    auVar380._28_4_ = 0x3f800000;
    auVar414._8_4_ = 0x3f800000;
    auVar414._0_8_ = 0x3f8000003f800000;
    auVar414._12_4_ = 0x3f800000;
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar361 = vdivps_avx512f((undefined1  [64])afVar290,*pauVar295);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = vdivps_avx(auVar380,*(undefined1 (*) [32])*pauVar295);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar307 = vdivps_avx(auVar414,*(undefined1 (*) [16])*pauVar295);
        *(undefined1 (*) [16])*pauVar295 = auVar307;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        *(float *)*pauVar295 = 1.0 / *(float *)*pauVar295;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 0x10:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    auVar361 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar352 = vxorps_avx512dq(auVar361,(undefined1  [64])_ps512_cephes_log_q2);
    auVar361 = vxorps_avx512dq(auVar361,(undefined1  [64])_ps512_cephes_log_q1);
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    auVar355 = auVar361;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar353 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        auVar354 = vmulps_avx512f(auVar353,*pauVar295);
        auVar354 = vminps_avx512f(auVar354,(undefined1  [64])::_ps512_exp_hi);
        auVar354 = vmaxps_avx512f(auVar354,(undefined1  [64])::_ps512_exp_lo);
        auVar355 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar354,
                                       (undefined1  [64])::_ps512_cephes_exp_p5);
        auVar339 = vrndscaleps_avx512f(auVar355,1);
        uVar297 = vcmpps_avx512f(auVar355,auVar339,1);
        auVar355 = vsubps_avx512f(auVar339,(undefined1  [64])::_ps512_1);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar342._0_4_ = (uint)bVar1 * auVar355._0_4_ | (uint)!bVar1 * auVar339._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar342._4_4_ = (uint)bVar1 * auVar355._4_4_ | (uint)!bVar1 * auVar339._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar342._8_4_ = (uint)bVar1 * auVar355._8_4_ | (uint)!bVar1 * auVar339._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar342._12_4_ = (uint)bVar1 * auVar355._12_4_ | (uint)!bVar1 * auVar339._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar342._16_4_ = (uint)bVar1 * auVar355._16_4_ | (uint)!bVar1 * auVar339._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar342._20_4_ = (uint)bVar1 * auVar355._20_4_ | (uint)!bVar1 * auVar339._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar342._24_4_ = (uint)bVar1 * auVar355._24_4_ | (uint)!bVar1 * auVar339._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar342._28_4_ = (uint)bVar1 * auVar355._28_4_ | (uint)!bVar1 * auVar339._28_4_;
        bVar1 = (bool)((byte)(uVar297 >> 8) & 1);
        auVar342._32_4_ = (uint)bVar1 * auVar355._32_4_ | (uint)!bVar1 * auVar339._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar342._36_4_ = (uint)bVar1 * auVar355._36_4_ | (uint)!bVar1 * auVar339._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar342._40_4_ = (uint)bVar1 * auVar355._40_4_ | (uint)!bVar1 * auVar339._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar342._44_4_ = (uint)bVar1 * auVar355._44_4_ | (uint)!bVar1 * auVar339._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar342._48_4_ = (uint)bVar1 * auVar355._48_4_ | (uint)!bVar1 * auVar339._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar342._52_4_ = (uint)bVar1 * auVar355._52_4_ | (uint)!bVar1 * auVar339._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar342._56_4_ = (uint)bVar1 * auVar355._56_4_ | (uint)!bVar1 * auVar339._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar342._60_4_ = (uint)bVar1 * auVar355._60_4_ | (uint)!bVar1 * auVar339._60_4_;
        auVar354 = vfmadd231ps_avx512f(auVar354,auVar342,auVar352);
        auVar354 = vfmadd231ps_avx512f(auVar354,auVar342,auVar361);
        auVar355 = vmulps_avx512f(auVar354,auVar354);
        auVar339 = vfmadd132ps_avx512f(auVar354,(undefined1  [64])::_ps512_cephes_exp_p1,
                                       (undefined1  [64])::_ps512_cephes_exp_p0);
        auVar339 = vfmadd213ps_avx512f(auVar339,auVar354,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar339 = vfmadd213ps_avx512f(auVar339,auVar354,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar339 = vfmadd213ps_avx512f(auVar339,auVar354,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar339 = vfmadd213ps_avx512f(auVar339,auVar354,(undefined1  [64])::_ps512_cephes_exp_p5);
        auVar354 = vfmadd213ps_avx512f(auVar339,auVar355,auVar354);
        auVar354 = vaddps_avx512f(auVar354,(undefined1  [64])::_ps512_1);
        auVar355 = vcvttps2dq_avx512f(auVar342);
        auVar355 = vpaddd_avx512f(auVar355,(undefined1  [64])::_pi32_512_0x7f);
        auVar355 = vpslld_avx512f(auVar355,0x17);
        auVar339 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar354 = vfmadd213ps_avx512f(auVar355,auVar354,auVar339);
        auVar354 = vdivps_avx512f(auVar339,auVar354);
        auVar355 = vfnmsub213ps_avx512f(auVar354,auVar353,auVar339);
        *pauVar295 = auVar355;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar474._8_4_ = 0xc0000000;
        auVar474._0_8_ = 0xc0000000c0000000;
        auVar474._12_4_ = 0xc0000000;
        auVar474._16_4_ = 0xc0000000;
        auVar474._20_4_ = 0xc0000000;
        auVar474._24_4_ = 0xc0000000;
        auVar474._28_4_ = 0xc0000000;
        auVar343._0_4_ = *(float *)*pauVar295 * -2.0;
        auVar343._4_4_ = *(float *)(*pauVar295 + 4) * -2.0;
        auVar343._8_4_ = *(float *)(*pauVar295 + 8) * -2.0;
        auVar343._12_4_ = *(float *)(*pauVar295 + 0xc) * -2.0;
        auVar343._16_4_ = *(float *)(*pauVar295 + 0x10) * -2.0;
        auVar343._20_4_ = *(float *)(*pauVar295 + 0x14) * -2.0;
        auVar343._28_36_ = auVar355._28_36_;
        auVar343._24_4_ = *(float *)(*pauVar295 + 0x18) * -2.0;
        auVar141._8_4_ = 0x42b0c0a5;
        auVar141._0_8_ = 0x42b0c0a542b0c0a5;
        auVar141._12_4_ = 0x42b0c0a5;
        auVar141._16_4_ = 0x42b0c0a5;
        auVar141._20_4_ = 0x42b0c0a5;
        auVar141._24_4_ = 0x42b0c0a5;
        auVar141._28_4_ = 0x42b0c0a5;
        auVar329 = vminps_avx512vl(auVar343._0_32_,auVar141);
        auVar142._8_4_ = 0xc2b0c0a5;
        auVar142._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar142._12_4_ = 0xc2b0c0a5;
        auVar142._16_4_ = 0xc2b0c0a5;
        auVar142._20_4_ = 0xc2b0c0a5;
        auVar142._24_4_ = 0xc2b0c0a5;
        auVar142._28_4_ = 0xc2b0c0a5;
        auVar330 = vmaxps_avx512vl(auVar329,auVar142);
        auVar490._8_4_ = 0x3f000000;
        auVar490._0_8_ = 0x3f0000003f000000;
        auVar490._12_4_ = 0x3f000000;
        auVar490._16_4_ = 0x3f000000;
        auVar490._20_4_ = 0x3f000000;
        auVar490._24_4_ = 0x3f000000;
        auVar490._28_4_ = 0x3f000000;
        auVar143._8_4_ = 0x3fb8aa3b;
        auVar143._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar143._12_4_ = 0x3fb8aa3b;
        auVar143._16_4_ = 0x3fb8aa3b;
        auVar143._20_4_ = 0x3fb8aa3b;
        auVar143._24_4_ = 0x3fb8aa3b;
        auVar143._28_4_ = 0x3fb8aa3b;
        auVar399 = vfmadd231ps_avx512vl(auVar490,auVar330,auVar143);
        auVar329 = vroundps_avx(auVar399,1);
        uVar297 = vcmpps_avx512vl(auVar399,auVar329,1);
        auVar499._8_4_ = 0x3f800000;
        auVar499._0_8_ = 0x3f8000003f800000;
        auVar499._12_4_ = 0x3f800000;
        auVar499._16_4_ = 0x3f800000;
        auVar499._20_4_ = 0x3f800000;
        auVar499._24_4_ = 0x3f800000;
        auVar499._28_4_ = 0x3f800000;
        auVar318 = vsubps_avx512vl(auVar329,auVar499);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar319._0_4_ = (float)((uint)bVar1 * auVar318._0_4_ | (uint)!bVar1 * auVar329._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar319._4_4_ = (float)((uint)bVar1 * auVar318._4_4_ | (uint)!bVar1 * auVar329._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar319._8_4_ = (float)((uint)bVar1 * auVar318._8_4_ | (uint)!bVar1 * auVar329._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar319._12_4_ = (float)((uint)bVar1 * auVar318._12_4_ | (uint)!bVar1 * auVar329._12_4_);
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar319._16_4_ = (float)((uint)bVar1 * auVar318._16_4_ | (uint)!bVar1 * auVar329._16_4_);
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar319._20_4_ = (float)((uint)bVar1 * auVar318._20_4_ | (uint)!bVar1 * auVar329._20_4_);
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar319._24_4_ = (float)((uint)bVar1 * auVar318._24_4_ | (uint)!bVar1 * auVar329._24_4_);
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar319._28_4_ = (float)((uint)bVar1 * auVar318._28_4_ | (uint)!bVar1 * auVar329._28_4_);
        auVar144._8_4_ = 0x3f318000;
        auVar144._0_8_ = 0x3f3180003f318000;
        auVar144._12_4_ = 0x3f318000;
        auVar144._16_4_ = 0x3f318000;
        auVar144._20_4_ = 0x3f318000;
        auVar144._24_4_ = 0x3f318000;
        auVar144._28_4_ = 0x3f318000;
        auVar329 = vfmsub231ps_avx512vl(auVar330,auVar319,auVar144);
        auVar145._8_4_ = 0x395e8083;
        auVar145._0_8_ = 0x395e8083395e8083;
        auVar145._12_4_ = 0x395e8083;
        auVar145._16_4_ = 0x395e8083;
        auVar145._20_4_ = 0x395e8083;
        auVar145._24_4_ = 0x395e8083;
        auVar145._28_4_ = 0x395e8083;
        auVar329 = vfmsub231ps_avx512vl(auVar329,auVar319,auVar145);
        auVar270._4_4_ = auVar329._4_4_ * auVar329._4_4_;
        auVar270._0_4_ = auVar329._0_4_ * auVar329._0_4_;
        auVar270._8_4_ = auVar329._8_4_ * auVar329._8_4_;
        auVar270._12_4_ = auVar329._12_4_ * auVar329._12_4_;
        auVar270._16_4_ = auVar329._16_4_ * auVar329._16_4_;
        auVar270._20_4_ = auVar329._20_4_ * auVar329._20_4_;
        auVar270._24_4_ = auVar329._24_4_ * auVar329._24_4_;
        auVar270._28_4_ = auVar399._28_4_;
        auVar450._8_4_ = 0x39506967;
        auVar450._0_8_ = 0x3950696739506967;
        auVar450._12_4_ = 0x39506967;
        auVar450._16_4_ = 0x39506967;
        auVar450._20_4_ = 0x39506967;
        auVar450._24_4_ = 0x39506967;
        auVar450._28_4_ = 0x39506967;
        auVar146._8_4_ = 0x3ab743ce;
        auVar146._0_8_ = 0x3ab743ce3ab743ce;
        auVar146._12_4_ = 0x3ab743ce;
        auVar146._16_4_ = 0x3ab743ce;
        auVar146._20_4_ = 0x3ab743ce;
        auVar146._24_4_ = 0x3ab743ce;
        auVar146._28_4_ = 0x3ab743ce;
        auVar330 = vfmadd213ps_avx512vl(auVar450,auVar329,auVar146);
        auVar147._8_4_ = 0x3c088908;
        auVar147._0_8_ = 0x3c0889083c088908;
        auVar147._12_4_ = 0x3c088908;
        auVar147._16_4_ = 0x3c088908;
        auVar147._20_4_ = 0x3c088908;
        auVar147._24_4_ = 0x3c088908;
        auVar147._28_4_ = 0x3c088908;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar329,auVar147);
        auVar148._8_4_ = 0x3d2aa9c1;
        auVar148._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar148._12_4_ = 0x3d2aa9c1;
        auVar148._16_4_ = 0x3d2aa9c1;
        auVar148._20_4_ = 0x3d2aa9c1;
        auVar148._24_4_ = 0x3d2aa9c1;
        auVar148._28_4_ = 0x3d2aa9c1;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar329,auVar148);
        auVar149._8_4_ = 0x3e2aaaaa;
        auVar149._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar149._12_4_ = 0x3e2aaaaa;
        auVar149._16_4_ = 0x3e2aaaaa;
        auVar149._20_4_ = 0x3e2aaaaa;
        auVar149._24_4_ = 0x3e2aaaaa;
        auVar149._28_4_ = 0x3e2aaaaa;
        auVar330 = vfmadd213ps_avx512vl(auVar330,auVar329,auVar149);
        auVar307 = vfmadd213ps_fma(auVar330,auVar329,auVar490);
        auVar307 = vfmadd213ps_fma(ZEXT1632(auVar307),auVar270,auVar329);
        auVar379._0_4_ = auVar307._0_4_ + 1.0;
        auVar379._4_4_ = auVar307._4_4_ + 1.0;
        auVar379._8_4_ = auVar307._8_4_ + 1.0;
        auVar379._12_4_ = auVar307._12_4_ + 1.0;
        auVar379._16_4_ = 0x3f800000;
        auVar379._20_4_ = 0x3f800000;
        auVar379._24_4_ = 0x3f800000;
        auVar379._28_4_ = 0x3f800000;
        auVar398._0_4_ = (int)auVar319._0_4_;
        auVar398._4_4_ = (int)auVar319._4_4_;
        auVar398._8_4_ = (int)auVar319._8_4_;
        auVar398._12_4_ = (int)auVar319._12_4_;
        auVar398._16_4_ = (int)auVar319._16_4_;
        auVar398._20_4_ = (int)auVar319._20_4_;
        auVar398._24_4_ = (int)auVar319._24_4_;
        auVar398._28_4_ = (int)auVar319._28_4_;
        auVar329 = vpslld_avx2(auVar398,0x17);
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = 0x3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar150._16_4_ = 0x3f800000;
        auVar150._20_4_ = 0x3f800000;
        auVar150._24_4_ = 0x3f800000;
        auVar150._28_4_ = 0x3f800000;
        auVar329 = vpaddd_avx512vl(auVar329,auVar150);
        auVar307 = vfmadd213ps_fma(auVar329,auVar379,auVar499);
        auVar329 = vdivps_avx(auVar499,ZEXT1632(auVar307));
        auVar307 = vfnmsub213ps_fma(auVar329,auVar474,auVar499);
        auVar355 = ZEXT1664(auVar307);
        *(undefined1 (*) [32])*pauVar295 = ZEXT1632(auVar307);
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar369._0_4_ = *(float *)*pauVar295 * -2.0;
        auVar369._4_4_ = *(float *)(*pauVar295 + 4) * -2.0;
        auVar369._8_4_ = *(float *)(*pauVar295 + 8) * -2.0;
        auVar369._12_4_ = *(float *)(*pauVar295 + 0xc) * -2.0;
        auVar31._8_4_ = 0x42b0c0a5;
        auVar31._0_8_ = 0x42b0c0a542b0c0a5;
        auVar31._12_4_ = 0x42b0c0a5;
        auVar307 = vminps_avx512vl(auVar369,auVar31);
        auVar32._8_4_ = 0xc2b0c0a5;
        auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar32._12_4_ = 0xc2b0c0a5;
        auVar308 = vmaxps_avx512vl(auVar307,auVar32);
        auVar463._8_4_ = 0x3f000000;
        auVar463._0_8_ = 0x3f0000003f000000;
        auVar463._12_4_ = 0x3f000000;
        auVar33._8_4_ = 0x3fb8aa3b;
        auVar33._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar33._12_4_ = 0x3fb8aa3b;
        auVar392 = vfmadd231ps_avx512vl(auVar463,auVar308,auVar33);
        auVar409._0_4_ = (int)auVar392._0_4_;
        auVar409._4_4_ = (int)auVar392._4_4_;
        auVar409._8_4_ = (int)auVar392._8_4_;
        auVar409._12_4_ = (int)auVar392._12_4_;
        auVar307 = vcvtdq2ps_avx(auVar409);
        uVar297 = vcmpps_avx512vl(auVar392,auVar307,1);
        auVar484._8_4_ = 0x3f800000;
        auVar484._0_8_ = 0x3f8000003f800000;
        auVar484._12_4_ = 0x3f800000;
        auVar392 = vsubps_avx512vl(auVar307,auVar484);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar298._0_4_ = (float)((uint)bVar1 * auVar392._0_4_ | (uint)!bVar1 * auVar307._0_4_);
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar298._4_4_ = (float)((uint)bVar1 * auVar392._4_4_ | (uint)!bVar1 * auVar307._4_4_);
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar298._8_4_ = (float)((uint)bVar1 * auVar392._8_4_ | (uint)!bVar1 * auVar307._8_4_);
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar298._12_4_ = (float)((uint)bVar1 * auVar392._12_4_ | (uint)!bVar1 * auVar307._12_4_);
        auVar34._8_4_ = 0x3f318000;
        auVar34._0_8_ = 0x3f3180003f318000;
        auVar34._12_4_ = 0x3f318000;
        auVar307 = vfmsub231ps_avx512vl(auVar308,auVar298,auVar34);
        auVar35._8_4_ = 0x395e8083;
        auVar35._0_8_ = 0x395e8083395e8083;
        auVar35._12_4_ = 0x395e8083;
        auVar308 = vfmsub231ps_avx512vl(auVar307,auVar298,auVar35);
        auVar386._0_4_ = auVar308._0_4_ * auVar308._0_4_;
        auVar386._4_4_ = auVar308._4_4_ * auVar308._4_4_;
        auVar386._8_4_ = auVar308._8_4_ * auVar308._8_4_;
        auVar386._12_4_ = auVar308._12_4_ * auVar308._12_4_;
        auVar431._8_4_ = 0x39506967;
        auVar431._0_8_ = 0x3950696739506967;
        auVar431._12_4_ = 0x39506967;
        auVar36._8_4_ = 0x3ab743ce;
        auVar36._0_8_ = 0x3ab743ce3ab743ce;
        auVar36._12_4_ = 0x3ab743ce;
        auVar307 = vfmadd213ps_avx512vl(auVar431,auVar308,auVar36);
        auVar37._8_4_ = 0x3c088908;
        auVar37._0_8_ = 0x3c0889083c088908;
        auVar37._12_4_ = 0x3c088908;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar308,auVar37);
        auVar38._8_4_ = 0x3d2aa9c1;
        auVar38._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar38._12_4_ = 0x3d2aa9c1;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar308,auVar38);
        auVar39._8_4_ = 0x3e2aaaaa;
        auVar39._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar39._12_4_ = 0x3e2aaaaa;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar308,auVar39);
        auVar307 = vfmadd213ps_fma(auVar307,auVar308,auVar463);
        auVar307 = vfmadd213ps_fma(auVar307,auVar386,auVar308);
        auVar370._0_4_ = auVar307._0_4_ + 1.0;
        auVar370._4_4_ = auVar307._4_4_ + 1.0;
        auVar370._8_4_ = auVar307._8_4_ + 1.0;
        auVar370._12_4_ = auVar307._12_4_ + 1.0;
        auVar387._0_4_ = (int)auVar298._0_4_;
        auVar387._4_4_ = (int)auVar298._4_4_;
        auVar387._8_4_ = (int)auVar298._8_4_;
        auVar387._12_4_ = (int)auVar298._12_4_;
        auVar307 = vpslld_avx(auVar387,0x17);
        auVar40._8_4_ = 0x3f800000;
        auVar40._0_8_ = 0x3f8000003f800000;
        auVar40._12_4_ = 0x3f800000;
        auVar307 = vpaddd_avx512vl(auVar307,auVar40);
        auVar307 = vfmadd213ps_fma(auVar307,auVar370,auVar484);
        auVar371._8_4_ = 0x40000000;
        auVar371._0_8_ = 0x4000000040000000;
        auVar371._12_4_ = 0x40000000;
        auVar307 = vdivps_avx(auVar371,auVar307);
        auVar41._8_4_ = 0xbf800000;
        auVar41._0_8_ = 0xbf800000bf800000;
        auVar41._12_4_ = 0xbf800000;
        auVar307 = vaddps_avx512vl(auVar307,auVar41);
        auVar355 = ZEXT1664(auVar307);
        *(undefined1 (*) [16])*pauVar295 = auVar307;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        auVar355._0_4_ = tanhf(*(float *)*pauVar295);
        auVar355._4_60_ = extraout_var;
        *(float *)*pauVar295 = auVar355._0_4_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 0x11:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    auVar361._8_4_ = 0x80000000;
    auVar361._0_8_ = 0x8000000080000000;
    auVar361._12_4_ = 0x80000000;
    auVar361._16_4_ = 0x80000000;
    auVar361._20_4_ = 0x80000000;
    auVar361._24_4_ = 0x80000000;
    auVar361._28_4_ = 0x80000000;
    auVar361._32_4_ = 0x80000000;
    auVar361._36_4_ = 0x80000000;
    auVar361._40_4_ = 0x80000000;
    auVar361._44_4_ = 0x80000000;
    auVar361._48_4_ = 0x80000000;
    auVar361._52_4_ = 0x80000000;
    auVar361._56_4_ = 0x80000000;
    auVar361._60_4_ = 0x80000000;
    auVar361 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar361);
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        uVar297 = vcmpps_avx512f(*pauVar295,_DAT_0054e200,2);
        auVar352 = vmaxps_avx512f(*pauVar295,(undefined1  [64])_ps512_min_norm_pos);
        auVar353 = vpsrld_avx512f(auVar352,0x17);
        auVar353 = vpsubd_avx512f(auVar353,(undefined1  [64])::_pi32_512_0x7f);
        auVar354 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar352 = vpternlogd_avx512f(auVar352,auVar354,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        auVar353 = vcvtdq2ps_avx512f(auVar353);
        uVar19 = vcmpps_avx512f(auVar352,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar354 = vsubps_avx512f(auVar352,(undefined1  [64])::_ps512_1);
        auVar355 = vaddps_avx512f(auVar353,(undefined1  [64])::_ps512_1);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar339._0_4_ = (uint)bVar1 * auVar353._0_4_ | (uint)!bVar1 * auVar355._0_4_;
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar339._4_4_ = (uint)bVar1 * auVar353._4_4_ | (uint)!bVar1 * auVar355._4_4_;
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar339._8_4_ = (uint)bVar1 * auVar353._8_4_ | (uint)!bVar1 * auVar355._8_4_;
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar339._12_4_ = (uint)bVar1 * auVar353._12_4_ | (uint)!bVar1 * auVar355._12_4_;
        bVar1 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar339._16_4_ = (uint)bVar1 * auVar353._16_4_ | (uint)!bVar1 * auVar355._16_4_;
        bVar1 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar339._20_4_ = (uint)bVar1 * auVar353._20_4_ | (uint)!bVar1 * auVar355._20_4_;
        bVar1 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar339._24_4_ = (uint)bVar1 * auVar353._24_4_ | (uint)!bVar1 * auVar355._24_4_;
        bVar1 = (bool)((byte)(uVar19 >> 7) & 1);
        auVar339._28_4_ = (uint)bVar1 * auVar353._28_4_ | (uint)!bVar1 * auVar355._28_4_;
        bVar10 = (byte)(uVar19 >> 8);
        bVar1 = (bool)(bVar10 & 1);
        auVar339._32_4_ = (uint)bVar1 * auVar353._32_4_ | (uint)!bVar1 * auVar355._32_4_;
        bVar1 = (bool)((byte)(uVar19 >> 9) & 1);
        auVar339._36_4_ = (uint)bVar1 * auVar353._36_4_ | (uint)!bVar1 * auVar355._36_4_;
        bVar1 = (bool)((byte)(uVar19 >> 10) & 1);
        auVar339._40_4_ = (uint)bVar1 * auVar353._40_4_ | (uint)!bVar1 * auVar355._40_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xb) & 1);
        auVar339._44_4_ = (uint)bVar1 * auVar353._44_4_ | (uint)!bVar1 * auVar355._44_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xc) & 1);
        auVar339._48_4_ = (uint)bVar1 * auVar353._48_4_ | (uint)!bVar1 * auVar355._48_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xd) & 1);
        auVar339._52_4_ = (uint)bVar1 * auVar353._52_4_ | (uint)!bVar1 * auVar355._52_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xe) & 1);
        auVar339._56_4_ = (uint)bVar1 * auVar353._56_4_ | (uint)!bVar1 * auVar355._56_4_;
        bVar1 = SUB81(uVar19 >> 0xf,0);
        auVar339._60_4_ = (uint)bVar1 * auVar353._60_4_ | (uint)!bVar1 * auVar355._60_4_;
        auVar352 = vaddps_avx512f(auVar354,auVar352);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar353._0_4_ = (uint)bVar1 * auVar352._0_4_ | (uint)!bVar1 * auVar354._0_4_;
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar353._4_4_ = (uint)bVar1 * auVar352._4_4_ | (uint)!bVar1 * auVar354._4_4_;
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar353._8_4_ = (uint)bVar1 * auVar352._8_4_ | (uint)!bVar1 * auVar354._8_4_;
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar353._12_4_ = (uint)bVar1 * auVar352._12_4_ | (uint)!bVar1 * auVar354._12_4_;
        bVar1 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar353._16_4_ = (uint)bVar1 * auVar352._16_4_ | (uint)!bVar1 * auVar354._16_4_;
        bVar1 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar353._20_4_ = (uint)bVar1 * auVar352._20_4_ | (uint)!bVar1 * auVar354._20_4_;
        bVar1 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar353._24_4_ = (uint)bVar1 * auVar352._24_4_ | (uint)!bVar1 * auVar354._24_4_;
        bVar1 = (bool)((byte)(uVar19 >> 7) & 1);
        auVar353._28_4_ = (uint)bVar1 * auVar352._28_4_ | (uint)!bVar1 * auVar354._28_4_;
        bVar1 = (bool)(bVar10 & 1);
        auVar353._32_4_ = (uint)bVar1 * auVar352._32_4_ | (uint)!bVar1 * auVar354._32_4_;
        bVar1 = (bool)((byte)(uVar19 >> 9) & 1);
        auVar353._36_4_ = (uint)bVar1 * auVar352._36_4_ | (uint)!bVar1 * auVar354._36_4_;
        bVar1 = (bool)((byte)(uVar19 >> 10) & 1);
        auVar353._40_4_ = (uint)bVar1 * auVar352._40_4_ | (uint)!bVar1 * auVar354._40_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xb) & 1);
        auVar353._44_4_ = (uint)bVar1 * auVar352._44_4_ | (uint)!bVar1 * auVar354._44_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xc) & 1);
        auVar353._48_4_ = (uint)bVar1 * auVar352._48_4_ | (uint)!bVar1 * auVar354._48_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xd) & 1);
        auVar353._52_4_ = (uint)bVar1 * auVar352._52_4_ | (uint)!bVar1 * auVar354._52_4_;
        bVar1 = (bool)((byte)(uVar19 >> 0xe) & 1);
        auVar353._56_4_ = (uint)bVar1 * auVar352._56_4_ | (uint)!bVar1 * auVar354._56_4_;
        bVar1 = SUB81(uVar19 >> 0xf,0);
        auVar353._60_4_ = (uint)bVar1 * auVar352._60_4_ | (uint)!bVar1 * auVar354._60_4_;
        auVar352 = vmulps_avx512f(auVar353,auVar353);
        auVar354 = vfmadd132ps_avx512f(auVar353,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar354 = vfmadd213ps_avx512f(auVar354,auVar353,(undefined1  [64])_ps512_cephes_log_p2);
        auVar354 = vfmadd213ps_avx512f(auVar354,auVar353,(undefined1  [64])_ps512_cephes_log_p3);
        auVar354 = vfmadd213ps_avx512f(auVar354,auVar353,(undefined1  [64])_ps512_cephes_log_p4);
        auVar354 = vfmadd213ps_avx512f(auVar354,auVar353,(undefined1  [64])_ps512_cephes_log_p5);
        auVar354 = vfmadd213ps_avx512f(auVar354,auVar353,(undefined1  [64])_ps512_cephes_log_p6);
        auVar354 = vfmadd213ps_avx512f(auVar354,auVar353,(undefined1  [64])_ps512_cephes_log_p7);
        auVar354 = vfmadd213ps_avx512f(auVar354,auVar353,(undefined1  [64])_ps512_cephes_log_p8);
        auVar355 = vmulps_avx512f(auVar352,auVar353);
        auVar353 = vfmadd213ps_avx512f(auVar355,auVar354,auVar353);
        auVar353 = vfmadd231ps_avx512f(auVar353,auVar339,(undefined1  [64])_ps512_cephes_log_q1);
        auVar352 = vfmadd231ps_avx512f(auVar353,auVar352,auVar361);
        auVar353 = vfmadd231ps_avx512f(auVar352,auVar339,(undefined1  [64])_ps512_cephes_log_q2);
        auVar352._8_4_ = 0x3ede5bd9;
        auVar352._0_8_ = 0x3ede5bd93ede5bd9;
        auVar352._12_4_ = 0x3ede5bd9;
        auVar352._16_4_ = 0x3ede5bd9;
        auVar352._20_4_ = 0x3ede5bd9;
        auVar352._24_4_ = 0x3ede5bd9;
        auVar352._28_4_ = 0x3ede5bd9;
        auVar352._32_4_ = 0x3ede5bd9;
        auVar352._36_4_ = 0x3ede5bd9;
        auVar352._40_4_ = 0x3ede5bd9;
        auVar352._44_4_ = 0x3ede5bd9;
        auVar352._48_4_ = 0x3ede5bd9;
        auVar352._52_4_ = 0x3ede5bd9;
        auVar352._56_4_ = 0x3ede5bd9;
        auVar352._60_4_ = 0x3ede5bd9;
        auVar352 = vmulps_avx512f(auVar353,auVar352);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar354._0_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar354._4_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar354._8_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar354._12_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar354._16_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar354._20_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar354._24_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._24_4_;
        bVar1 = (bool)((byte)(uVar297 >> 7) & 1);
        auVar354._28_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._28_4_;
        bVar1 = (bool)((byte)(uVar297 >> 8) & 1);
        auVar354._32_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._32_4_;
        bVar1 = (bool)((byte)(uVar297 >> 9) & 1);
        auVar354._36_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._36_4_;
        bVar1 = (bool)((byte)(uVar297 >> 10) & 1);
        auVar354._40_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._40_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xb) & 1);
        auVar354._44_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._44_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xc) & 1);
        auVar354._48_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._48_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xd) & 1);
        auVar354._52_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._52_4_;
        bVar1 = (bool)((byte)(uVar297 >> 0xe) & 1);
        auVar354._56_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._56_4_;
        bVar1 = SUB81(uVar297 >> 0xf,0);
        auVar354._60_4_ = -(uint)bVar1 | (uint)!bVar1 * auVar352._60_4_;
        *pauVar295 = auVar354;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        uVar297 = vcmpps_avx512vl(*(undefined1 (*) [32])*pauVar295,_DAT_00548840,2);
        auVar329._8_4_ = 0x800000;
        auVar329._0_8_ = 0x80000000800000;
        auVar329._12_4_ = 0x800000;
        auVar329._16_4_ = 0x800000;
        auVar329._20_4_ = 0x800000;
        auVar329._24_4_ = 0x800000;
        auVar329._28_4_ = 0x800000;
        auVar329 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar295,auVar329);
        auVar399 = vpsrld_avx2(auVar329,0x17);
        auVar330._8_4_ = 0xffffff82;
        auVar330._0_8_ = 0xffffff82ffffff82;
        auVar330._12_4_ = 0xffffff82;
        auVar330._16_4_ = 0xffffff82;
        auVar330._20_4_ = 0xffffff82;
        auVar330._24_4_ = 0xffffff82;
        auVar330._28_4_ = 0xffffff82;
        auVar330 = vpaddd_avx512vl(auVar399,auVar330);
        auVar426._8_4_ = 0x807fffff;
        auVar426._0_8_ = 0x807fffff807fffff;
        auVar426._12_4_ = 0x807fffff;
        auVar426._16_4_ = 0x807fffff;
        auVar426._20_4_ = 0x807fffff;
        auVar426._24_4_ = 0x807fffff;
        auVar426._28_4_ = 0x807fffff;
        auVar399._8_4_ = 0x3f000000;
        auVar399._0_8_ = 0x3f0000003f000000;
        auVar399._12_4_ = 0x3f000000;
        auVar399._16_4_ = 0x3f000000;
        auVar399._20_4_ = 0x3f000000;
        auVar399._24_4_ = 0x3f000000;
        auVar399._28_4_ = 0x3f000000;
        auVar399 = vpternlogd_avx512vl(auVar329,auVar426,auVar399,0xea);
        auVar329 = vcvtdq2ps_avx(auVar330);
        auVar318._8_4_ = 0x3f3504f3;
        auVar318._0_8_ = 0x3f3504f33f3504f3;
        auVar318._12_4_ = 0x3f3504f3;
        auVar318._16_4_ = 0x3f3504f3;
        auVar318._20_4_ = 0x3f3504f3;
        auVar318._24_4_ = 0x3f3504f3;
        auVar318._28_4_ = 0x3f3504f3;
        uVar19 = vcmpps_avx512vl(auVar399,auVar318,1);
        auVar454._8_4_ = 0xbf800000;
        auVar454._0_8_ = 0xbf800000bf800000;
        auVar454._12_4_ = 0xbf800000;
        auVar454._16_4_ = 0xbf800000;
        auVar454._20_4_ = 0xbf800000;
        auVar454._24_4_ = 0xbf800000;
        auVar454._28_4_ = 0xbf800000;
        auVar427._0_4_ = auVar399._0_4_ + -1.0;
        auVar427._4_4_ = auVar399._4_4_ + -1.0;
        auVar427._8_4_ = auVar399._8_4_ + -1.0;
        auVar427._12_4_ = auVar399._12_4_ + -1.0;
        auVar427._16_4_ = auVar399._16_4_ + -1.0;
        auVar427._20_4_ = auVar399._20_4_ + -1.0;
        auVar427._24_4_ = auVar399._24_4_ + -1.0;
        auVar427._28_4_ = auVar399._28_4_ + -1.0;
        auVar330 = vaddps_avx512vl(auVar329,auVar454);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar331._0_4_ = (uint)bVar1 * auVar330._0_4_ | (uint)!bVar1 * auVar329._0_4_;
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar331._4_4_ = (uint)bVar1 * auVar330._4_4_ | (uint)!bVar1 * auVar329._4_4_;
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar331._8_4_ = (uint)bVar1 * auVar330._8_4_ | (uint)!bVar1 * auVar329._8_4_;
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar331._12_4_ = (uint)bVar1 * auVar330._12_4_ | (uint)!bVar1 * auVar329._12_4_;
        bVar1 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar331._16_4_ = (uint)bVar1 * auVar330._16_4_ | (uint)!bVar1 * auVar329._16_4_;
        bVar1 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar331._20_4_ = (uint)bVar1 * auVar330._20_4_ | (uint)!bVar1 * auVar329._20_4_;
        bVar1 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar331._24_4_ = (uint)bVar1 * auVar330._24_4_ | (uint)!bVar1 * auVar329._24_4_;
        bVar1 = SUB81(uVar19 >> 7,0);
        auVar331._28_4_ = (uint)bVar1 * auVar330._28_4_ | (uint)!bVar1 * auVar329._28_4_;
        auVar329 = vaddps_avx512vl(auVar427,auVar399);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar332._0_4_ = (float)((uint)bVar1 * auVar329._0_4_ | (uint)!bVar1 * (int)auVar427._0_4_);
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar332._4_4_ = (float)((uint)bVar1 * auVar329._4_4_ | (uint)!bVar1 * (int)auVar427._4_4_);
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar332._8_4_ = (float)((uint)bVar1 * auVar329._8_4_ | (uint)!bVar1 * (int)auVar427._8_4_);
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar332._12_4_ =
             (float)((uint)bVar1 * auVar329._12_4_ | (uint)!bVar1 * (int)auVar427._12_4_);
        bVar1 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar332._16_4_ =
             (float)((uint)bVar1 * auVar329._16_4_ | (uint)!bVar1 * (int)auVar427._16_4_);
        bVar1 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar332._20_4_ =
             (float)((uint)bVar1 * auVar329._20_4_ | (uint)!bVar1 * (int)auVar427._20_4_);
        bVar1 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar332._24_4_ =
             (float)((uint)bVar1 * auVar329._24_4_ | (uint)!bVar1 * (int)auVar427._24_4_);
        bVar1 = SUB81(uVar19 >> 7,0);
        auVar332._28_4_ = (uint)bVar1 * auVar329._28_4_ | (uint)!bVar1 * (int)auVar427._28_4_;
        auVar282._4_4_ = auVar332._4_4_ * auVar332._4_4_;
        auVar282._0_4_ = auVar332._0_4_ * auVar332._0_4_;
        auVar282._8_4_ = auVar332._8_4_ * auVar332._8_4_;
        auVar282._12_4_ = auVar332._12_4_ * auVar332._12_4_;
        auVar282._16_4_ = auVar332._16_4_ * auVar332._16_4_;
        auVar282._20_4_ = auVar332._20_4_ * auVar332._20_4_;
        auVar282._24_4_ = auVar332._24_4_ * auVar332._24_4_;
        auVar282._28_4_ = auVar399._28_4_;
        auVar455._8_4_ = 0x3d9021bb;
        auVar455._0_8_ = 0x3d9021bb3d9021bb;
        auVar455._12_4_ = 0x3d9021bb;
        auVar455._16_4_ = 0x3d9021bb;
        auVar455._20_4_ = 0x3d9021bb;
        auVar455._24_4_ = 0x3d9021bb;
        auVar455._28_4_ = 0x3d9021bb;
        auVar322._8_4_ = 0xbdebd1b8;
        auVar322._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar322._12_4_ = 0xbdebd1b8;
        auVar322._16_4_ = 0xbdebd1b8;
        auVar322._20_4_ = 0xbdebd1b8;
        auVar322._24_4_ = 0xbdebd1b8;
        auVar322._28_4_ = 0xbdebd1b8;
        auVar329 = vfmadd213ps_avx512vl(auVar455,auVar332,auVar322);
        auVar492._8_4_ = 0x3def251a;
        auVar492._0_8_ = 0x3def251a3def251a;
        auVar492._12_4_ = 0x3def251a;
        auVar492._16_4_ = 0x3def251a;
        auVar492._20_4_ = 0x3def251a;
        auVar492._24_4_ = 0x3def251a;
        auVar492._28_4_ = 0x3def251a;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar332,auVar492);
        auVar131._8_4_ = 0xbdfe5d4f;
        auVar131._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar131._12_4_ = 0xbdfe5d4f;
        auVar131._16_4_ = 0xbdfe5d4f;
        auVar131._20_4_ = 0xbdfe5d4f;
        auVar131._24_4_ = 0xbdfe5d4f;
        auVar131._28_4_ = 0xbdfe5d4f;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar332,auVar131);
        auVar132._8_4_ = 0x3e11e9bf;
        auVar132._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar132._12_4_ = 0x3e11e9bf;
        auVar132._16_4_ = 0x3e11e9bf;
        auVar132._20_4_ = 0x3e11e9bf;
        auVar132._24_4_ = 0x3e11e9bf;
        auVar132._28_4_ = 0x3e11e9bf;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar332,auVar132);
        auVar133._8_4_ = 0xbe2aae50;
        auVar133._0_8_ = 0xbe2aae50be2aae50;
        auVar133._12_4_ = 0xbe2aae50;
        auVar133._16_4_ = 0xbe2aae50;
        auVar133._20_4_ = 0xbe2aae50;
        auVar133._24_4_ = 0xbe2aae50;
        auVar133._28_4_ = 0xbe2aae50;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar332,auVar133);
        auVar134._8_4_ = 0x3e4cceac;
        auVar134._0_8_ = 0x3e4cceac3e4cceac;
        auVar134._12_4_ = 0x3e4cceac;
        auVar134._16_4_ = 0x3e4cceac;
        auVar134._20_4_ = 0x3e4cceac;
        auVar134._24_4_ = 0x3e4cceac;
        auVar134._28_4_ = 0x3e4cceac;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar332,auVar134);
        auVar135._8_4_ = 0xbe7ffffc;
        auVar135._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar135._12_4_ = 0xbe7ffffc;
        auVar135._16_4_ = 0xbe7ffffc;
        auVar135._20_4_ = 0xbe7ffffc;
        auVar135._24_4_ = 0xbe7ffffc;
        auVar135._28_4_ = 0xbe7ffffc;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar332,auVar135);
        auVar136._8_4_ = 0x3eaaaaaa;
        auVar136._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar136._12_4_ = 0x3eaaaaaa;
        auVar136._16_4_ = 0x3eaaaaaa;
        auVar136._20_4_ = 0x3eaaaaaa;
        auVar136._24_4_ = 0x3eaaaaaa;
        auVar136._28_4_ = 0x3eaaaaaa;
        auVar329 = vfmadd213ps_avx512vl(auVar329,auVar332,auVar136);
        auVar283._4_4_ = auVar332._4_4_ * auVar332._4_4_ * auVar332._4_4_ * auVar329._4_4_;
        auVar283._0_4_ = auVar332._0_4_ * auVar332._0_4_ * auVar332._0_4_ * auVar329._0_4_;
        auVar283._8_4_ = auVar332._8_4_ * auVar332._8_4_ * auVar332._8_4_ * auVar329._8_4_;
        auVar283._12_4_ = auVar332._12_4_ * auVar332._12_4_ * auVar332._12_4_ * auVar329._12_4_;
        auVar283._16_4_ = auVar332._16_4_ * auVar332._16_4_ * auVar332._16_4_ * auVar329._16_4_;
        auVar283._20_4_ = auVar332._20_4_ * auVar332._20_4_ * auVar332._20_4_ * auVar329._20_4_;
        auVar283._24_4_ = auVar332._24_4_ * auVar332._24_4_ * auVar332._24_4_ * auVar329._24_4_;
        auVar283._28_4_ = auVar329._28_4_;
        auVar137._8_4_ = 0xb95e8083;
        auVar137._0_8_ = 0xb95e8083b95e8083;
        auVar137._12_4_ = 0xb95e8083;
        auVar137._16_4_ = 0xb95e8083;
        auVar137._20_4_ = 0xb95e8083;
        auVar137._24_4_ = 0xb95e8083;
        auVar137._28_4_ = 0xb95e8083;
        auVar329 = vfmadd231ps_avx512vl(auVar283,auVar331,auVar137);
        auVar138._8_4_ = 0x3f000000;
        auVar138._0_8_ = 0x3f0000003f000000;
        auVar138._12_4_ = 0x3f000000;
        auVar138._16_4_ = 0x3f000000;
        auVar138._20_4_ = 0x3f000000;
        auVar138._24_4_ = 0x3f000000;
        auVar138._28_4_ = 0x3f000000;
        auVar329 = vfmsub231ps_avx512vl(auVar329,auVar282,auVar138);
        auVar329 = vsubps_avx(auVar329,auVar332);
        auVar139._8_4_ = 0x3f318000;
        auVar139._0_8_ = 0x3f3180003f318000;
        auVar139._12_4_ = 0x3f318000;
        auVar139._16_4_ = 0x3f318000;
        auVar139._20_4_ = 0x3f318000;
        auVar139._24_4_ = 0x3f318000;
        auVar139._28_4_ = 0x3f318000;
        auVar329 = vfnmadd231ps_avx512vl(auVar329,auVar331,auVar139);
        auVar140._8_4_ = 0xbede5bd9;
        auVar140._0_8_ = 0xbede5bd9bede5bd9;
        auVar140._12_4_ = 0xbede5bd9;
        auVar140._16_4_ = 0xbede5bd9;
        auVar140._20_4_ = 0xbede5bd9;
        auVar140._24_4_ = 0xbede5bd9;
        auVar140._28_4_ = 0xbede5bd9;
        auVar330 = vmulps_avx512vl(auVar329,auVar140);
        auVar329 = vpcmpeqd_avx2(auVar331,auVar331);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar333._0_4_ = (uint)bVar1 * auVar329._0_4_ | (uint)!bVar1 * auVar330._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar333._4_4_ = (uint)bVar1 * auVar329._4_4_ | (uint)!bVar1 * auVar330._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar333._8_4_ = (uint)bVar1 * auVar329._8_4_ | (uint)!bVar1 * auVar330._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar333._12_4_ = (uint)bVar1 * auVar329._12_4_ | (uint)!bVar1 * auVar330._12_4_;
        bVar1 = (bool)((byte)(uVar297 >> 4) & 1);
        auVar333._16_4_ = (uint)bVar1 * auVar329._16_4_ | (uint)!bVar1 * auVar330._16_4_;
        bVar1 = (bool)((byte)(uVar297 >> 5) & 1);
        auVar333._20_4_ = (uint)bVar1 * auVar329._20_4_ | (uint)!bVar1 * auVar330._20_4_;
        bVar1 = (bool)((byte)(uVar297 >> 6) & 1);
        auVar333._24_4_ = (uint)bVar1 * auVar329._24_4_ | (uint)!bVar1 * auVar330._24_4_;
        bVar1 = SUB81(uVar297 >> 7,0);
        auVar333._28_4_ = (uint)bVar1 * auVar329._28_4_ | (uint)!bVar1 * auVar330._28_4_;
        *(undefined1 (*) [32])*pauVar295 = auVar333;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        uVar297 = vcmpps_avx512vl(*(undefined1 (*) [16])*pauVar295,_DAT_00545cc0,2);
        auVar307._8_4_ = 0x800000;
        auVar307._0_8_ = 0x80000000800000;
        auVar307._12_4_ = 0x800000;
        auVar307 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar295,auVar307);
        auVar392 = vpsrld_avx(auVar307,0x17);
        auVar308._8_4_ = 0xffffff82;
        auVar308._0_8_ = 0xffffff82ffffff82;
        auVar308._12_4_ = 0xffffff82;
        auVar308 = vpaddd_avx512vl(auVar392,auVar308);
        auVar416._8_4_ = 0x807fffff;
        auVar416._0_8_ = 0x807fffff807fffff;
        auVar416._12_4_ = 0x807fffff;
        auVar392._8_4_ = 0x3f000000;
        auVar392._0_8_ = 0x3f0000003f000000;
        auVar392._12_4_ = 0x3f000000;
        auVar392 = vpternlogd_avx512vl(auVar307,auVar416,auVar392,0xea);
        auVar307 = vcvtdq2ps_avx(auVar308);
        auVar312._8_4_ = 0x3f3504f3;
        auVar312._0_8_ = 0x3f3504f33f3504f3;
        auVar312._12_4_ = 0x3f3504f3;
        uVar19 = vcmpps_avx512vl(auVar392,auVar312,1);
        auVar441._8_4_ = 0xbf800000;
        auVar441._0_8_ = 0xbf800000bf800000;
        auVar441._12_4_ = 0xbf800000;
        auVar417._0_4_ = auVar392._0_4_ + -1.0;
        auVar417._4_4_ = auVar392._4_4_ + -1.0;
        auVar417._8_4_ = auVar392._8_4_ + -1.0;
        auVar417._12_4_ = auVar392._12_4_ + -1.0;
        auVar308 = vaddps_avx512vl(auVar307,auVar441);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar309._0_4_ = (uint)bVar1 * auVar308._0_4_ | (uint)!bVar1 * auVar307._0_4_;
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar309._4_4_ = (uint)bVar1 * auVar308._4_4_ | (uint)!bVar1 * auVar307._4_4_;
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar309._8_4_ = (uint)bVar1 * auVar308._8_4_ | (uint)!bVar1 * auVar307._8_4_;
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar309._12_4_ = (uint)bVar1 * auVar308._12_4_ | (uint)!bVar1 * auVar307._12_4_;
        auVar307 = vaddps_avx512vl(auVar417,auVar392);
        bVar1 = (bool)((byte)uVar19 & 1);
        auVar310._0_4_ = (float)((uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * (int)auVar417._0_4_);
        bVar1 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar310._4_4_ = (float)((uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * (int)auVar417._4_4_);
        bVar1 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar310._8_4_ = (float)((uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * (int)auVar417._8_4_);
        bVar1 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar310._12_4_ =
             (float)((uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * (int)auVar417._12_4_);
        auVar375._0_4_ = auVar310._0_4_ * auVar310._0_4_;
        auVar375._4_4_ = auVar310._4_4_ * auVar310._4_4_;
        auVar375._8_4_ = auVar310._8_4_ * auVar310._8_4_;
        auVar375._12_4_ = auVar310._12_4_ * auVar310._12_4_;
        auVar442._8_4_ = 0x3d9021bb;
        auVar442._0_8_ = 0x3d9021bb3d9021bb;
        auVar442._12_4_ = 0x3d9021bb;
        auVar486._8_4_ = 0xbdebd1b8;
        auVar486._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar486._12_4_ = 0xbdebd1b8;
        auVar307 = vfmadd213ps_avx512vl(auVar442,auVar310,auVar486);
        auVar20._8_4_ = 0x3def251a;
        auVar20._0_8_ = 0x3def251a3def251a;
        auVar20._12_4_ = 0x3def251a;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar310,auVar20);
        auVar21._8_4_ = 0xbdfe5d4f;
        auVar21._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar21._12_4_ = 0xbdfe5d4f;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar310,auVar21);
        auVar22._8_4_ = 0x3e11e9bf;
        auVar22._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar22._12_4_ = 0x3e11e9bf;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar310,auVar22);
        auVar23._8_4_ = 0xbe2aae50;
        auVar23._0_8_ = 0xbe2aae50be2aae50;
        auVar23._12_4_ = 0xbe2aae50;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar310,auVar23);
        auVar24._8_4_ = 0x3e4cceac;
        auVar24._0_8_ = 0x3e4cceac3e4cceac;
        auVar24._12_4_ = 0x3e4cceac;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar310,auVar24);
        auVar25._8_4_ = 0xbe7ffffc;
        auVar25._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar25._12_4_ = 0xbe7ffffc;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar310,auVar25);
        auVar26._8_4_ = 0x3eaaaaaa;
        auVar26._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar26._12_4_ = 0x3eaaaaaa;
        auVar307 = vfmadd213ps_avx512vl(auVar307,auVar310,auVar26);
        auVar443._0_4_ = auVar375._0_4_ * auVar310._0_4_ * auVar307._0_4_;
        auVar443._4_4_ = auVar375._4_4_ * auVar310._4_4_ * auVar307._4_4_;
        auVar443._8_4_ = auVar375._8_4_ * auVar310._8_4_ * auVar307._8_4_;
        auVar443._12_4_ = auVar375._12_4_ * auVar310._12_4_ * auVar307._12_4_;
        auVar27._8_4_ = 0xb95e8083;
        auVar27._0_8_ = 0xb95e8083b95e8083;
        auVar27._12_4_ = 0xb95e8083;
        auVar307 = vfmadd231ps_avx512vl(auVar443,auVar309,auVar27);
        auVar28._8_4_ = 0x3f000000;
        auVar28._0_8_ = 0x3f0000003f000000;
        auVar28._12_4_ = 0x3f000000;
        auVar307 = vfmsub231ps_avx512vl(auVar307,auVar375,auVar28);
        auVar307 = vsubps_avx(auVar307,auVar310);
        auVar29._8_4_ = 0x3f318000;
        auVar29._0_8_ = 0x3f3180003f318000;
        auVar29._12_4_ = 0x3f318000;
        auVar307 = vfnmadd231ps_avx512vl(auVar307,auVar309,auVar29);
        auVar30._8_4_ = 0xbede5bd9;
        auVar30._0_8_ = 0xbede5bd9bede5bd9;
        auVar30._12_4_ = 0xbede5bd9;
        auVar308 = vmulps_avx512vl(auVar307,auVar30);
        auVar307 = vpcmpeqd_avx(auVar309,auVar309);
        bVar1 = (bool)((byte)uVar297 & 1);
        auVar311._0_4_ = (uint)bVar1 * auVar307._0_4_ | (uint)!bVar1 * auVar308._0_4_;
        bVar1 = (bool)((byte)(uVar297 >> 1) & 1);
        auVar311._4_4_ = (uint)bVar1 * auVar307._4_4_ | (uint)!bVar1 * auVar308._4_4_;
        bVar1 = (bool)((byte)(uVar297 >> 2) & 1);
        auVar311._8_4_ = (uint)bVar1 * auVar307._8_4_ | (uint)!bVar1 * auVar308._8_4_;
        bVar1 = (bool)((byte)(uVar297 >> 3) & 1);
        auVar311._12_4_ = (uint)bVar1 * auVar307._12_4_ | (uint)!bVar1 * auVar308._12_4_;
        *(undefined1 (*) [16])*pauVar295 = auVar311;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        fVar368 = log10f(*(float *)*pauVar295);
        *(float *)*pauVar295 = fVar368;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    break;
  case 0x12:
    iVar291 = fegetround();
    uVar293 = 0;
    fesetround(0);
    iVar296 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar294 = 0; iVar294 + 0xf < iVar296; iVar294 = iVar294 + 0x10) {
        auVar361 = vrndscaleps_avx512f(*pauVar295,8);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar294 + 7 < iVar296; iVar294 = iVar294 + 8) {
        auVar329 = vroundps_avx(*(undefined1 (*) [32])*pauVar295,8);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar294 + 3 < iVar296; iVar294 = iVar294 + 4) {
        auVar308 = vroundps_avx(*(undefined1 (*) [16])*pauVar295,8);
        *(undefined1 (*) [16])*pauVar295 = auVar308;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar294 < iVar296; iVar294 = iVar294 + 1) {
        auVar308 = vroundss_avx(auVar307,ZEXT416(*(uint *)*pauVar295),0xc);
        *(int *)*pauVar295 = auVar308._0_4_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
    fesetround(iVar291);
    break;
  case 0x13:
    iVar291 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
    uVar293 = 0;
    uVar292 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar292 = uVar293;
    }
    for (; uVar293 != uVar292; uVar293 = uVar293 + 1) {
      pauVar295 = (undefined1 (*) [64])
                  (bottom_top_blob->cstep * uVar293 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
      for (iVar296 = 0; iVar296 + 0xf < iVar291; iVar296 = iVar296 + 0x10) {
        auVar361 = vrndscaleps_avx512f(*pauVar295,0xb);
        *pauVar295 = auVar361;
        pauVar295 = pauVar295 + 1;
      }
      for (; iVar296 + 7 < iVar291; iVar296 = iVar296 + 8) {
        auVar329 = vroundps_avx(*(undefined1 (*) [32])*pauVar295,0xb);
        *(undefined1 (*) [32])*pauVar295 = auVar329;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x20);
      }
      for (; iVar296 + 3 < iVar291; iVar296 = iVar296 + 4) {
        auVar308 = vroundps_avx(*(undefined1 (*) [16])*pauVar295,0xb);
        *(undefined1 (*) [16])*pauVar295 = auVar308;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 0x10);
      }
      for (; iVar296 < iVar291; iVar296 = iVar296 + 1) {
        auVar308 = vroundss_avx(auVar307,ZEXT416(*(uint *)*pauVar295),0xb);
        *(int *)*pauVar295 = auVar308._0_4_;
        pauVar295 = (undefined1 (*) [64])(*pauVar295 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx512_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    if (op_type == Operation_ROUND)
    {
        // round to nearest even
#ifdef FE_TONEAREST
        int old_rm = fegetround();
        fesetround(FE_TONEAREST);
#endif
        int ret = unary_op_inplace<unary_op_round>(bottom_top_blob, opt);
#ifdef FE_TONEAREST
        fesetround(old_rm);
#endif
        return ret;
    }

    if (op_type == Operation_TRUNC)
        return unary_op_inplace<unary_op_trunc>(bottom_top_blob, opt);

    return 0;
}